

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

bool embree::avx::CurveNvIntersectorK<4,8>::
     occluded_t<embree::avx::SweepCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined4 uVar1;
  undefined8 uVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCRayQueryContext *pRVar5;
  RTCFilterFunctionN p_Var6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  ulong uVar66;
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  byte bVar69;
  undefined1 (*pauVar70) [32];
  ulong uVar71;
  uint uVar72;
  long lVar73;
  uint uVar74;
  ulong uVar75;
  uint uVar76;
  bool bVar77;
  int iVar78;
  bool bVar79;
  float fVar80;
  float fVar106;
  float fVar108;
  vint4 bi_2;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  float fVar112;
  float fVar113;
  float fVar114;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  float fVar110;
  undefined1 auVar95 [32];
  float fVar107;
  float fVar109;
  float fVar111;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar85 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar91 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar115;
  float fVar139;
  float fVar140;
  vint4 bi_1;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar141;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  vint4 ai;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  float fVar164;
  float fVar183;
  float fVar184;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  float fVar191;
  float fVar205;
  float fVar206;
  vint4 bi;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar199 [28];
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar198 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar211;
  float fVar229;
  float fVar231;
  vint4 ai_2;
  undefined1 auVar213 [16];
  float fVar233;
  undefined1 auVar214 [16];
  float fVar212;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar235;
  float fVar236;
  float fVar237;
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  float fVar230;
  float fVar232;
  float fVar234;
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar253;
  float fVar257;
  undefined1 auVar242 [16];
  float fVar254;
  float fVar258;
  float fVar262;
  undefined1 auVar245 [32];
  float fVar255;
  float fVar259;
  float fVar263;
  float fVar266;
  float fVar269;
  float fVar272;
  undefined1 auVar246 [32];
  float fVar256;
  float fVar260;
  float fVar264;
  float fVar267;
  float fVar270;
  float fVar273;
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  float fVar261;
  float fVar265;
  float fVar268;
  float fVar271;
  undefined1 auVar252 [64];
  float fVar274;
  float fVar282;
  float fVar283;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  float fVar287;
  float fVar289;
  float fVar291;
  undefined1 auVar278 [32];
  float fVar285;
  undefined1 auVar279 [32];
  float fVar284;
  float fVar286;
  float fVar288;
  float fVar290;
  float fVar292;
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  vint4 ai_1;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  float fVar304;
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [64];
  float fVar305;
  float fVar309;
  float fVar310;
  undefined1 auVar306 [16];
  float fVar312;
  float fVar314;
  float fVar316;
  undefined1 auVar307 [32];
  float fVar311;
  float fVar313;
  float fVar315;
  float fVar317;
  undefined1 auVar308 [32];
  undefined1 auVar318 [16];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  float fVar322;
  float fVar331;
  undefined1 auVar323 [32];
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  undefined1 auVar324 [64];
  float fVar332;
  float fVar335;
  float fVar336;
  undefined1 auVar333 [16];
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  undefined1 auVar334 [64];
  float fVar342;
  float fVar351;
  float fVar352;
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  float fVar357;
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  float fVar353;
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  float fVar354;
  float fVar355;
  float fVar356;
  undefined1 auVar350 [64];
  undefined1 auVar358 [28];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [16];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_ccc;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined1 local_c60 [32];
  undefined1 local_ba0 [16];
  undefined1 local_b90 [16];
  undefined1 local_b80 [8];
  float fStack_b78;
  float fStack_b74;
  undefined1 local_b70 [8];
  float fStack_b68;
  float fStack_b64;
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  undefined1 local_b50 [8];
  float fStack_b48;
  float fStack_b44;
  undefined1 local_b40 [8];
  float fStack_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float fStack_b28;
  float fStack_b24;
  undefined1 local_b20 [32];
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float fStack_ae8;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 (*local_a30) [16];
  undefined1 (*local_a28) [16];
  uint *local_a20;
  ulong local_a18;
  RTCFilterFunctionNArguments local_a10;
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  undefined1 auStack_9d0 [16];
  float local_9c0;
  float fStack_9bc;
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [16];
  undefined1 local_930 [8];
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined1 local_8a0 [32];
  undefined1 local_870 [16];
  Primitive *local_858;
  Primitive *local_850;
  ulong local_848;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 local_700 [16];
  undefined1 auStack_6f0 [16];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  RTCHitN local_5e0 [16];
  undefined1 auStack_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [32];
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  uint local_500;
  uint uStack_4fc;
  uint uStack_4f8;
  uint uStack_4f4;
  uint uStack_4f0;
  uint uStack_4ec;
  uint uStack_4e8;
  uint uStack_4e4;
  uint local_4e0;
  uint uStack_4dc;
  uint uStack_4d8;
  uint uStack_4d4;
  uint uStack_4d0;
  uint uStack_4cc;
  uint uStack_4c8;
  uint uStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  
  PVar3 = prim[1];
  uVar75 = (ulong)(byte)PVar3;
  lVar7 = uVar75 * 0x19;
  auVar118 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar118 = vinsertps_avx(auVar118,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar211 = *(float *)(prim + lVar7 + 0x12);
  auVar118 = vsubps_avx(auVar118,*(undefined1 (*) [16])(prim + lVar7 + 6));
  auVar142._0_4_ = fVar211 * auVar118._0_4_;
  auVar142._4_4_ = fVar211 * auVar118._4_4_;
  auVar142._8_4_ = fVar211 * auVar118._8_4_;
  auVar142._12_4_ = fVar211 * auVar118._12_4_;
  auVar275._0_4_ = fVar211 * auVar9._0_4_;
  auVar275._4_4_ = fVar211 * auVar9._4_4_;
  auVar275._8_4_ = fVar211 * auVar9._8_4_;
  auVar275._12_4_ = fVar211 * auVar9._12_4_;
  auVar118 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 4 + 6)));
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 5 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 6 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar215 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 * 0xb + 6)));
  auVar215 = vcvtdq2ps_avx(auVar215);
  auVar151 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar151 = vcvtdq2ps_avx(auVar151);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar75 + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  uVar71 = (ulong)(uint)((int)(uVar75 * 9) * 2);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 + 6)));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 + uVar75 + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  uVar71 = (ulong)(uint)((int)(uVar75 * 5) << 2);
  auVar117 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 + 6)));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar81 = vshufps_avx(auVar275,auVar275,0);
  auVar116 = vshufps_avx(auVar275,auVar275,0x55);
  auVar91 = vshufps_avx(auVar275,auVar275,0xaa);
  fVar211 = auVar91._0_4_;
  fVar164 = auVar91._4_4_;
  fVar229 = auVar91._8_4_;
  fVar183 = auVar91._12_4_;
  fVar238 = auVar116._0_4_;
  fVar253 = auVar116._4_4_;
  fVar257 = auVar116._8_4_;
  fVar261 = auVar116._12_4_;
  fVar231 = auVar81._0_4_;
  fVar184 = auVar81._4_4_;
  fVar233 = auVar81._8_4_;
  fVar185 = auVar81._12_4_;
  auVar333._0_4_ = fVar231 * auVar118._0_4_ + fVar238 * auVar9._0_4_ + fVar211 * auVar19._0_4_;
  auVar333._4_4_ = fVar184 * auVar118._4_4_ + fVar253 * auVar9._4_4_ + fVar164 * auVar19._4_4_;
  auVar333._8_4_ = fVar233 * auVar118._8_4_ + fVar257 * auVar9._8_4_ + fVar229 * auVar19._8_4_;
  auVar333._12_4_ = fVar185 * auVar118._12_4_ + fVar261 * auVar9._12_4_ + fVar183 * auVar19._12_4_;
  auVar343._0_4_ = fVar231 * auVar215._0_4_ + fVar238 * auVar151._0_4_ + auVar89._0_4_ * fVar211;
  auVar343._4_4_ = fVar184 * auVar215._4_4_ + fVar253 * auVar151._4_4_ + auVar89._4_4_ * fVar164;
  auVar343._8_4_ = fVar233 * auVar215._8_4_ + fVar257 * auVar151._8_4_ + auVar89._8_4_ * fVar229;
  auVar343._12_4_ = fVar185 * auVar215._12_4_ + fVar261 * auVar151._12_4_ + auVar89._12_4_ * fVar183
  ;
  auVar276._0_4_ = fVar231 * auVar82._0_4_ + fVar238 * auVar83._0_4_ + auVar117._0_4_ * fVar211;
  auVar276._4_4_ = fVar184 * auVar82._4_4_ + fVar253 * auVar83._4_4_ + auVar117._4_4_ * fVar164;
  auVar276._8_4_ = fVar233 * auVar82._8_4_ + fVar257 * auVar83._8_4_ + auVar117._8_4_ * fVar229;
  auVar276._12_4_ = fVar185 * auVar82._12_4_ + fVar261 * auVar83._12_4_ + auVar117._12_4_ * fVar183;
  auVar81 = vshufps_avx(auVar142,auVar142,0);
  auVar116 = vshufps_avx(auVar142,auVar142,0x55);
  auVar91 = vshufps_avx(auVar142,auVar142,0xaa);
  fVar211 = auVar91._0_4_;
  fVar164 = auVar91._4_4_;
  fVar229 = auVar91._8_4_;
  fVar183 = auVar91._12_4_;
  fVar238 = auVar116._0_4_;
  fVar253 = auVar116._4_4_;
  fVar257 = auVar116._8_4_;
  fVar261 = auVar116._12_4_;
  fVar231 = auVar81._0_4_;
  fVar184 = auVar81._4_4_;
  fVar233 = auVar81._8_4_;
  fVar185 = auVar81._12_4_;
  auVar192._0_4_ = fVar231 * auVar118._0_4_ + fVar238 * auVar9._0_4_ + fVar211 * auVar19._0_4_;
  auVar192._4_4_ = fVar184 * auVar118._4_4_ + fVar253 * auVar9._4_4_ + fVar164 * auVar19._4_4_;
  auVar192._8_4_ = fVar233 * auVar118._8_4_ + fVar257 * auVar9._8_4_ + fVar229 * auVar19._8_4_;
  auVar192._12_4_ = fVar185 * auVar118._12_4_ + fVar261 * auVar9._12_4_ + fVar183 * auVar19._12_4_;
  auVar116._0_4_ = fVar231 * auVar215._0_4_ + auVar89._0_4_ * fVar211 + fVar238 * auVar151._0_4_;
  auVar116._4_4_ = fVar184 * auVar215._4_4_ + auVar89._4_4_ * fVar164 + fVar253 * auVar151._4_4_;
  auVar116._8_4_ = fVar233 * auVar215._8_4_ + auVar89._8_4_ * fVar229 + fVar257 * auVar151._8_4_;
  auVar116._12_4_ = fVar185 * auVar215._12_4_ + auVar89._12_4_ * fVar183 + fVar261 * auVar151._12_4_
  ;
  auVar81._0_4_ = fVar231 * auVar82._0_4_ + fVar238 * auVar83._0_4_ + auVar117._0_4_ * fVar211;
  auVar81._4_4_ = fVar184 * auVar82._4_4_ + fVar253 * auVar83._4_4_ + auVar117._4_4_ * fVar164;
  auVar81._8_4_ = fVar233 * auVar82._8_4_ + fVar257 * auVar83._8_4_ + auVar117._8_4_ * fVar229;
  auVar81._12_4_ = fVar185 * auVar82._12_4_ + fVar261 * auVar83._12_4_ + auVar117._12_4_ * fVar183;
  auVar242._8_4_ = 0x7fffffff;
  auVar242._0_8_ = 0x7fffffff7fffffff;
  auVar242._12_4_ = 0x7fffffff;
  auVar118 = vandps_avx(auVar333,auVar242);
  auVar165._8_4_ = 0x219392ef;
  auVar165._0_8_ = 0x219392ef219392ef;
  auVar165._12_4_ = 0x219392ef;
  auVar118 = vcmpps_avx(auVar118,auVar165,1);
  auVar9 = vblendvps_avx(auVar333,auVar165,auVar118);
  auVar118 = vandps_avx(auVar343,auVar242);
  auVar118 = vcmpps_avx(auVar118,auVar165,1);
  auVar19 = vblendvps_avx(auVar343,auVar165,auVar118);
  auVar118 = vandps_avx(auVar276,auVar242);
  auVar118 = vcmpps_avx(auVar118,auVar165,1);
  auVar118 = vblendvps_avx(auVar276,auVar165,auVar118);
  auVar215 = vrcpps_avx(auVar9);
  fVar238 = auVar215._0_4_;
  auVar91._0_4_ = fVar238 * auVar9._0_4_;
  fVar253 = auVar215._4_4_;
  auVar91._4_4_ = fVar253 * auVar9._4_4_;
  fVar257 = auVar215._8_4_;
  auVar91._8_4_ = fVar257 * auVar9._8_4_;
  fVar261 = auVar215._12_4_;
  auVar91._12_4_ = fVar261 * auVar9._12_4_;
  auVar277._8_4_ = 0x3f800000;
  auVar277._0_8_ = 0x3f8000003f800000;
  auVar277._12_4_ = 0x3f800000;
  auVar9 = vsubps_avx(auVar277,auVar91);
  fVar238 = fVar238 + fVar238 * auVar9._0_4_;
  fVar253 = fVar253 + fVar253 * auVar9._4_4_;
  fVar257 = fVar257 + fVar257 * auVar9._8_4_;
  fVar261 = fVar261 + fVar261 * auVar9._12_4_;
  auVar9 = vrcpps_avx(auVar19);
  fVar211 = auVar9._0_4_;
  auVar213._0_4_ = fVar211 * auVar19._0_4_;
  fVar229 = auVar9._4_4_;
  auVar213._4_4_ = fVar229 * auVar19._4_4_;
  fVar231 = auVar9._8_4_;
  auVar213._8_4_ = fVar231 * auVar19._8_4_;
  fVar233 = auVar9._12_4_;
  auVar213._12_4_ = fVar233 * auVar19._12_4_;
  auVar9 = vsubps_avx(auVar277,auVar213);
  fVar211 = fVar211 + fVar211 * auVar9._0_4_;
  fVar229 = fVar229 + fVar229 * auVar9._4_4_;
  fVar231 = fVar231 + fVar231 * auVar9._8_4_;
  fVar233 = fVar233 + fVar233 * auVar9._12_4_;
  auVar9 = vrcpps_avx(auVar118);
  fVar164 = auVar9._0_4_;
  auVar166._0_4_ = fVar164 * auVar118._0_4_;
  fVar183 = auVar9._4_4_;
  auVar166._4_4_ = fVar183 * auVar118._4_4_;
  fVar184 = auVar9._8_4_;
  auVar166._8_4_ = fVar184 * auVar118._8_4_;
  fVar185 = auVar9._12_4_;
  auVar166._12_4_ = fVar185 * auVar118._12_4_;
  auVar118 = vsubps_avx(auVar277,auVar166);
  fVar164 = fVar164 + fVar164 * auVar118._0_4_;
  fVar183 = fVar183 + fVar183 * auVar118._4_4_;
  fVar184 = fVar184 + fVar184 * auVar118._8_4_;
  fVar185 = fVar185 + fVar185 * auVar118._12_4_;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = *(ulong *)(prim + uVar75 * 7 + 6);
  auVar118 = vpmovsxwd_avx(auVar118);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar118 = vsubps_avx(auVar118,auVar192);
  auVar143._0_4_ = fVar238 * auVar118._0_4_;
  auVar143._4_4_ = fVar253 * auVar118._4_4_;
  auVar143._8_4_ = fVar257 * auVar118._8_4_;
  auVar143._12_4_ = fVar261 * auVar118._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar75 * 9 + 6);
  auVar118 = vpmovsxwd_avx(auVar9);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar118 = vsubps_avx(auVar118,auVar192);
  auVar193._0_4_ = fVar238 * auVar118._0_4_;
  auVar193._4_4_ = fVar253 * auVar118._4_4_;
  auVar193._8_4_ = fVar257 * auVar118._8_4_;
  auVar193._12_4_ = fVar261 * auVar118._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar9 = vpmovsxwd_avx(auVar19);
  auVar215._8_8_ = 0;
  auVar215._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar75 * -2 + 6);
  auVar118 = vpmovsxwd_avx(auVar215);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar118 = vsubps_avx(auVar118,auVar116);
  auVar293._0_4_ = auVar118._0_4_ * fVar211;
  auVar293._4_4_ = auVar118._4_4_ * fVar229;
  auVar293._8_4_ = auVar118._8_4_ * fVar231;
  auVar293._12_4_ = auVar118._12_4_ * fVar233;
  auVar118 = vcvtdq2ps_avx(auVar9);
  auVar118 = vsubps_avx(auVar118,auVar116);
  auVar117._0_4_ = fVar211 * auVar118._0_4_;
  auVar117._4_4_ = fVar229 * auVar118._4_4_;
  auVar117._8_4_ = fVar231 * auVar118._8_4_;
  auVar117._12_4_ = fVar233 * auVar118._12_4_;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = *(ulong *)(prim + uVar71 + uVar75 + 6);
  auVar118 = vpmovsxwd_avx(auVar151);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar118 = vsubps_avx(auVar118,auVar81);
  auVar214._0_4_ = auVar118._0_4_ * fVar164;
  auVar214._4_4_ = auVar118._4_4_ * fVar183;
  auVar214._8_4_ = auVar118._8_4_ * fVar184;
  auVar214._12_4_ = auVar118._12_4_ * fVar185;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar75 * 0x17 + 6);
  auVar118 = vpmovsxwd_avx(auVar89);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar118 = vsubps_avx(auVar118,auVar81);
  auVar82._0_4_ = auVar118._0_4_ * fVar164;
  auVar82._4_4_ = auVar118._4_4_ * fVar183;
  auVar82._8_4_ = auVar118._8_4_ * fVar184;
  auVar82._12_4_ = auVar118._12_4_ * fVar185;
  auVar118 = vpminsd_avx(auVar143,auVar193);
  auVar9 = vpminsd_avx(auVar293,auVar117);
  auVar118 = vmaxps_avx(auVar118,auVar9);
  auVar9 = vpminsd_avx(auVar214,auVar82);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar306._4_4_ = uVar1;
  auVar306._0_4_ = uVar1;
  auVar306._8_4_ = uVar1;
  auVar306._12_4_ = uVar1;
  auVar9 = vmaxps_avx(auVar9,auVar306);
  auVar118 = vmaxps_avx(auVar118,auVar9);
  local_600._0_4_ = auVar118._0_4_ * 0.99999964;
  local_600._4_4_ = auVar118._4_4_ * 0.99999964;
  local_600._8_4_ = auVar118._8_4_ * 0.99999964;
  local_600._12_4_ = auVar118._12_4_ * 0.99999964;
  auVar118 = vpmaxsd_avx(auVar143,auVar193);
  auVar9 = vpmaxsd_avx(auVar293,auVar117);
  auVar118 = vminps_avx(auVar118,auVar9);
  auVar9 = vpmaxsd_avx(auVar214,auVar82);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar144._4_4_ = uVar1;
  auVar144._0_4_ = uVar1;
  auVar144._8_4_ = uVar1;
  auVar144._12_4_ = uVar1;
  auVar9 = vminps_avx(auVar9,auVar144);
  auVar118 = vminps_avx(auVar118,auVar9);
  auVar83._0_4_ = auVar118._0_4_ * 1.0000004;
  auVar83._4_4_ = auVar118._4_4_ * 1.0000004;
  auVar83._8_4_ = auVar118._8_4_ * 1.0000004;
  auVar83._12_4_ = auVar118._12_4_ * 1.0000004;
  auVar118 = vpshufd_avx(ZEXT116((byte)PVar3),0);
  auVar9 = vpcmpgtd_avx(auVar118,_DAT_01f7fcf0);
  auVar118 = vcmpps_avx(local_600,auVar83,2);
  auVar118 = vandps_avx(auVar118,auVar9);
  uVar74 = vmovmskps_avx(auVar118);
  if (uVar74 == 0) {
    return false;
  }
  uVar74 = uVar74 & 0xff;
  local_858 = prim + lVar7 + 0x16;
  auVar93._16_16_ = mm_lookupmask_ps._240_16_;
  auVar93._0_16_ = mm_lookupmask_ps._240_16_;
  local_420 = vblendps_avx(auVar93,ZEXT832(0) << 0x20,0x80);
  uVar76 = 1 << ((byte)k & 0x1f);
  local_a20 = &local_500;
  local_a28 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar76 & 0xf) << 4));
  local_a30 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar76 >> 4) * 0x10);
  local_850 = prim;
LAB_00df5163:
  local_848 = (ulong)uVar74;
  lVar7 = 0;
  if (local_848 != 0) {
    for (; (uVar74 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
    }
  }
  local_848 = local_848 - 1 & local_848;
  lVar73 = lVar7 * 0x40;
  lVar8 = 0;
  if (local_848 != 0) {
    for (; (local_848 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
    }
  }
  local_a18 = (ulong)*(uint *)(local_850 + 2);
  auVar118 = *(undefined1 (*) [16])(local_858 + lVar73);
  if (((local_848 != 0) && (uVar75 = local_848 - 1 & local_848, uVar75 != 0)) &&
     (lVar8 = 0, uVar75 != 0)) {
    for (; (uVar75 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
    }
  }
  auVar9 = *(undefined1 (*) [16])(local_858 + lVar73 + 0x10);
  auVar19 = *(undefined1 (*) [16])(local_858 + lVar73 + 0x20);
  auVar215 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar89 = vinsertps_avx(auVar215,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar211 = *(float *)(ray + k * 4 + 0x80);
  auVar318._4_4_ = fVar211;
  auVar318._0_4_ = fVar211;
  auVar318._8_4_ = fVar211;
  auVar318._12_4_ = fVar211;
  fStack_ad0 = fVar211;
  _local_ae0 = auVar318;
  fStack_acc = fVar211;
  fStack_ac8 = fVar211;
  fStack_ac4 = fVar211;
  auVar215 = *(undefined1 (*) [16])(local_858 + lVar73 + 0x30);
  fVar164 = *(float *)(ray + k * 4 + 0xa0);
  auVar344._4_4_ = fVar164;
  auVar344._0_4_ = fVar164;
  auVar344._8_4_ = fVar164;
  auVar344._12_4_ = fVar164;
  fStack_7d0 = fVar164;
  _local_7e0 = auVar344;
  fStack_7cc = fVar164;
  fStack_7c8 = fVar164;
  fStack_7c4 = fVar164;
  auVar151 = vunpcklps_avx(auVar318,auVar344);
  fVar229 = *(float *)(ray + k * 4 + 0xc0);
  auVar366._4_4_ = fVar229;
  auVar366._0_4_ = fVar229;
  auVar366._8_4_ = fVar229;
  auVar366._12_4_ = fVar229;
  fStack_8d0 = fVar229;
  _local_8e0 = auVar366;
  fStack_8cc = fVar229;
  fStack_8c8 = fVar229;
  fStack_8c4 = fVar229;
  _local_930 = vinsertps_avx(auVar151,auVar366,0x28);
  auVar84._0_4_ = (auVar118._0_4_ + auVar9._0_4_ + auVar19._0_4_ + auVar215._0_4_) * 0.25;
  auVar84._4_4_ = (auVar118._4_4_ + auVar9._4_4_ + auVar19._4_4_ + auVar215._4_4_) * 0.25;
  auVar84._8_4_ = (auVar118._8_4_ + auVar9._8_4_ + auVar19._8_4_ + auVar215._8_4_) * 0.25;
  auVar84._12_4_ = (auVar118._12_4_ + auVar9._12_4_ + auVar19._12_4_ + auVar215._12_4_) * 0.25;
  auVar151 = vsubps_avx(auVar84,auVar89);
  auVar151 = vdpps_avx(auVar151,_local_930,0x7f);
  local_940 = vdpps_avx(_local_930,_local_930,0x7f);
  auVar82 = vrcpss_avx(local_940,local_940);
  fVar183 = auVar151._0_4_ * auVar82._0_4_ * (2.0 - local_940._0_4_ * auVar82._0_4_);
  auVar82 = vshufps_avx(ZEXT416((uint)fVar183),ZEXT416((uint)fVar183),0);
  auVar194._0_4_ = auVar89._0_4_ + local_930._0_4_ * auVar82._0_4_;
  auVar194._4_4_ = auVar89._4_4_ + local_930._4_4_ * auVar82._4_4_;
  auVar194._8_4_ = auVar89._8_4_ + local_930._8_4_ * auVar82._8_4_;
  auVar194._12_4_ = auVar89._12_4_ + local_930._12_4_ * auVar82._12_4_;
  auVar151 = vblendps_avx(auVar194,_DAT_01f7aa10,8);
  _local_b50 = vsubps_avx(auVar118,auVar151);
  _local_b60 = vsubps_avx(auVar19,auVar151);
  _local_b70 = vsubps_avx(auVar9,auVar151);
  _local_b80 = vsubps_avx(auVar215,auVar151);
  auVar9 = vshufps_avx(_local_b50,_local_b50,0);
  auVar118 = vshufps_avx(_local_b50,_local_b50,0x55);
  local_a60._16_16_ = auVar118;
  local_a60._0_16_ = auVar118;
  auVar324 = ZEXT3264(local_a60);
  auVar118 = vshufps_avx(_local_b50,_local_b50,0xaa);
  local_a80._16_16_ = auVar118;
  local_a80._0_16_ = auVar118;
  auVar334 = ZEXT3264(local_a80);
  auVar118 = vshufps_avx(_local_b50,_local_b50,0xff);
  local_aa0._16_16_ = auVar118;
  local_aa0._0_16_ = auVar118;
  auVar350 = ZEXT3264(local_aa0);
  auVar118 = vshufps_avx(_local_b70,_local_b70,0);
  auVar220._16_16_ = auVar118;
  auVar220._0_16_ = auVar118;
  auVar118 = vshufps_avx(_local_b70,_local_b70,0x55);
  local_ac0._16_16_ = auVar118;
  local_ac0._0_16_ = auVar118;
  auVar303 = ZEXT3264(local_ac0);
  auVar118 = vshufps_avx(_local_b70,_local_b70,0xaa);
  local_b20._16_16_ = auVar118;
  local_b20._0_16_ = auVar118;
  auVar252 = ZEXT3264(local_b20);
  auVar118 = vshufps_avx(_local_b70,_local_b70,0xff);
  local_980._16_16_ = auVar118;
  local_980._0_16_ = auVar118;
  auVar370 = ZEXT3264(local_980);
  auVar118 = vshufps_avx(_local_b60,_local_b60,0);
  local_2c0._16_16_ = auVar118;
  local_2c0._0_16_ = auVar118;
  auVar118 = vshufps_avx(_local_b60,_local_b60,0x55);
  local_2e0._16_16_ = auVar118;
  local_2e0._0_16_ = auVar118;
  auVar118 = vshufps_avx(_local_b60,_local_b60,0xaa);
  register0x00001290 = auVar118;
  _local_1e0 = auVar118;
  auVar118 = vshufps_avx(_local_b60,_local_b60,0xff);
  register0x00001290 = auVar118;
  _local_200 = auVar118;
  auVar118 = vshufps_avx(_local_b80,_local_b80,0);
  register0x00001290 = auVar118;
  _local_220 = auVar118;
  auVar118 = vshufps_avx(_local_b80,_local_b80,0x55);
  register0x00001290 = auVar118;
  _local_240 = auVar118;
  auVar118 = vshufps_avx(_local_b80,_local_b80,0xaa);
  register0x00001290 = auVar118;
  _local_260 = auVar118;
  auVar118 = vshufps_avx(_local_b80,_local_b80,0xff);
  register0x00001290 = auVar118;
  _local_280 = auVar118;
  auVar118 = ZEXT416((uint)(fVar211 * fVar211 + fVar164 * fVar164 + fVar229 * fVar229));
  auVar118 = vshufps_avx(auVar118,auVar118,0);
  local_2a0._16_16_ = auVar118;
  local_2a0._0_16_ = auVar118;
  fVar211 = *(float *)(ray + k * 4 + 0x60);
  local_870 = ZEXT416((uint)fVar183);
  auVar118 = vshufps_avx(ZEXT416((uint)(fVar211 - fVar183)),ZEXT416((uint)(fVar211 - fVar183)),0);
  local_300._16_16_ = auVar118;
  local_300._0_16_ = auVar118;
  auVar118 = vpshufd_avx(ZEXT416(*(uint *)(local_850 + 2)),0);
  local_480._16_16_ = auVar118;
  local_480._0_16_ = auVar118;
  auVar118 = vpshufd_avx(ZEXT416(*(uint *)(local_850 + lVar7 * 4 + 6)),0);
  local_4a0._16_16_ = auVar118;
  local_4a0._0_16_ = auVar118;
  local_cc0 = auVar82._0_8_;
  uStack_cb8 = auVar82._8_8_;
  local_8c0 = local_cc0;
  uStack_8b8 = uStack_cb8;
  uStack_8b0 = local_cc0;
  uStack_8a8 = uStack_cb8;
  local_ccc = 1;
  uVar75 = 0;
  bVar77 = false;
  auVar94._8_4_ = 0x7fffffff;
  auVar94._0_8_ = 0x7fffffff7fffffff;
  auVar94._12_4_ = 0x7fffffff;
  auVar94._16_4_ = 0x7fffffff;
  auVar94._20_4_ = 0x7fffffff;
  auVar94._24_4_ = 0x7fffffff;
  auVar94._28_4_ = 0x7fffffff;
  local_460 = vandps_avx(local_2a0,auVar94);
  auVar118 = vsqrtss_avx(local_940,local_940);
  auVar19 = vsqrtss_avx(local_940,local_940);
  local_5f0 = ZEXT816(0x3f80000000000000);
  local_440 = auVar220;
  do {
    auVar221._8_4_ = 0x3f800000;
    auVar221._0_8_ = 0x3f8000003f800000;
    auVar221._12_4_ = 0x3f800000;
    auVar221._16_4_ = 0x3f800000;
    auVar221._20_4_ = 0x3f800000;
    iVar78 = (int)uVar75;
    auVar221._24_4_ = 0x3f800000;
    auVar221._28_4_ = 0x3f800000;
    auVar215 = vmovshdup_avx(local_5f0);
    auVar89 = vsubps_avx(auVar215,local_5f0);
    auVar215 = vshufps_avx(local_5f0,local_5f0,0);
    local_7a0._16_16_ = auVar215;
    local_7a0._0_16_ = auVar215;
    auVar151 = vshufps_avx(auVar89,auVar89,0);
    local_7c0._16_16_ = auVar151;
    local_7c0._0_16_ = auVar151;
    fVar115 = auVar151._0_4_;
    fVar139 = auVar151._4_4_;
    fVar140 = auVar151._8_4_;
    fVar141 = auVar151._12_4_;
    fVar80 = auVar215._0_4_;
    auVar129._0_4_ = fVar80 + fVar115 * 0.0;
    fVar106 = auVar215._4_4_;
    auVar129._4_4_ = fVar106 + fVar139 * 0.14285715;
    fVar108 = auVar215._8_4_;
    auVar129._8_4_ = fVar108 + fVar140 * 0.2857143;
    fVar110 = auVar215._12_4_;
    auVar129._12_4_ = fVar110 + fVar141 * 0.42857146;
    auVar129._16_4_ = fVar80 + fVar115 * 0.5714286;
    auVar129._20_4_ = fVar106 + fVar139 * 0.71428573;
    auVar129._24_4_ = fVar108 + fVar140 * 0.8571429;
    auVar129._28_4_ = fVar110 + fVar141;
    auVar93 = vsubps_avx(auVar221,auVar129);
    fVar238 = auVar220._28_4_;
    fVar164 = auVar93._0_4_;
    fVar229 = auVar93._4_4_;
    fVar183 = auVar93._8_4_;
    fVar231 = auVar93._12_4_;
    fVar184 = auVar93._16_4_;
    fVar233 = auVar93._20_4_;
    fVar185 = auVar93._24_4_;
    fVar190 = auVar252._28_4_ + fVar238 + 1.0 + 1.0;
    fVar239 = local_2c0._0_4_ * auVar129._0_4_ + auVar220._0_4_ * fVar164;
    fVar254 = local_2c0._4_4_ * auVar129._4_4_ + auVar220._4_4_ * fVar229;
    fVar258 = local_2c0._8_4_ * auVar129._8_4_ + auVar220._8_4_ * fVar183;
    fVar262 = local_2c0._12_4_ * auVar129._12_4_ + auVar220._12_4_ * fVar231;
    fVar265 = local_2c0._16_4_ * auVar129._16_4_ + auVar220._16_4_ * fVar184;
    fVar268 = local_2c0._20_4_ * auVar129._20_4_ + auVar220._20_4_ * fVar233;
    fVar271 = local_2c0._24_4_ * auVar129._24_4_ + auVar220._24_4_ * fVar185;
    fVar253 = local_2e0._0_4_ * auVar129._0_4_ + auVar303._0_4_ * fVar164;
    fVar257 = local_2e0._4_4_ * auVar129._4_4_ + auVar303._4_4_ * fVar229;
    fVar261 = local_2e0._8_4_ * auVar129._8_4_ + auVar303._8_4_ * fVar183;
    fVar186 = local_2e0._12_4_ * auVar129._12_4_ + auVar303._12_4_ * fVar231;
    fVar187 = local_2e0._16_4_ * auVar129._16_4_ + auVar303._16_4_ * fVar184;
    fVar188 = local_2e0._20_4_ * auVar129._20_4_ + auVar303._20_4_ * fVar233;
    fVar189 = local_2e0._24_4_ * auVar129._24_4_ + auVar303._24_4_ * fVar185;
    fVar191 = (float)local_1e0._0_4_ * auVar129._0_4_ + auVar252._0_4_ * fVar164;
    fVar205 = (float)local_1e0._4_4_ * auVar129._4_4_ + auVar252._4_4_ * fVar229;
    fVar206 = fStack_1d8 * auVar129._8_4_ + auVar252._8_4_ * fVar183;
    fVar207 = fStack_1d4 * auVar129._12_4_ + auVar252._12_4_ * fVar231;
    fVar208 = fStack_1d0 * auVar129._16_4_ + auVar252._16_4_ * fVar184;
    fVar209 = fStack_1cc * auVar129._20_4_ + auVar252._20_4_ * fVar233;
    fVar210 = fStack_1c8 * auVar129._24_4_ + auVar252._24_4_ * fVar185;
    fVar212 = (float)local_200._0_4_ * auVar129._0_4_ + auVar370._0_4_ * fVar164;
    fVar230 = (float)local_200._4_4_ * auVar129._4_4_ + auVar370._4_4_ * fVar229;
    fVar232 = fStack_1f8 * auVar129._8_4_ + auVar370._8_4_ * fVar183;
    fVar234 = fStack_1f4 * auVar129._12_4_ + auVar370._12_4_ * fVar231;
    fVar235 = fStack_1f0 * auVar129._16_4_ + auVar370._16_4_ * fVar184;
    fVar236 = fStack_1ec * auVar129._20_4_ + auVar370._20_4_ * fVar233;
    fVar237 = fStack_1e8 * auVar129._24_4_ + auVar370._24_4_ * fVar185;
    fVar331 = auVar324._28_4_;
    fVar357 = fVar331 + local_2c0._28_4_;
    fVar341 = auVar370._28_4_ + fVar331;
    auVar307._0_4_ =
         fVar164 * (auVar220._0_4_ * auVar129._0_4_ + auVar9._0_4_ * fVar164) +
         auVar129._0_4_ * fVar239;
    auVar307._4_4_ =
         fVar229 * (auVar220._4_4_ * auVar129._4_4_ + auVar9._4_4_ * fVar229) +
         auVar129._4_4_ * fVar254;
    auVar307._8_4_ =
         fVar183 * (auVar220._8_4_ * auVar129._8_4_ + auVar9._8_4_ * fVar183) +
         auVar129._8_4_ * fVar258;
    auVar307._12_4_ =
         fVar231 * (auVar220._12_4_ * auVar129._12_4_ + auVar9._12_4_ * fVar231) +
         auVar129._12_4_ * fVar262;
    auVar307._16_4_ =
         fVar184 * (auVar220._16_4_ * auVar129._16_4_ + auVar9._0_4_ * fVar184) +
         auVar129._16_4_ * fVar265;
    auVar307._20_4_ =
         fVar233 * (auVar220._20_4_ * auVar129._20_4_ + auVar9._4_4_ * fVar233) +
         auVar129._20_4_ * fVar268;
    auVar307._24_4_ =
         fVar185 * (auVar220._24_4_ * auVar129._24_4_ + auVar9._8_4_ * fVar185) +
         auVar129._24_4_ * fVar271;
    auVar307._28_4_ = fStack_1c4 + fVar331;
    auVar319._0_4_ =
         fVar164 * (auVar303._0_4_ * auVar129._0_4_ + auVar324._0_4_ * fVar164) +
         auVar129._0_4_ * fVar253;
    auVar319._4_4_ =
         fVar229 * (auVar303._4_4_ * auVar129._4_4_ + auVar324._4_4_ * fVar229) +
         auVar129._4_4_ * fVar257;
    auVar319._8_4_ =
         fVar183 * (auVar303._8_4_ * auVar129._8_4_ + auVar324._8_4_ * fVar183) +
         auVar129._8_4_ * fVar261;
    auVar319._12_4_ =
         fVar231 * (auVar303._12_4_ * auVar129._12_4_ + auVar324._12_4_ * fVar231) +
         auVar129._12_4_ * fVar186;
    auVar319._16_4_ =
         fVar184 * (auVar303._16_4_ * auVar129._16_4_ + auVar324._16_4_ * fVar184) +
         auVar129._16_4_ * fVar187;
    auVar319._20_4_ =
         fVar233 * (auVar303._20_4_ * auVar129._20_4_ + auVar324._20_4_ * fVar233) +
         auVar129._20_4_ * fVar188;
    auVar319._24_4_ =
         fVar185 * (auVar303._24_4_ * auVar129._24_4_ + auVar324._24_4_ * fVar185) +
         auVar129._24_4_ * fVar189;
    auVar319._28_4_ = fStack_1e4 + fVar331;
    auVar323._0_4_ =
         fVar164 * (auVar252._0_4_ * auVar129._0_4_ + auVar334._0_4_ * fVar164) +
         auVar129._0_4_ * fVar191;
    auVar323._4_4_ =
         fVar229 * (auVar252._4_4_ * auVar129._4_4_ + auVar334._4_4_ * fVar229) +
         auVar129._4_4_ * fVar205;
    auVar323._8_4_ =
         fVar183 * (auVar252._8_4_ * auVar129._8_4_ + auVar334._8_4_ * fVar183) +
         auVar129._8_4_ * fVar206;
    auVar323._12_4_ =
         fVar231 * (auVar252._12_4_ * auVar129._12_4_ + auVar334._12_4_ * fVar231) +
         auVar129._12_4_ * fVar207;
    auVar323._16_4_ =
         fVar184 * (auVar252._16_4_ * auVar129._16_4_ + auVar334._16_4_ * fVar184) +
         auVar129._16_4_ * fVar208;
    auVar323._20_4_ =
         fVar233 * (auVar252._20_4_ * auVar129._20_4_ + auVar334._20_4_ * fVar233) +
         auVar129._20_4_ * fVar209;
    auVar323._24_4_ =
         fVar185 * (auVar252._24_4_ * auVar129._24_4_ + auVar334._24_4_ * fVar185) +
         auVar129._24_4_ * fVar210;
    fVar304 = auVar303._28_4_;
    auVar323._28_4_ = fVar304 + fVar331;
    auVar278._0_4_ =
         auVar129._0_4_ * fVar212 +
         fVar164 * (auVar370._0_4_ * auVar129._0_4_ + auVar350._0_4_ * fVar164);
    auVar278._4_4_ =
         auVar129._4_4_ * fVar230 +
         fVar229 * (auVar370._4_4_ * auVar129._4_4_ + auVar350._4_4_ * fVar229);
    auVar278._8_4_ =
         auVar129._8_4_ * fVar232 +
         fVar183 * (auVar370._8_4_ * auVar129._8_4_ + auVar350._8_4_ * fVar183);
    auVar278._12_4_ =
         auVar129._12_4_ * fVar234 +
         fVar231 * (auVar370._12_4_ * auVar129._12_4_ + auVar350._12_4_ * fVar231);
    auVar278._16_4_ =
         auVar129._16_4_ * fVar235 +
         fVar184 * (auVar370._16_4_ * auVar129._16_4_ + auVar350._16_4_ * fVar184);
    auVar278._20_4_ =
         auVar129._20_4_ * fVar236 +
         fVar233 * (auVar370._20_4_ * auVar129._20_4_ + auVar350._20_4_ * fVar233);
    auVar278._24_4_ =
         auVar129._24_4_ * fVar237 +
         fVar185 * (auVar370._24_4_ * auVar129._24_4_ + auVar350._24_4_ * fVar185);
    auVar278._28_4_ = fVar304 + auVar9._12_4_ + 1.0;
    auVar245._0_4_ =
         (auVar129._0_4_ * (float)local_220._0_4_ + local_2c0._0_4_ * fVar164) * auVar129._0_4_ +
         fVar164 * fVar239;
    auVar245._4_4_ =
         (auVar129._4_4_ * (float)local_220._4_4_ + local_2c0._4_4_ * fVar229) * auVar129._4_4_ +
         fVar229 * fVar254;
    auVar245._8_4_ =
         (auVar129._8_4_ * fStack_218 + local_2c0._8_4_ * fVar183) * auVar129._8_4_ +
         fVar183 * fVar258;
    auVar245._12_4_ =
         (auVar129._12_4_ * fStack_214 + local_2c0._12_4_ * fVar231) * auVar129._12_4_ +
         fVar231 * fVar262;
    auVar245._16_4_ =
         (auVar129._16_4_ * fStack_210 + local_2c0._16_4_ * fVar184) * auVar129._16_4_ +
         fVar184 * fVar265;
    auVar245._20_4_ =
         (auVar129._20_4_ * fStack_20c + local_2c0._20_4_ * fVar233) * auVar129._20_4_ +
         fVar233 * fVar268;
    auVar245._24_4_ =
         (auVar129._24_4_ * fStack_208 + local_2c0._24_4_ * fVar185) * auVar129._24_4_ +
         fVar185 * fVar271;
    auVar245._28_4_ = fVar304 + fVar190 + auVar252._28_4_;
    auVar179._0_4_ =
         (auVar129._0_4_ * (float)local_240._0_4_ + local_2e0._0_4_ * fVar164) * auVar129._0_4_ +
         fVar164 * fVar253;
    auVar179._4_4_ =
         (auVar129._4_4_ * (float)local_240._4_4_ + local_2e0._4_4_ * fVar229) * auVar129._4_4_ +
         fVar229 * fVar257;
    auVar179._8_4_ =
         (auVar129._8_4_ * fStack_238 + local_2e0._8_4_ * fVar183) * auVar129._8_4_ +
         fVar183 * fVar261;
    auVar179._12_4_ =
         (auVar129._12_4_ * fStack_234 + local_2e0._12_4_ * fVar231) * auVar129._12_4_ +
         fVar231 * fVar186;
    auVar179._16_4_ =
         (auVar129._16_4_ * fStack_230 + local_2e0._16_4_ * fVar184) * auVar129._16_4_ +
         fVar184 * fVar187;
    auVar179._20_4_ =
         (auVar129._20_4_ * fStack_22c + local_2e0._20_4_ * fVar233) * auVar129._20_4_ +
         fVar233 * fVar188;
    auVar179._24_4_ =
         (auVar129._24_4_ * fStack_228 + local_2e0._24_4_ * fVar185) * auVar129._24_4_ +
         fVar185 * fVar189;
    auVar179._28_4_ = fVar304 + fVar238 + fVar190;
    auVar200._0_4_ =
         (auVar129._0_4_ * (float)local_260._0_4_ + (float)local_1e0._0_4_ * fVar164) *
         auVar129._0_4_ + fVar164 * fVar191;
    auVar200._4_4_ =
         (auVar129._4_4_ * (float)local_260._4_4_ + (float)local_1e0._4_4_ * fVar229) *
         auVar129._4_4_ + fVar229 * fVar205;
    auVar200._8_4_ =
         (auVar129._8_4_ * fStack_258 + fStack_1d8 * fVar183) * auVar129._8_4_ + fVar183 * fVar206;
    auVar200._12_4_ =
         (auVar129._12_4_ * fStack_254 + fStack_1d4 * fVar231) * auVar129._12_4_ + fVar231 * fVar207
    ;
    auVar200._16_4_ =
         (auVar129._16_4_ * fStack_250 + fStack_1d0 * fVar184) * auVar129._16_4_ + fVar184 * fVar208
    ;
    auVar200._20_4_ =
         (auVar129._20_4_ * fStack_24c + fStack_1cc * fVar233) * auVar129._20_4_ + fVar233 * fVar209
    ;
    auVar200._24_4_ =
         (auVar129._24_4_ * fStack_248 + fStack_1c8 * fVar185) * auVar129._24_4_ + fVar185 * fVar210
    ;
    auVar200._28_4_ = fVar341 + fVar238 + 1.0;
    auVar222._0_4_ =
         (auVar129._0_4_ * (float)local_280._0_4_ + (float)local_200._0_4_ * fVar164) *
         auVar129._0_4_ + fVar164 * fVar212;
    auVar222._4_4_ =
         (auVar129._4_4_ * (float)local_280._4_4_ + (float)local_200._4_4_ * fVar229) *
         auVar129._4_4_ + fVar229 * fVar230;
    auVar222._8_4_ =
         (auVar129._8_4_ * fStack_278 + fStack_1f8 * fVar183) * auVar129._8_4_ + fVar183 * fVar232;
    auVar222._12_4_ =
         (auVar129._12_4_ * fStack_274 + fStack_1f4 * fVar231) * auVar129._12_4_ + fVar231 * fVar234
    ;
    auVar222._16_4_ =
         (auVar129._16_4_ * fStack_270 + fStack_1f0 * fVar184) * auVar129._16_4_ + fVar184 * fVar235
    ;
    auVar222._20_4_ =
         (auVar129._20_4_ * fStack_26c + fStack_1ec * fVar233) * auVar129._20_4_ + fVar233 * fVar236
    ;
    auVar222._24_4_ =
         (auVar129._24_4_ * fStack_268 + fStack_1e8 * fVar185) * auVar129._24_4_ + fVar185 * fVar237
    ;
    auVar222._28_4_ = fVar357 + fVar331 + 1.0;
    auVar345._0_4_ = auVar307._0_4_ * fVar164 + auVar129._0_4_ * auVar245._0_4_;
    auVar345._4_4_ = auVar307._4_4_ * fVar229 + auVar129._4_4_ * auVar245._4_4_;
    auVar345._8_4_ = auVar307._8_4_ * fVar183 + auVar129._8_4_ * auVar245._8_4_;
    auVar345._12_4_ = auVar307._12_4_ * fVar231 + auVar129._12_4_ * auVar245._12_4_;
    auVar345._16_4_ = auVar307._16_4_ * fVar184 + auVar129._16_4_ * auVar245._16_4_;
    auVar345._20_4_ = auVar307._20_4_ * fVar233 + auVar129._20_4_ * auVar245._20_4_;
    auVar345._24_4_ = auVar307._24_4_ * fVar185 + auVar129._24_4_ * auVar245._24_4_;
    auVar345._28_4_ = fVar357 + fVar304;
    auVar359._0_4_ = auVar319._0_4_ * fVar164 + auVar129._0_4_ * auVar179._0_4_;
    auVar359._4_4_ = auVar319._4_4_ * fVar229 + auVar129._4_4_ * auVar179._4_4_;
    auVar359._8_4_ = auVar319._8_4_ * fVar183 + auVar129._8_4_ * auVar179._8_4_;
    auVar359._12_4_ = auVar319._12_4_ * fVar231 + auVar129._12_4_ * auVar179._12_4_;
    auVar359._16_4_ = auVar319._16_4_ * fVar184 + auVar129._16_4_ * auVar179._16_4_;
    auVar359._20_4_ = auVar319._20_4_ * fVar233 + auVar129._20_4_ * auVar179._20_4_;
    auVar359._24_4_ = auVar319._24_4_ * fVar185 + auVar129._24_4_ * auVar179._24_4_;
    auVar359._28_4_ = fVar304 + fVar341;
    auVar367._0_4_ = auVar323._0_4_ * fVar164 + auVar129._0_4_ * auVar200._0_4_;
    auVar367._4_4_ = auVar323._4_4_ * fVar229 + auVar129._4_4_ * auVar200._4_4_;
    auVar367._8_4_ = auVar323._8_4_ * fVar183 + auVar129._8_4_ * auVar200._8_4_;
    auVar367._12_4_ = auVar323._12_4_ * fVar231 + auVar129._12_4_ * auVar200._12_4_;
    auVar367._16_4_ = auVar323._16_4_ * fVar184 + auVar129._16_4_ * auVar200._16_4_;
    auVar367._20_4_ = auVar323._20_4_ * fVar233 + auVar129._20_4_ * auVar200._20_4_;
    auVar367._24_4_ = auVar323._24_4_ * fVar185 + auVar129._24_4_ * auVar200._24_4_;
    auVar367._28_4_ = fVar341 + fVar304;
    local_c60._0_4_ = auVar89._0_4_;
    auVar296._0_4_ = fVar164 * auVar278._0_4_ + auVar129._0_4_ * auVar222._0_4_;
    auVar296._4_4_ = fVar229 * auVar278._4_4_ + auVar129._4_4_ * auVar222._4_4_;
    auVar296._8_4_ = fVar183 * auVar278._8_4_ + auVar129._8_4_ * auVar222._8_4_;
    auVar296._12_4_ = fVar231 * auVar278._12_4_ + auVar129._12_4_ * auVar222._12_4_;
    auVar296._16_4_ = fVar184 * auVar278._16_4_ + auVar129._16_4_ * auVar222._16_4_;
    auVar296._20_4_ = fVar233 * auVar278._20_4_ + auVar129._20_4_ * auVar222._20_4_;
    auVar296._24_4_ = fVar185 * auVar278._24_4_ + auVar129._24_4_ * auVar222._24_4_;
    auVar296._28_4_ = auVar93._28_4_ + auVar129._28_4_;
    auVar93 = vsubps_avx(auVar245,auVar307);
    auVar220 = vsubps_avx(auVar179,auVar319);
    auVar94 = vsubps_avx(auVar200,auVar323);
    auVar129 = vsubps_avx(auVar222,auVar278);
    auVar215 = vshufps_avx(ZEXT416((uint)((float)local_c60._0_4_ * 0.04761905)),
                           ZEXT416((uint)((float)local_c60._0_4_ * 0.04761905)),0);
    fVar233 = auVar215._0_4_;
    fVar240 = fVar233 * auVar93._0_4_ * 3.0;
    fVar238 = auVar215._4_4_;
    fVar255 = fVar238 * auVar93._4_4_ * 3.0;
    auVar364._4_4_ = fVar255;
    auVar364._0_4_ = fVar240;
    fVar188 = auVar215._8_4_;
    fVar259 = fVar188 * auVar93._8_4_ * 3.0;
    auVar364._8_4_ = fVar259;
    fVar207 = auVar215._12_4_;
    fVar263 = fVar207 * auVar93._12_4_ * 3.0;
    auVar364._12_4_ = fVar263;
    fVar266 = fVar233 * auVar93._16_4_ * 3.0;
    auVar364._16_4_ = fVar266;
    fVar269 = fVar238 * auVar93._20_4_ * 3.0;
    auVar364._20_4_ = fVar269;
    fVar272 = fVar188 * auVar93._24_4_ * 3.0;
    auVar364._24_4_ = fVar272;
    auVar364._28_4_ = auVar245._28_4_;
    fVar274 = fVar233 * auVar220._0_4_ * 3.0;
    fVar282 = fVar238 * auVar220._4_4_ * 3.0;
    auVar28._4_4_ = fVar282;
    auVar28._0_4_ = fVar274;
    fVar283 = fVar188 * auVar220._8_4_ * 3.0;
    auVar28._8_4_ = fVar283;
    fVar285 = fVar207 * auVar220._12_4_ * 3.0;
    auVar28._12_4_ = fVar285;
    fVar287 = fVar233 * auVar220._16_4_ * 3.0;
    auVar28._16_4_ = fVar287;
    fVar289 = fVar238 * auVar220._20_4_ * 3.0;
    auVar28._20_4_ = fVar289;
    fVar291 = fVar188 * auVar220._24_4_ * 3.0;
    auVar28._24_4_ = fVar291;
    auVar28._28_4_ = auVar278._28_4_;
    fVar332 = fVar233 * auVar94._0_4_ * 3.0;
    fVar335 = fVar238 * auVar94._4_4_ * 3.0;
    auVar23._4_4_ = fVar335;
    auVar23._0_4_ = fVar332;
    fVar336 = fVar188 * auVar94._8_4_ * 3.0;
    auVar23._8_4_ = fVar336;
    fVar337 = fVar207 * auVar94._12_4_ * 3.0;
    auVar23._12_4_ = fVar337;
    fVar338 = fVar233 * auVar94._16_4_ * 3.0;
    auVar23._16_4_ = fVar338;
    fVar339 = fVar238 * auVar94._20_4_ * 3.0;
    auVar23._20_4_ = fVar339;
    fVar340 = fVar188 * auVar94._24_4_ * 3.0;
    auVar23._24_4_ = fVar340;
    auVar23._28_4_ = fVar341;
    fVar185 = fVar233 * auVar129._0_4_ * 3.0;
    fVar187 = fVar238 * auVar129._4_4_ * 3.0;
    auVar20._4_4_ = fVar187;
    auVar20._0_4_ = fVar185;
    fVar189 = fVar188 * auVar129._8_4_ * 3.0;
    auVar20._8_4_ = fVar189;
    fVar208 = fVar207 * auVar129._12_4_ * 3.0;
    auVar20._12_4_ = fVar208;
    fVar233 = fVar233 * auVar129._16_4_ * 3.0;
    auVar20._16_4_ = fVar233;
    fVar238 = fVar238 * auVar129._20_4_ * 3.0;
    auVar20._20_4_ = fVar238;
    fVar188 = fVar188 * auVar129._24_4_ * 3.0;
    auVar20._24_4_ = fVar188;
    auVar20._28_4_ = fVar207;
    auVar93 = vperm2f128_avx(auVar359,auVar359,1);
    auVar93 = vshufps_avx(auVar93,auVar359,0x30);
    _local_b40 = vshufps_avx(auVar359,auVar93,0x29);
    auVar93 = vperm2f128_avx(auVar367,auVar367,1);
    auVar93 = vshufps_avx(auVar93,auVar367,0x30);
    _local_9e0 = vshufps_avx(auVar367,auVar93,0x29);
    auVar220 = vsubps_avx(auVar296,auVar20);
    auVar93 = vperm2f128_avx(auVar220,auVar220,1);
    auVar93 = vshufps_avx(auVar93,auVar220,0x30);
    auVar129 = vshufps_avx(auVar220,auVar93,0x29);
    auVar179 = vsubps_avx(_local_b40,auVar359);
    auVar94 = vsubps_avx(_local_9e0,auVar367);
    fVar229 = auVar179._0_4_;
    fVar253 = auVar179._4_4_;
    auVar22._4_4_ = fVar335 * fVar253;
    auVar22._0_4_ = fVar332 * fVar229;
    fVar190 = auVar179._8_4_;
    auVar22._8_4_ = fVar336 * fVar190;
    fVar210 = auVar179._12_4_;
    auVar22._12_4_ = fVar337 * fVar210;
    fVar237 = auVar179._16_4_;
    auVar22._16_4_ = fVar338 * fVar237;
    fVar271 = auVar179._20_4_;
    auVar22._20_4_ = fVar339 * fVar271;
    fVar12 = auVar179._24_4_;
    auVar22._24_4_ = fVar340 * fVar12;
    auVar22._28_4_ = auVar220._28_4_;
    fVar322 = auVar94._0_4_;
    fVar325 = auVar94._4_4_;
    auVar297._4_4_ = fVar325 * fVar282;
    auVar297._0_4_ = fVar322 * fVar274;
    fVar326 = auVar94._8_4_;
    auVar297._8_4_ = fVar326 * fVar283;
    fVar327 = auVar94._12_4_;
    auVar297._12_4_ = fVar327 * fVar285;
    fVar328 = auVar94._16_4_;
    auVar297._16_4_ = fVar328 * fVar287;
    fVar329 = auVar94._20_4_;
    auVar297._20_4_ = fVar329 * fVar289;
    fVar330 = auVar94._24_4_;
    auVar297._24_4_ = fVar330 * fVar291;
    auVar297._28_4_ = auVar93._28_4_;
    auVar94 = vsubps_avx(auVar297,auVar22);
    auVar93 = vperm2f128_avx(auVar345,auVar345,1);
    auVar93 = vshufps_avx(auVar93,auVar345,0x30);
    auVar20 = vshufps_avx(auVar345,auVar93,0x29);
    auVar200 = vsubps_avx(auVar20,auVar345);
    auVar363._4_4_ = fVar325 * fVar255;
    auVar363._0_4_ = fVar322 * fVar240;
    auVar363._8_4_ = fVar326 * fVar259;
    auVar363._12_4_ = fVar327 * fVar263;
    auVar363._16_4_ = fVar328 * fVar266;
    auVar363._20_4_ = fVar329 * fVar269;
    auVar363._24_4_ = fVar330 * fVar272;
    auVar363._28_4_ = auVar20._28_4_;
    fVar183 = auVar200._0_4_;
    fVar257 = auVar200._4_4_;
    auVar24._4_4_ = fVar335 * fVar257;
    auVar24._0_4_ = fVar332 * fVar183;
    fVar191 = auVar200._8_4_;
    auVar24._8_4_ = fVar336 * fVar191;
    fVar212 = auVar200._12_4_;
    auVar24._12_4_ = fVar337 * fVar212;
    fVar239 = auVar200._16_4_;
    auVar24._16_4_ = fVar338 * fVar239;
    fVar304 = auVar200._20_4_;
    auVar24._20_4_ = fVar339 * fVar304;
    fVar13 = auVar200._24_4_;
    auVar24._24_4_ = fVar340 * fVar13;
    auVar24._28_4_ = local_9e0._28_4_;
    auVar22 = vsubps_avx(auVar24,auVar363);
    auVar25._4_4_ = fVar257 * fVar282;
    auVar25._0_4_ = fVar183 * fVar274;
    auVar25._8_4_ = fVar191 * fVar283;
    auVar25._12_4_ = fVar212 * fVar285;
    auVar25._16_4_ = fVar239 * fVar287;
    auVar25._20_4_ = fVar304 * fVar289;
    auVar25._24_4_ = fVar13 * fVar291;
    auVar25._28_4_ = local_9e0._28_4_;
    auVar298._4_4_ = fVar255 * fVar253;
    auVar298._0_4_ = fVar240 * fVar229;
    auVar298._8_4_ = fVar259 * fVar190;
    auVar298._12_4_ = fVar263 * fVar210;
    auVar298._16_4_ = fVar266 * fVar237;
    auVar298._20_4_ = fVar269 * fVar271;
    auVar298._24_4_ = fVar272 * fVar12;
    auVar298._28_4_ = auVar319._28_4_;
    auVar297 = vsubps_avx(auVar298,auVar25);
    fVar164 = auVar297._28_4_;
    auVar154._0_4_ = fVar183 * fVar183 + fVar229 * fVar229 + fVar322 * fVar322;
    auVar154._4_4_ = fVar257 * fVar257 + fVar253 * fVar253 + fVar325 * fVar325;
    auVar154._8_4_ = fVar191 * fVar191 + fVar190 * fVar190 + fVar326 * fVar326;
    auVar154._12_4_ = fVar212 * fVar212 + fVar210 * fVar210 + fVar327 * fVar327;
    auVar154._16_4_ = fVar239 * fVar239 + fVar237 * fVar237 + fVar328 * fVar328;
    auVar154._20_4_ = fVar304 * fVar304 + fVar271 * fVar271 + fVar329 * fVar329;
    auVar154._24_4_ = fVar13 * fVar13 + fVar12 * fVar12 + fVar330 * fVar330;
    auVar154._28_4_ = fVar164 + fVar164 + auVar94._28_4_;
    auVar93 = vrcpps_avx(auVar154);
    fVar209 = auVar93._0_4_;
    fVar234 = auVar93._4_4_;
    auVar21._4_4_ = fVar234 * auVar154._4_4_;
    auVar21._0_4_ = fVar209 * auVar154._0_4_;
    fVar235 = auVar93._8_4_;
    auVar21._8_4_ = fVar235 * auVar154._8_4_;
    fVar236 = auVar93._12_4_;
    auVar21._12_4_ = fVar236 * auVar154._12_4_;
    fVar262 = auVar93._16_4_;
    auVar21._16_4_ = fVar262 * auVar154._16_4_;
    fVar265 = auVar93._20_4_;
    auVar21._20_4_ = fVar265 * auVar154._20_4_;
    fVar268 = auVar93._24_4_;
    auVar21._24_4_ = fVar268 * auVar154._24_4_;
    auVar21._28_4_ = auVar319._28_4_;
    auVar346._8_4_ = 0x3f800000;
    auVar346._0_8_ = 0x3f8000003f800000;
    auVar346._12_4_ = 0x3f800000;
    auVar346._16_4_ = 0x3f800000;
    auVar346._20_4_ = 0x3f800000;
    auVar346._24_4_ = 0x3f800000;
    auVar346._28_4_ = 0x3f800000;
    auVar363 = vsubps_avx(auVar346,auVar21);
    fVar209 = auVar363._0_4_ * fVar209 + fVar209;
    fVar234 = auVar363._4_4_ * fVar234 + fVar234;
    fVar235 = auVar363._8_4_ * fVar235 + fVar235;
    fVar236 = auVar363._12_4_ * fVar236 + fVar236;
    fVar262 = auVar363._16_4_ * fVar262 + fVar262;
    fVar265 = auVar363._20_4_ * fVar265 + fVar265;
    fVar268 = auVar363._24_4_ * fVar268 + fVar268;
    auVar220 = vperm2f128_avx(auVar28,auVar28,1);
    auVar220 = vshufps_avx(auVar220,auVar28,0x30);
    local_960 = vshufps_avx(auVar28,auVar220,0x29);
    auVar220 = vperm2f128_avx(auVar23,auVar23,1);
    auVar220 = vshufps_avx(auVar220,auVar23,0x30);
    local_9a0 = vshufps_avx(auVar23,auVar220,0x29);
    fVar342 = local_9a0._0_4_;
    fVar351 = local_9a0._4_4_;
    auVar26._4_4_ = fVar351 * fVar253;
    auVar26._0_4_ = fVar342 * fVar229;
    fVar352 = local_9a0._8_4_;
    auVar26._8_4_ = fVar352 * fVar190;
    fVar353 = local_9a0._12_4_;
    auVar26._12_4_ = fVar353 * fVar210;
    fVar354 = local_9a0._16_4_;
    auVar26._16_4_ = fVar354 * fVar237;
    fVar355 = local_9a0._20_4_;
    auVar26._20_4_ = fVar355 * fVar271;
    fVar356 = local_9a0._24_4_;
    auVar26._24_4_ = fVar356 * fVar12;
    auVar26._28_4_ = auVar220._28_4_;
    fVar231 = local_960._0_4_;
    fVar261 = local_960._4_4_;
    auVar27._4_4_ = fVar325 * fVar261;
    auVar27._0_4_ = fVar322 * fVar231;
    fVar205 = local_960._8_4_;
    auVar27._8_4_ = fVar326 * fVar205;
    fVar230 = local_960._12_4_;
    auVar27._12_4_ = fVar327 * fVar230;
    fVar254 = local_960._16_4_;
    auVar27._16_4_ = fVar328 * fVar254;
    fVar331 = local_960._20_4_;
    auVar27._20_4_ = fVar329 * fVar331;
    fVar14 = local_960._24_4_;
    auVar27._24_4_ = fVar330 * fVar14;
    auVar27._28_4_ = fVar341;
    auVar23 = vsubps_avx(auVar27,auVar26);
    auVar220 = vperm2f128_avx(auVar364,auVar364,1);
    auVar220 = vshufps_avx(auVar220,auVar364,0x30);
    local_780 = vshufps_avx(auVar364,auVar220,0x29);
    fVar184 = local_780._0_4_;
    fVar186 = local_780._4_4_;
    auVar29._4_4_ = fVar325 * fVar186;
    auVar29._0_4_ = fVar322 * fVar184;
    fVar206 = local_780._8_4_;
    auVar29._8_4_ = fVar326 * fVar206;
    fVar232 = local_780._12_4_;
    auVar29._12_4_ = fVar327 * fVar232;
    fVar258 = local_780._16_4_;
    auVar29._16_4_ = fVar328 * fVar258;
    fVar341 = local_780._20_4_;
    auVar29._20_4_ = fVar329 * fVar341;
    fVar15 = local_780._24_4_;
    auVar29._24_4_ = fVar330 * fVar15;
    auVar29._28_4_ = auVar220._28_4_;
    auVar30._4_4_ = fVar351 * fVar257;
    auVar30._0_4_ = fVar342 * fVar183;
    auVar30._8_4_ = fVar352 * fVar191;
    auVar30._12_4_ = fVar353 * fVar212;
    auVar30._16_4_ = fVar354 * fVar239;
    auVar30._20_4_ = fVar355 * fVar304;
    uVar74 = local_9a0._28_4_;
    auVar30._24_4_ = fVar356 * fVar13;
    auVar30._28_4_ = uVar74;
    auVar220 = vsubps_avx(auVar30,auVar29);
    auVar31._4_4_ = fVar257 * fVar261;
    auVar31._0_4_ = fVar183 * fVar231;
    auVar31._8_4_ = fVar191 * fVar205;
    auVar31._12_4_ = fVar212 * fVar230;
    auVar31._16_4_ = fVar239 * fVar254;
    auVar31._20_4_ = fVar304 * fVar331;
    auVar31._24_4_ = fVar13 * fVar14;
    auVar31._28_4_ = uVar74;
    auVar32._4_4_ = fVar186 * fVar253;
    auVar32._0_4_ = fVar184 * fVar229;
    auVar32._8_4_ = fVar206 * fVar190;
    auVar32._12_4_ = fVar232 * fVar210;
    auVar32._16_4_ = fVar258 * fVar237;
    auVar32._20_4_ = fVar341 * fVar271;
    auVar32._24_4_ = fVar15 * fVar12;
    auVar32._28_4_ = auVar359._28_4_;
    auVar364 = vsubps_avx(auVar32,auVar31);
    auVar33._4_4_ =
         (auVar94._4_4_ * auVar94._4_4_ +
         auVar22._4_4_ * auVar22._4_4_ + auVar297._4_4_ * auVar297._4_4_) * fVar234;
    auVar33._0_4_ =
         (auVar94._0_4_ * auVar94._0_4_ +
         auVar22._0_4_ * auVar22._0_4_ + auVar297._0_4_ * auVar297._0_4_) * fVar209;
    auVar33._8_4_ =
         (auVar94._8_4_ * auVar94._8_4_ +
         auVar22._8_4_ * auVar22._8_4_ + auVar297._8_4_ * auVar297._8_4_) * fVar235;
    auVar33._12_4_ =
         (auVar94._12_4_ * auVar94._12_4_ +
         auVar22._12_4_ * auVar22._12_4_ + auVar297._12_4_ * auVar297._12_4_) * fVar236;
    auVar33._16_4_ =
         (auVar94._16_4_ * auVar94._16_4_ +
         auVar22._16_4_ * auVar22._16_4_ + auVar297._16_4_ * auVar297._16_4_) * fVar262;
    auVar33._20_4_ =
         (auVar94._20_4_ * auVar94._20_4_ +
         auVar22._20_4_ * auVar22._20_4_ + auVar297._20_4_ * auVar297._20_4_) * fVar265;
    auVar33._24_4_ =
         (auVar94._24_4_ * auVar94._24_4_ +
         auVar22._24_4_ * auVar22._24_4_ + auVar297._24_4_ * auVar297._24_4_) * fVar268;
    auVar33._28_4_ = auVar94._28_4_ + auVar22._28_4_ + fVar164;
    auVar34._4_4_ =
         (auVar23._4_4_ * auVar23._4_4_ +
         auVar220._4_4_ * auVar220._4_4_ + auVar364._4_4_ * auVar364._4_4_) * fVar234;
    auVar34._0_4_ =
         (auVar23._0_4_ * auVar23._0_4_ +
         auVar220._0_4_ * auVar220._0_4_ + auVar364._0_4_ * auVar364._0_4_) * fVar209;
    auVar34._8_4_ =
         (auVar23._8_4_ * auVar23._8_4_ +
         auVar220._8_4_ * auVar220._8_4_ + auVar364._8_4_ * auVar364._8_4_) * fVar235;
    auVar34._12_4_ =
         (auVar23._12_4_ * auVar23._12_4_ +
         auVar220._12_4_ * auVar220._12_4_ + auVar364._12_4_ * auVar364._12_4_) * fVar236;
    auVar34._16_4_ =
         (auVar23._16_4_ * auVar23._16_4_ +
         auVar220._16_4_ * auVar220._16_4_ + auVar364._16_4_ * auVar364._16_4_) * fVar262;
    auVar34._20_4_ =
         (auVar23._20_4_ * auVar23._20_4_ +
         auVar220._20_4_ * auVar220._20_4_ + auVar364._20_4_ * auVar364._20_4_) * fVar265;
    auVar34._24_4_ =
         (auVar23._24_4_ * auVar23._24_4_ +
         auVar220._24_4_ * auVar220._24_4_ + auVar364._24_4_ * auVar364._24_4_) * fVar268;
    auVar34._28_4_ = auVar363._28_4_ + auVar93._28_4_;
    auVar93 = vmaxps_avx(auVar33,auVar34);
    auVar220 = vperm2f128_avx(auVar296,auVar296,1);
    auVar220 = vshufps_avx(auVar220,auVar296,0x30);
    auVar22 = vshufps_avx(auVar296,auVar220,0x29);
    auVar95._0_4_ = auVar296._0_4_ + fVar185;
    auVar95._4_4_ = auVar296._4_4_ + fVar187;
    auVar95._8_4_ = auVar296._8_4_ + fVar189;
    auVar95._12_4_ = auVar296._12_4_ + fVar208;
    auVar95._16_4_ = auVar296._16_4_ + fVar233;
    auVar95._20_4_ = auVar296._20_4_ + fVar238;
    auVar95._24_4_ = auVar296._24_4_ + fVar188;
    auVar95._28_4_ = auVar296._28_4_ + fVar207;
    auVar220 = vmaxps_avx(auVar296,auVar95);
    auVar94 = vmaxps_avx(auVar129,auVar22);
    auVar220 = vmaxps_avx(auVar220,auVar94);
    auVar94 = vrsqrtps_avx(auVar154);
    fVar164 = auVar94._0_4_;
    fVar233 = auVar94._4_4_;
    fVar185 = auVar94._8_4_;
    fVar238 = auVar94._12_4_;
    fVar187 = auVar94._16_4_;
    fVar188 = auVar94._20_4_;
    fVar189 = auVar94._24_4_;
    local_360 = fVar164 * 1.5 + fVar164 * fVar164 * fVar164 * auVar154._0_4_ * -0.5;
    fStack_35c = fVar233 * 1.5 + fVar233 * fVar233 * fVar233 * auVar154._4_4_ * -0.5;
    fStack_358 = fVar185 * 1.5 + fVar185 * fVar185 * fVar185 * auVar154._8_4_ * -0.5;
    fStack_354 = fVar238 * 1.5 + fVar238 * fVar238 * fVar238 * auVar154._12_4_ * -0.5;
    fStack_350 = fVar187 * 1.5 + fVar187 * fVar187 * fVar187 * auVar154._16_4_ * -0.5;
    fStack_34c = fVar188 * 1.5 + fVar188 * fVar188 * fVar188 * auVar154._20_4_ * -0.5;
    fStack_348 = fVar189 * 1.5 + fVar189 * fVar189 * fVar189 * auVar154._24_4_ * -0.5;
    auVar297 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar363 = vsubps_avx(auVar297,auVar359);
    auVar23 = vsubps_avx(auVar297,auVar367);
    fVar233 = auVar23._0_4_;
    fVar187 = auVar23._4_4_;
    fVar207 = auVar23._8_4_;
    fVar234 = auVar23._12_4_;
    fVar262 = auVar23._16_4_;
    fVar357 = auVar23._20_4_;
    fVar16 = auVar23._24_4_;
    fVar185 = auVar363._0_4_;
    fVar188 = auVar363._4_4_;
    fVar208 = auVar363._8_4_;
    fVar235 = auVar363._12_4_;
    fVar265 = auVar363._16_4_;
    fVar10 = auVar363._20_4_;
    fVar17 = auVar363._24_4_;
    auVar298 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar24 = vsubps_avx(auVar298,auVar345);
    fVar238 = auVar24._0_4_;
    fVar189 = auVar24._4_4_;
    fVar209 = auVar24._8_4_;
    fVar236 = auVar24._12_4_;
    fVar268 = auVar24._16_4_;
    fVar11 = auVar24._20_4_;
    fVar18 = auVar24._24_4_;
    auVar347._0_4_ =
         (float)local_ae0._0_4_ * fVar238 +
         (float)local_7e0._0_4_ * fVar185 + (float)local_8e0._0_4_ * fVar233;
    auVar347._4_4_ =
         (float)local_ae0._4_4_ * fVar189 +
         (float)local_7e0._4_4_ * fVar188 + (float)local_8e0._4_4_ * fVar187;
    auVar347._8_4_ = fStack_ad8 * fVar209 + fStack_7d8 * fVar208 + fStack_8d8 * fVar207;
    auVar347._12_4_ = fStack_ad4 * fVar236 + fStack_7d4 * fVar235 + fStack_8d4 * fVar234;
    auVar347._16_4_ = fStack_ad0 * fVar268 + fStack_7d0 * fVar265 + fStack_8d0 * fVar262;
    auVar347._20_4_ = fStack_acc * fVar11 + fStack_7cc * fVar10 + fStack_8cc * fVar357;
    auVar347._24_4_ = fStack_ac8 * fVar18 + fStack_7c8 * fVar17 + fStack_8c8 * fVar16;
    auVar347._28_4_ = auVar359._28_4_ + auVar364._28_4_ + 1.5;
    auVar360._0_4_ = fVar238 * fVar238 + fVar185 * fVar185 + fVar233 * fVar233;
    auVar360._4_4_ = fVar189 * fVar189 + fVar188 * fVar188 + fVar187 * fVar187;
    auVar360._8_4_ = fVar209 * fVar209 + fVar208 * fVar208 + fVar207 * fVar207;
    auVar360._12_4_ = fVar236 * fVar236 + fVar235 * fVar235 + fVar234 * fVar234;
    auVar360._16_4_ = fVar268 * fVar268 + fVar265 * fVar265 + fVar262 * fVar262;
    auVar360._20_4_ = fVar11 * fVar11 + fVar10 * fVar10 + fVar357 * fVar357;
    auVar360._24_4_ = fVar18 * fVar18 + fVar17 * fVar17 + fVar16 * fVar16;
    auVar360._28_4_ = auVar367._28_4_ + auVar367._28_4_ + auVar359._28_4_;
    fVar305 = (float)local_ae0._0_4_ * fVar183 * local_360 +
              local_360 * fVar229 * (float)local_7e0._0_4_ +
              fVar322 * local_360 * (float)local_8e0._0_4_;
    fVar309 = (float)local_ae0._4_4_ * fVar257 * fStack_35c +
              fStack_35c * fVar253 * (float)local_7e0._4_4_ +
              fVar325 * fStack_35c * (float)local_8e0._4_4_;
    fVar310 = fStack_ad8 * fVar191 * fStack_358 +
              fStack_358 * fVar190 * fStack_7d8 + fVar326 * fStack_358 * fStack_8d8;
    fVar311 = fStack_ad4 * fVar212 * fStack_354 +
              fStack_354 * fVar210 * fStack_7d4 + fVar327 * fStack_354 * fStack_8d4;
    fVar312 = fStack_ad0 * fVar239 * fStack_350 +
              fStack_350 * fVar237 * fStack_7d0 + fVar328 * fStack_350 * fStack_8d0;
    fVar314 = fStack_acc * fVar304 * fStack_34c +
              fStack_34c * fVar271 * fStack_7cc + fVar329 * fStack_34c * fStack_8cc;
    fVar316 = fStack_ac8 * fVar13 * fStack_348 +
              fStack_348 * fVar12 * fStack_7c8 + fVar330 * fStack_348 * fStack_8c8;
    fVar164 = fStack_ac4 + fStack_7c4 + fStack_8c4;
    local_9c0 = fVar238 * fVar183 * local_360 +
                local_360 * fVar229 * fVar185 + fVar322 * local_360 * fVar233;
    fStack_9bc = fVar189 * fVar257 * fStack_35c +
                 fStack_35c * fVar253 * fVar188 + fVar325 * fStack_35c * fVar187;
    fStack_9b8 = fVar209 * fVar191 * fStack_358 +
                 fStack_358 * fVar190 * fVar208 + fVar326 * fStack_358 * fVar207;
    fStack_9b4 = fVar236 * fVar212 * fStack_354 +
                 fStack_354 * fVar210 * fVar235 + fVar327 * fStack_354 * fVar234;
    fStack_9b0 = fVar268 * fVar239 * fStack_350 +
                 fStack_350 * fVar237 * fVar265 + fVar328 * fStack_350 * fVar262;
    fStack_9ac = fVar11 * fVar304 * fStack_34c +
                 fStack_34c * fVar271 * fVar10 + fVar329 * fStack_34c * fVar357;
    fStack_9a8 = fVar18 * fVar13 * fStack_348 +
                 fStack_348 * fVar12 * fVar17 + fVar330 * fStack_348 * fVar16;
    fStack_9a4 = fStack_7c4 + fVar164;
    auVar35._4_4_ = fVar309 * fStack_9bc;
    auVar35._0_4_ = fVar305 * local_9c0;
    auVar35._8_4_ = fVar310 * fStack_9b8;
    auVar35._12_4_ = fVar311 * fStack_9b4;
    auVar35._16_4_ = fVar312 * fStack_9b0;
    auVar35._20_4_ = fVar314 * fStack_9ac;
    auVar35._24_4_ = fVar316 * fStack_9a8;
    auVar35._28_4_ = fVar164;
    auVar364 = vsubps_avx(auVar347,auVar35);
    auVar36._4_4_ = fStack_9bc * fStack_9bc;
    auVar36._0_4_ = local_9c0 * local_9c0;
    auVar36._8_4_ = fStack_9b8 * fStack_9b8;
    auVar36._12_4_ = fStack_9b4 * fStack_9b4;
    auVar36._16_4_ = fStack_9b0 * fStack_9b0;
    auVar36._20_4_ = fStack_9ac * fStack_9ac;
    auVar36._24_4_ = fStack_9a8 * fStack_9a8;
    auVar36._28_4_ = fStack_7c4;
    auVar25 = vsubps_avx(auVar360,auVar36);
    auVar297 = vsqrtps_avx(auVar93);
    fVar164 = (auVar297._0_4_ + auVar220._0_4_) * 1.0000002;
    fVar107 = (auVar297._4_4_ + auVar220._4_4_) * 1.0000002;
    fVar109 = (auVar297._8_4_ + auVar220._8_4_) * 1.0000002;
    fVar111 = (auVar297._12_4_ + auVar220._12_4_) * 1.0000002;
    fVar112 = (auVar297._16_4_ + auVar220._16_4_) * 1.0000002;
    fVar113 = (auVar297._20_4_ + auVar220._20_4_) * 1.0000002;
    fVar114 = (auVar297._24_4_ + auVar220._24_4_) * 1.0000002;
    auVar37._4_4_ = fVar107 * fVar107;
    auVar37._0_4_ = fVar164 * fVar164;
    auVar37._8_4_ = fVar109 * fVar109;
    auVar37._12_4_ = fVar111 * fVar111;
    auVar37._16_4_ = fVar112 * fVar112;
    auVar37._20_4_ = fVar113 * fVar113;
    auVar37._24_4_ = fVar114 * fVar114;
    auVar37._28_4_ = auVar297._28_4_ + auVar220._28_4_;
    fVar107 = auVar364._0_4_ + auVar364._0_4_;
    fVar109 = auVar364._4_4_ + auVar364._4_4_;
    local_900._0_8_ = CONCAT44(fVar109,fVar107);
    local_900._8_4_ = auVar364._8_4_ + auVar364._8_4_;
    local_900._12_4_ = auVar364._12_4_ + auVar364._12_4_;
    local_900._16_4_ = auVar364._16_4_ + auVar364._16_4_;
    local_900._20_4_ = auVar364._20_4_ + auVar364._20_4_;
    local_900._24_4_ = auVar364._24_4_ + auVar364._24_4_;
    fVar164 = auVar364._28_4_;
    local_900._28_4_ = fVar164 + fVar164;
    auVar220 = vsubps_avx(auVar25,auVar37);
    local_380._4_4_ = fVar309 * fVar309;
    local_380._0_4_ = fVar305 * fVar305;
    local_380._8_4_ = fVar310 * fVar310;
    local_380._12_4_ = fVar311 * fVar311;
    local_380._16_4_ = fVar312 * fVar312;
    local_380._20_4_ = fVar314 * fVar314;
    local_380._24_4_ = fVar316 * fVar316;
    local_380._28_4_ = auVar25._28_4_;
    local_4c0 = vsubps_avx(local_2a0,local_380);
    auVar38._4_4_ = fVar109 * fVar109;
    auVar38._0_4_ = fVar107 * fVar107;
    auVar38._8_4_ = local_900._8_4_ * local_900._8_4_;
    auVar38._12_4_ = local_900._12_4_ * local_900._12_4_;
    auVar38._16_4_ = local_900._16_4_ * local_900._16_4_;
    auVar38._20_4_ = local_900._20_4_ * local_900._20_4_;
    auVar38._24_4_ = local_900._24_4_ * local_900._24_4_;
    auVar38._28_4_ = fVar164;
    fVar111 = local_4c0._0_4_;
    fVar112 = local_4c0._4_4_;
    fVar113 = local_4c0._8_4_;
    fVar114 = local_4c0._12_4_;
    fVar313 = local_4c0._16_4_;
    fVar315 = local_4c0._20_4_;
    fVar317 = local_4c0._24_4_;
    auVar39._4_4_ = auVar220._4_4_ * fVar112 * 4.0;
    auVar39._0_4_ = auVar220._0_4_ * fVar111 * 4.0;
    auVar39._8_4_ = auVar220._8_4_ * fVar113 * 4.0;
    auVar39._12_4_ = auVar220._12_4_ * fVar114 * 4.0;
    auVar39._16_4_ = auVar220._16_4_ * fVar313 * 4.0;
    auVar39._20_4_ = auVar220._20_4_ * fVar315 * 4.0;
    auVar39._24_4_ = auVar220._24_4_ * fVar317 * 4.0;
    auVar39._28_4_ = 0x40800000;
    auVar364 = vsubps_avx(auVar38,auVar39);
    auVar93 = vcmpps_avx(auVar364,auVar298,5);
    fVar164 = local_4c0._28_4_;
    if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar93 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar93 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar93 >> 0x7f,0) == '\0') &&
          (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar93 >> 0xbf,0) == '\0') &&
        (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar93[0x1f]) {
      local_c60._8_4_ = 0x7f800000;
      local_c60._0_8_ = 0x7f8000007f800000;
      local_c60._12_4_ = 0x7f800000;
      local_c60._16_4_ = 0x7f800000;
      local_c60._20_4_ = 0x7f800000;
      local_c60._24_4_ = 0x7f800000;
      local_c60._28_4_ = 0x7f800000;
      auVar361._8_4_ = 0xff800000;
      auVar361._0_8_ = 0xff800000ff800000;
      auVar361._12_4_ = 0xff800000;
      auVar361._16_4_ = 0xff800000;
      auVar361._20_4_ = 0xff800000;
      auVar361._24_4_ = 0xff800000;
      auVar361._28_4_ = 0xff800000;
    }
    else {
      auVar298 = vcmpps_avx(auVar364,auVar298,5);
      auVar21 = vsqrtps_avx(auVar364);
      auVar246._0_4_ = fVar111 + fVar111;
      auVar246._4_4_ = fVar112 + fVar112;
      auVar246._8_4_ = fVar113 + fVar113;
      auVar246._12_4_ = fVar114 + fVar114;
      auVar246._16_4_ = fVar313 + fVar313;
      auVar246._20_4_ = fVar315 + fVar315;
      auVar246._24_4_ = fVar317 + fVar317;
      auVar246._28_4_ = fVar164 + fVar164;
      auVar364 = vrcpps_avx(auVar246);
      fVar241 = auVar364._0_4_;
      fVar256 = auVar364._4_4_;
      auVar40._4_4_ = auVar246._4_4_ * fVar256;
      auVar40._0_4_ = auVar246._0_4_ * fVar241;
      fVar260 = auVar364._8_4_;
      auVar40._8_4_ = auVar246._8_4_ * fVar260;
      fVar264 = auVar364._12_4_;
      auVar40._12_4_ = auVar246._12_4_ * fVar264;
      fVar267 = auVar364._16_4_;
      auVar40._16_4_ = auVar246._16_4_ * fVar267;
      fVar270 = auVar364._20_4_;
      auVar40._20_4_ = auVar246._20_4_ * fVar270;
      fVar273 = auVar364._24_4_;
      auVar40._24_4_ = auVar246._24_4_ * fVar273;
      auVar40._28_4_ = auVar246._28_4_;
      auVar299._8_4_ = 0x3f800000;
      auVar299._0_8_ = 0x3f8000003f800000;
      auVar299._12_4_ = 0x3f800000;
      auVar299._16_4_ = 0x3f800000;
      auVar299._20_4_ = 0x3f800000;
      auVar299._24_4_ = 0x3f800000;
      auVar299._28_4_ = 0x3f800000;
      auVar26 = vsubps_avx(auVar299,auVar40);
      fVar241 = fVar241 + fVar241 * auVar26._0_4_;
      fVar256 = fVar256 + fVar256 * auVar26._4_4_;
      fVar260 = fVar260 + fVar260 * auVar26._8_4_;
      fVar264 = fVar264 + fVar264 * auVar26._12_4_;
      fVar267 = fVar267 + fVar267 * auVar26._16_4_;
      fVar270 = fVar270 + fVar270 * auVar26._20_4_;
      fVar273 = fVar273 + fVar273 * auVar26._24_4_;
      auVar279._0_8_ = CONCAT44(fVar109,fVar107) ^ 0x8000000080000000;
      auVar279._8_4_ = -local_900._8_4_;
      auVar279._12_4_ = -local_900._12_4_;
      auVar279._16_4_ = -local_900._16_4_;
      auVar279._20_4_ = -local_900._20_4_;
      auVar279._24_4_ = -local_900._24_4_;
      auVar279._28_4_ = -local_900._28_4_;
      auVar27 = vsubps_avx(auVar279,auVar21);
      fVar107 = auVar27._0_4_ * fVar241;
      fVar109 = auVar27._4_4_ * fVar256;
      auVar41._4_4_ = fVar109;
      auVar41._0_4_ = fVar107;
      fVar284 = auVar27._8_4_ * fVar260;
      auVar41._8_4_ = fVar284;
      fVar286 = auVar27._12_4_ * fVar264;
      auVar41._12_4_ = fVar286;
      fVar288 = auVar27._16_4_ * fVar267;
      auVar41._16_4_ = fVar288;
      fVar290 = auVar27._20_4_ * fVar270;
      auVar41._20_4_ = fVar290;
      fVar292 = auVar27._24_4_ * fVar273;
      auVar41._24_4_ = fVar292;
      auVar41._28_4_ = auVar27._28_4_;
      auVar21 = vsubps_avx(auVar21,local_900);
      fVar241 = auVar21._0_4_ * fVar241;
      fVar256 = auVar21._4_4_ * fVar256;
      auVar42._4_4_ = fVar256;
      auVar42._0_4_ = fVar241;
      fVar260 = auVar21._8_4_ * fVar260;
      auVar42._8_4_ = fVar260;
      fVar264 = auVar21._12_4_ * fVar264;
      auVar42._12_4_ = fVar264;
      fVar267 = auVar21._16_4_ * fVar267;
      auVar42._16_4_ = fVar267;
      fVar270 = auVar21._20_4_ * fVar270;
      auVar42._20_4_ = fVar270;
      fVar273 = auVar21._24_4_ * fVar273;
      auVar42._24_4_ = fVar273;
      auVar42._28_4_ = auVar21._28_4_;
      local_320 = local_360 * (local_9c0 + fVar305 * fVar107);
      fStack_31c = fStack_35c * (fStack_9bc + fVar309 * fVar109);
      fStack_318 = fStack_358 * (fStack_9b8 + fVar310 * fVar284);
      fStack_314 = fStack_354 * (fStack_9b4 + fVar311 * fVar286);
      fStack_310 = fStack_350 * (fStack_9b0 + fVar312 * fVar288);
      fStack_30c = fStack_34c * (fStack_9ac + fVar314 * fVar290);
      fStack_308 = fStack_348 * (fStack_9a8 + fVar316 * fVar292);
      fStack_304 = fStack_9a4 + auVar364._28_4_ + auVar26._28_4_;
      auVar300._8_4_ = 0x7fffffff;
      auVar300._0_8_ = 0x7fffffff7fffffff;
      auVar300._12_4_ = 0x7fffffff;
      auVar300._16_4_ = 0x7fffffff;
      auVar300._20_4_ = 0x7fffffff;
      auVar300._24_4_ = 0x7fffffff;
      auVar300._28_4_ = 0x7fffffff;
      auVar364 = vandps_avx(local_380,auVar300);
      auVar21 = vmaxps_avx(local_460,auVar364);
      auVar43._4_4_ = auVar21._4_4_ * 1.9073486e-06;
      auVar43._0_4_ = auVar21._0_4_ * 1.9073486e-06;
      auVar43._8_4_ = auVar21._8_4_ * 1.9073486e-06;
      auVar43._12_4_ = auVar21._12_4_ * 1.9073486e-06;
      auVar43._16_4_ = auVar21._16_4_ * 1.9073486e-06;
      auVar43._20_4_ = auVar21._20_4_ * 1.9073486e-06;
      auVar43._24_4_ = auVar21._24_4_ * 1.9073486e-06;
      auVar43._28_4_ = auVar21._28_4_;
      auVar364 = vandps_avx(local_4c0,auVar300);
      auVar364 = vcmpps_avx(auVar364,auVar43,1);
      auVar301._8_4_ = 0x7f800000;
      auVar301._0_8_ = 0x7f8000007f800000;
      auVar301._12_4_ = 0x7f800000;
      auVar301._16_4_ = 0x7f800000;
      auVar301._20_4_ = 0x7f800000;
      auVar301._24_4_ = 0x7f800000;
      auVar301._28_4_ = 0x7f800000;
      local_c60 = vblendvps_avx(auVar301,auVar41,auVar298);
      local_340 = local_360 * (local_9c0 + fVar305 * fVar241);
      fStack_33c = fStack_35c * (fStack_9bc + fVar309 * fVar256);
      fStack_338 = fStack_358 * (fStack_9b8 + fVar310 * fVar260);
      fStack_334 = fStack_354 * (fStack_9b4 + fVar311 * fVar264);
      fStack_330 = fStack_350 * (fStack_9b0 + fVar312 * fVar267);
      fStack_32c = fStack_34c * (fStack_9ac + fVar314 * fVar270);
      fStack_328 = fStack_348 * (fStack_9a8 + fVar316 * fVar273);
      fStack_324 = fStack_9a4 + auVar21._28_4_;
      auVar247._8_4_ = 0xff800000;
      auVar247._0_8_ = 0xff800000ff800000;
      auVar247._12_4_ = 0xff800000;
      auVar247._16_4_ = 0xff800000;
      auVar247._20_4_ = 0xff800000;
      auVar247._24_4_ = 0xff800000;
      auVar247._28_4_ = 0xff800000;
      auVar361 = vblendvps_avx(auVar247,auVar42,auVar298);
      auVar21 = auVar298 & auVar364;
      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar21 >> 0x7f,0) != '\0') ||
            (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar21 >> 0xbf,0) != '\0') ||
          (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar21[0x1f] < '\0') {
        auVar93 = vandps_avx(auVar364,auVar298);
        auVar215 = vpackssdw_avx(auVar93._0_16_,auVar93._16_16_);
        auVar364 = vcmpps_avx(auVar220,ZEXT832(0) << 0x20,2);
        auVar349._8_4_ = 0xff800000;
        auVar349._0_8_ = 0xff800000ff800000;
        auVar349._12_4_ = 0xff800000;
        auVar349._16_4_ = 0xff800000;
        auVar349._20_4_ = 0xff800000;
        auVar349._24_4_ = 0xff800000;
        auVar349._28_4_ = 0xff800000;
        auVar368._8_4_ = 0x7f800000;
        auVar368._0_8_ = 0x7f8000007f800000;
        auVar368._12_4_ = 0x7f800000;
        auVar368._16_4_ = 0x7f800000;
        auVar368._20_4_ = 0x7f800000;
        auVar368._24_4_ = 0x7f800000;
        auVar368._28_4_ = 0x7f800000;
        auVar220 = vblendvps_avx(auVar368,auVar349,auVar364);
        auVar151 = vpmovsxwd_avx(auVar215);
        auVar215 = vpunpckhwd_avx(auVar215,auVar215);
        auVar228._16_16_ = auVar215;
        auVar228._0_16_ = auVar151;
        local_c60 = vblendvps_avx(local_c60,auVar220,auVar228);
        auVar220 = vblendvps_avx(auVar349,auVar368,auVar364);
        auVar361 = vblendvps_avx(auVar361,auVar220,auVar228);
        auVar220 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar104._0_4_ = auVar93._0_4_ ^ auVar220._0_4_;
        auVar104._4_4_ = auVar93._4_4_ ^ auVar220._4_4_;
        auVar104._8_4_ = auVar93._8_4_ ^ auVar220._8_4_;
        auVar104._12_4_ = auVar93._12_4_ ^ auVar220._12_4_;
        auVar104._16_4_ = auVar93._16_4_ ^ auVar220._16_4_;
        auVar104._20_4_ = auVar93._20_4_ ^ auVar220._20_4_;
        auVar104._24_4_ = auVar93._24_4_ ^ auVar220._24_4_;
        auVar104._28_4_ = auVar93._28_4_ ^ auVar220._28_4_;
        auVar93 = vorps_avx(auVar364,auVar104);
        auVar93 = vandps_avx(auVar298,auVar93);
      }
    }
    auVar303 = ZEXT3264(local_ac0);
    auVar220 = local_420 & auVar93;
    auVar252 = ZEXT3264(local_b20);
    auVar370 = ZEXT3264(local_980);
    if ((((((((auVar220 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar220 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar220 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar220 >> 0x7f,0) == '\0') &&
          (auVar220 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar220 >> 0xbf,0) == '\0') &&
        (auVar220 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar220[0x1f])
    {
      auVar324 = ZEXT3264(local_a60);
      auVar334 = ZEXT3264(local_a80);
      auVar350 = ZEXT3264(local_aa0);
    }
    else {
      fStack_344 = auVar94._28_4_ + auVar154._28_4_;
      local_610 = ZEXT416((uint)*(float *)(ray + k * 4 + 0x100));
      auVar215 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_870._0_4_));
      auVar215 = vshufps_avx(auVar215,auVar215,0);
      auVar223._16_16_ = auVar215;
      auVar223._0_16_ = auVar215;
      auVar364 = vminps_avx(auVar223,auVar361);
      fVar270 = auVar23._28_4_;
      auVar130._0_4_ =
           (float)local_ae0._0_4_ * fVar240 +
           (float)local_7e0._0_4_ * fVar274 + (float)local_8e0._0_4_ * fVar332;
      auVar130._4_4_ =
           (float)local_ae0._4_4_ * fVar255 +
           (float)local_7e0._4_4_ * fVar282 + (float)local_8e0._4_4_ * fVar335;
      auVar130._8_4_ = fStack_ad8 * fVar259 + fStack_7d8 * fVar283 + fStack_8d8 * fVar336;
      auVar130._12_4_ = fStack_ad4 * fVar263 + fStack_7d4 * fVar285 + fStack_8d4 * fVar337;
      auVar130._16_4_ = fStack_ad0 * fVar266 + fStack_7d0 * fVar287 + fStack_8d0 * fVar338;
      auVar130._20_4_ = fStack_acc * fVar269 + fStack_7cc * fVar289 + fStack_8cc * fVar339;
      auVar130._24_4_ = fStack_ac8 * fVar272 + fStack_7c8 * fVar291 + fStack_8c8 * fVar340;
      auVar130._28_4_ = fVar270 + auVar278._28_4_ + fVar270;
      auVar220 = vrcpps_avx(auVar130);
      fVar107 = auVar220._0_4_;
      fVar109 = auVar220._4_4_;
      auVar44._4_4_ = auVar130._4_4_ * fVar109;
      auVar44._0_4_ = auVar130._0_4_ * fVar107;
      fVar241 = auVar220._8_4_;
      auVar44._8_4_ = auVar130._8_4_ * fVar241;
      fVar256 = auVar220._12_4_;
      auVar44._12_4_ = auVar130._12_4_ * fVar256;
      fVar260 = auVar220._16_4_;
      auVar44._16_4_ = auVar130._16_4_ * fVar260;
      fVar264 = auVar220._20_4_;
      auVar44._20_4_ = auVar130._20_4_ * fVar264;
      fVar267 = auVar220._24_4_;
      auVar44._24_4_ = auVar130._24_4_ * fVar267;
      auVar44._28_4_ = auVar24._28_4_;
      auVar348._8_4_ = 0x3f800000;
      auVar348._0_8_ = 0x3f8000003f800000;
      auVar348._12_4_ = 0x3f800000;
      auVar348._16_4_ = 0x3f800000;
      auVar348._20_4_ = 0x3f800000;
      auVar348._24_4_ = 0x3f800000;
      auVar348._28_4_ = 0x3f800000;
      auVar23 = vsubps_avx(auVar348,auVar44);
      auVar280._8_4_ = 0x7fffffff;
      auVar280._0_8_ = 0x7fffffff7fffffff;
      auVar280._12_4_ = 0x7fffffff;
      auVar280._16_4_ = 0x7fffffff;
      auVar280._20_4_ = 0x7fffffff;
      auVar280._24_4_ = 0x7fffffff;
      auVar280._28_4_ = 0x7fffffff;
      auVar220 = vandps_avx(auVar130,auVar280);
      auVar362._8_4_ = 0x219392ef;
      auVar362._0_8_ = 0x219392ef219392ef;
      auVar362._12_4_ = 0x219392ef;
      auVar362._16_4_ = 0x219392ef;
      auVar362._20_4_ = 0x219392ef;
      auVar362._24_4_ = 0x219392ef;
      auVar362._28_4_ = 0x219392ef;
      auVar94 = vcmpps_avx(auVar220,auVar362,1);
      auVar45._4_4_ =
           (fVar109 + fVar109 * auVar23._4_4_) *
           -(fVar189 * fVar255 + fVar188 * fVar282 + fVar187 * fVar335);
      auVar45._0_4_ =
           (fVar107 + fVar107 * auVar23._0_4_) *
           -(fVar238 * fVar240 + fVar185 * fVar274 + fVar233 * fVar332);
      auVar45._8_4_ =
           (fVar241 + fVar241 * auVar23._8_4_) *
           -(fVar209 * fVar259 + fVar208 * fVar283 + fVar207 * fVar336);
      auVar45._12_4_ =
           (fVar256 + fVar256 * auVar23._12_4_) *
           -(fVar236 * fVar263 + fVar235 * fVar285 + fVar234 * fVar337);
      auVar45._16_4_ =
           (fVar260 + fVar260 * auVar23._16_4_) *
           -(fVar268 * fVar266 + fVar265 * fVar287 + fVar262 * fVar338);
      auVar45._20_4_ =
           (fVar264 + fVar264 * auVar23._20_4_) *
           -(fVar11 * fVar269 + fVar10 * fVar289 + fVar357 * fVar339);
      auVar45._24_4_ =
           (fVar267 + fVar267 * auVar23._24_4_) *
           -(fVar18 * fVar272 + fVar17 * fVar291 + fVar16 * fVar340);
      auVar45._28_4_ = -(fVar270 + auVar363._28_4_ + fVar270);
      auVar363 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar220 = vcmpps_avx(auVar130,auVar363,1);
      auVar220 = vorps_avx(auVar94,auVar220);
      auVar302._8_4_ = 0xff800000;
      auVar302._0_8_ = 0xff800000ff800000;
      auVar302._12_4_ = 0xff800000;
      auVar302._16_4_ = 0xff800000;
      auVar302._20_4_ = 0xff800000;
      auVar302._24_4_ = 0xff800000;
      auVar302._28_4_ = 0xff800000;
      auVar220 = vblendvps_avx(auVar45,auVar302,auVar220);
      auVar363 = vcmpps_avx(auVar130,auVar363,6);
      auVar94 = vorps_avx(auVar94,auVar363);
      auVar308._8_4_ = 0x7f800000;
      auVar308._0_8_ = 0x7f8000007f800000;
      auVar308._12_4_ = 0x7f800000;
      auVar308._16_4_ = 0x7f800000;
      auVar308._20_4_ = 0x7f800000;
      auVar308._24_4_ = 0x7f800000;
      auVar308._28_4_ = 0x7f800000;
      auVar94 = vblendvps_avx(auVar45,auVar308,auVar94);
      auVar363 = vmaxps_avx(local_300,local_c60);
      auVar363 = vmaxps_avx(auVar363,auVar220);
      auVar23 = vminps_avx(auVar364,auVar94);
      auVar364 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar220 = vsubps_avx(auVar364,_local_b40);
      auVar94 = vsubps_avx(auVar364,_local_9e0);
      auVar46._4_4_ = auVar94._4_4_ * -fVar351;
      auVar46._0_4_ = auVar94._0_4_ * -fVar342;
      auVar46._8_4_ = auVar94._8_4_ * -fVar352;
      auVar46._12_4_ = auVar94._12_4_ * -fVar353;
      auVar46._16_4_ = auVar94._16_4_ * -fVar354;
      auVar46._20_4_ = auVar94._20_4_ * -fVar355;
      auVar46._24_4_ = auVar94._24_4_ * -fVar356;
      auVar46._28_4_ = auVar94._28_4_;
      auVar47._4_4_ = fVar261 * auVar220._4_4_;
      auVar47._0_4_ = fVar231 * auVar220._0_4_;
      auVar47._8_4_ = fVar205 * auVar220._8_4_;
      auVar47._12_4_ = fVar230 * auVar220._12_4_;
      auVar47._16_4_ = fVar254 * auVar220._16_4_;
      auVar47._20_4_ = fVar331 * auVar220._20_4_;
      auVar47._24_4_ = fVar14 * auVar220._24_4_;
      auVar47._28_4_ = auVar220._28_4_;
      auVar220 = vsubps_avx(auVar46,auVar47);
      auVar94 = vsubps_avx(auVar364,auVar20);
      auVar48._4_4_ = fVar186 * auVar94._4_4_;
      auVar48._0_4_ = fVar184 * auVar94._0_4_;
      auVar48._8_4_ = fVar206 * auVar94._8_4_;
      auVar48._12_4_ = fVar232 * auVar94._12_4_;
      auVar48._16_4_ = fVar258 * auVar94._16_4_;
      auVar48._20_4_ = fVar341 * auVar94._20_4_;
      uVar1 = auVar94._28_4_;
      auVar48._24_4_ = fVar15 * auVar94._24_4_;
      auVar48._28_4_ = uVar1;
      auVar20 = vsubps_avx(auVar220,auVar48);
      auVar49._4_4_ = (float)local_8e0._4_4_ * -fVar351;
      auVar49._0_4_ = (float)local_8e0._0_4_ * -fVar342;
      auVar49._8_4_ = fStack_8d8 * -fVar352;
      auVar49._12_4_ = fStack_8d4 * -fVar353;
      auVar49._16_4_ = fStack_8d0 * -fVar354;
      auVar49._20_4_ = fStack_8cc * -fVar355;
      auVar49._24_4_ = fStack_8c8 * -fVar356;
      auVar49._28_4_ = uVar74 ^ 0x80000000;
      auVar50._4_4_ = (float)local_7e0._4_4_ * fVar261;
      auVar50._0_4_ = (float)local_7e0._0_4_ * fVar231;
      auVar50._8_4_ = fStack_7d8 * fVar205;
      auVar50._12_4_ = fStack_7d4 * fVar230;
      auVar50._16_4_ = fStack_7d0 * fVar254;
      auVar50._20_4_ = fStack_7cc * fVar331;
      auVar50._24_4_ = fStack_7c8 * fVar14;
      auVar50._28_4_ = uVar1;
      auVar220 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = fVar186 * (float)local_ae0._4_4_;
      auVar51._0_4_ = fVar184 * (float)local_ae0._0_4_;
      auVar51._8_4_ = fVar206 * fStack_ad8;
      auVar51._12_4_ = fVar232 * fStack_ad4;
      auVar51._16_4_ = fVar258 * fStack_ad0;
      auVar51._20_4_ = fVar341 * fStack_acc;
      auVar51._24_4_ = fVar15 * fStack_ac8;
      auVar51._28_4_ = uVar1;
      auVar364 = vsubps_avx(auVar220,auVar51);
      auVar220 = vrcpps_avx(auVar364);
      fVar231 = auVar220._0_4_;
      fVar184 = auVar220._4_4_;
      auVar52._4_4_ = auVar364._4_4_ * fVar184;
      auVar52._0_4_ = auVar364._0_4_ * fVar231;
      fVar233 = auVar220._8_4_;
      auVar52._8_4_ = auVar364._8_4_ * fVar233;
      fVar185 = auVar220._12_4_;
      auVar52._12_4_ = auVar364._12_4_ * fVar185;
      fVar238 = auVar220._16_4_;
      auVar52._16_4_ = auVar364._16_4_ * fVar238;
      fVar261 = auVar220._20_4_;
      auVar52._20_4_ = auVar364._20_4_ * fVar261;
      fVar186 = auVar220._24_4_;
      auVar52._24_4_ = auVar364._24_4_ * fVar186;
      auVar52._28_4_ = fStack_ac4;
      auVar24 = vsubps_avx(auVar348,auVar52);
      auVar220 = vandps_avx(auVar364,auVar280);
      auVar281._8_4_ = 0x219392ef;
      auVar281._0_8_ = 0x219392ef219392ef;
      auVar281._12_4_ = 0x219392ef;
      auVar281._16_4_ = 0x219392ef;
      auVar281._20_4_ = 0x219392ef;
      auVar281._24_4_ = 0x219392ef;
      auVar281._28_4_ = 0x219392ef;
      auVar94 = vcmpps_avx(auVar220,auVar281,1);
      auVar53._4_4_ = (fVar184 + fVar184 * auVar24._4_4_) * -auVar20._4_4_;
      auVar53._0_4_ = (fVar231 + fVar231 * auVar24._0_4_) * -auVar20._0_4_;
      auVar53._8_4_ = (fVar233 + fVar233 * auVar24._8_4_) * -auVar20._8_4_;
      auVar53._12_4_ = (fVar185 + fVar185 * auVar24._12_4_) * -auVar20._12_4_;
      auVar53._16_4_ = (fVar238 + fVar238 * auVar24._16_4_) * -auVar20._16_4_;
      auVar53._20_4_ = (fVar261 + fVar261 * auVar24._20_4_) * -auVar20._20_4_;
      auVar53._24_4_ = (fVar186 + fVar186 * auVar24._24_4_) * -auVar20._24_4_;
      auVar53._28_4_ = auVar20._28_4_ ^ 0x80000000;
      auVar220 = vcmpps_avx(auVar364,ZEXT832(0) << 0x20,1);
      auVar220 = vorps_avx(auVar94,auVar220);
      auVar220 = vblendvps_avx(auVar53,auVar302,auVar220);
      _local_b00 = vmaxps_avx(auVar363,auVar220);
      auVar220 = vcmpps_avx(auVar364,ZEXT832(0) << 0x20,6);
      auVar220 = vorps_avx(auVar94,auVar220);
      auVar220 = vblendvps_avx(auVar53,auVar308,auVar220);
      auVar93 = vandps_avx(auVar93,local_420);
      local_3a0 = vminps_avx(auVar23,auVar220);
      auVar220 = vcmpps_avx(_local_b00,local_3a0,2);
      auVar94 = auVar93 & auVar220;
      if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar94 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar94 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar94 >> 0x7f,0) != '\0') ||
            (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar94 >> 0xbf,0) != '\0') ||
          (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar94[0x1f] < '\0') {
        auVar94 = vminps_avx(auVar296,auVar95);
        auVar129 = vminps_avx(auVar129,auVar22);
        auVar94 = vminps_avx(auVar94,auVar129);
        auVar94 = vsubps_avx(auVar94,auVar297);
        auVar93 = vandps_avx(auVar220,auVar93);
        auVar68._4_4_ = fStack_31c;
        auVar68._0_4_ = local_320;
        auVar68._8_4_ = fStack_318;
        auVar68._12_4_ = fStack_314;
        auVar68._16_4_ = fStack_310;
        auVar68._20_4_ = fStack_30c;
        auVar68._24_4_ = fStack_308;
        auVar68._28_4_ = fStack_304;
        auVar220 = vminps_avx(auVar68,auVar348);
        auVar220 = vmaxps_avx(auVar220,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar80 + fVar115 * (auVar220._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar106 + fVar139 * (auVar220._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar108 + fVar140 * (auVar220._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar110 + fVar141 * (auVar220._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar80 + fVar115 * (auVar220._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar106 + fVar139 * (auVar220._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar108 + fVar140 * (auVar220._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar110 + auVar220._28_4_ + 7.0;
        auVar67._4_4_ = fStack_33c;
        auVar67._0_4_ = local_340;
        auVar67._8_4_ = fStack_338;
        auVar67._12_4_ = fStack_334;
        auVar67._16_4_ = fStack_330;
        auVar67._20_4_ = fStack_32c;
        auVar67._24_4_ = fStack_328;
        auVar67._28_4_ = fStack_324;
        auVar220 = vminps_avx(auVar67,auVar348);
        auVar220 = vmaxps_avx(auVar220,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar80 + fVar115 * (auVar220._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar106 + fVar139 * (auVar220._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar108 + fVar140 * (auVar220._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar110 + fVar141 * (auVar220._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar80 + fVar115 * (auVar220._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar106 + fVar139 * (auVar220._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar108 + fVar140 * (auVar220._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar110 + auVar220._28_4_ + 7.0;
        auVar54._4_4_ = auVar94._4_4_ * 0.99999976;
        auVar54._0_4_ = auVar94._0_4_ * 0.99999976;
        auVar54._8_4_ = auVar94._8_4_ * 0.99999976;
        auVar54._12_4_ = auVar94._12_4_ * 0.99999976;
        auVar54._16_4_ = auVar94._16_4_ * 0.99999976;
        auVar54._20_4_ = auVar94._20_4_ * 0.99999976;
        auVar54._24_4_ = auVar94._24_4_ * 0.99999976;
        auVar54._28_4_ = 0x3f7ffffc;
        auVar220 = vmaxps_avx(ZEXT832(0) << 0x20,auVar54);
        auVar55._4_4_ = auVar220._4_4_ * auVar220._4_4_;
        auVar55._0_4_ = auVar220._0_4_ * auVar220._0_4_;
        auVar55._8_4_ = auVar220._8_4_ * auVar220._8_4_;
        auVar55._12_4_ = auVar220._12_4_ * auVar220._12_4_;
        auVar55._16_4_ = auVar220._16_4_ * auVar220._16_4_;
        auVar55._20_4_ = auVar220._20_4_ * auVar220._20_4_;
        auVar55._24_4_ = auVar220._24_4_ * auVar220._24_4_;
        auVar55._28_4_ = auVar220._28_4_;
        local_8a0 = vsubps_avx(auVar25,auVar55);
        auVar56._4_4_ = local_8a0._4_4_ * fVar112 * 4.0;
        auVar56._0_4_ = local_8a0._0_4_ * fVar111 * 4.0;
        auVar56._8_4_ = local_8a0._8_4_ * fVar113 * 4.0;
        auVar56._12_4_ = local_8a0._12_4_ * fVar114 * 4.0;
        auVar56._16_4_ = local_8a0._16_4_ * fVar313 * 4.0;
        auVar56._20_4_ = local_8a0._20_4_ * fVar315 * 4.0;
        auVar56._24_4_ = local_8a0._24_4_ * fVar317 * 4.0;
        auVar56._28_4_ = auVar220._28_4_;
        auVar94 = vsubps_avx(auVar38,auVar56);
        auVar220 = vcmpps_avx(auVar94,ZEXT832(0) << 0x20,5);
        if ((((((((auVar220 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar220 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar220 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar220 >> 0x7f,0) == '\0') &&
              (auVar220 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar220 >> 0xbf,0) == '\0') &&
            (auVar220 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar220[0x1f]) {
          _local_840 = ZEXT832(0) << 0x20;
          _local_720 = ZEXT832(0) << 0x20;
          auVar358 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar199 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar224._8_4_ = 0x7f800000;
          auVar224._0_8_ = 0x7f8000007f800000;
          auVar224._12_4_ = 0x7f800000;
          auVar224._16_4_ = 0x7f800000;
          auVar224._20_4_ = 0x7f800000;
          auVar224._24_4_ = 0x7f800000;
          auVar224._28_4_ = 0x7f800000;
          auVar248._8_4_ = 0xff800000;
          auVar248._0_8_ = 0xff800000ff800000;
          auVar248._12_4_ = 0xff800000;
          auVar248._16_4_ = 0xff800000;
          auVar248._20_4_ = 0xff800000;
          auVar248._24_4_ = 0xff800000;
          auVar248._28_4_ = 0xff800000;
          fVar164 = 0.0;
          fVar229 = 0.0;
          fVar183 = 0.0;
          fVar231 = 0.0;
          fVar184 = 0.0;
          fVar233 = 0.0;
          fVar185 = 0.0;
          fVar238 = 0.0;
          local_8a0 = auVar28;
          _local_820 = _local_840;
        }
        else {
          auVar20 = vsqrtps_avx(auVar94);
          auVar180._0_4_ = fVar111 + fVar111;
          auVar180._4_4_ = fVar112 + fVar112;
          auVar180._8_4_ = fVar113 + fVar113;
          auVar180._12_4_ = fVar114 + fVar114;
          auVar180._16_4_ = fVar313 + fVar313;
          auVar180._20_4_ = fVar315 + fVar315;
          auVar180._24_4_ = fVar317 + fVar317;
          auVar180._28_4_ = fVar164 + fVar164;
          auVar129 = vrcpps_avx(auVar180);
          fVar164 = auVar129._0_4_;
          fVar231 = auVar129._4_4_;
          auVar57._4_4_ = auVar180._4_4_ * fVar231;
          auVar57._0_4_ = auVar180._0_4_ * fVar164;
          fVar184 = auVar129._8_4_;
          auVar57._8_4_ = auVar180._8_4_ * fVar184;
          fVar233 = auVar129._12_4_;
          auVar57._12_4_ = auVar180._12_4_ * fVar233;
          fVar185 = auVar129._16_4_;
          auVar57._16_4_ = auVar180._16_4_ * fVar185;
          fVar238 = auVar129._20_4_;
          auVar57._20_4_ = auVar180._20_4_ * fVar238;
          fVar261 = auVar129._24_4_;
          auVar57._24_4_ = auVar180._24_4_ * fVar261;
          auVar57._28_4_ = auVar180._28_4_;
          auVar22 = vsubps_avx(auVar348,auVar57);
          fVar164 = fVar164 + fVar164 * auVar22._0_4_;
          fVar231 = fVar231 + fVar231 * auVar22._4_4_;
          fVar184 = fVar184 + fVar184 * auVar22._8_4_;
          fVar233 = fVar233 + fVar233 * auVar22._12_4_;
          fVar185 = fVar185 + fVar185 * auVar22._16_4_;
          fVar238 = fVar238 + fVar238 * auVar22._20_4_;
          fVar261 = fVar261 + fVar261 * auVar22._24_4_;
          fVar186 = auVar129._28_4_ + auVar22._28_4_;
          auVar201._0_8_ = local_900._0_8_ ^ 0x8000000080000000;
          auVar201._8_4_ = -local_900._8_4_;
          auVar201._12_4_ = -local_900._12_4_;
          auVar201._16_4_ = -local_900._16_4_;
          auVar201._20_4_ = -local_900._20_4_;
          auVar201._24_4_ = -local_900._24_4_;
          auVar201._28_4_ = -local_900._28_4_;
          auVar129 = vsubps_avx(auVar201,auVar20);
          fVar209 = auVar129._0_4_ * fVar164;
          fVar230 = auVar129._4_4_ * fVar231;
          auVar58._4_4_ = fVar230;
          auVar58._0_4_ = fVar209;
          fVar232 = auVar129._8_4_ * fVar184;
          auVar58._8_4_ = fVar232;
          fVar234 = auVar129._12_4_ * fVar233;
          auVar58._12_4_ = fVar234;
          fVar235 = auVar129._16_4_ * fVar185;
          auVar58._16_4_ = fVar235;
          fVar236 = auVar129._20_4_ * fVar238;
          auVar58._20_4_ = fVar236;
          fVar254 = auVar129._24_4_ * fVar261;
          auVar58._24_4_ = fVar254;
          auVar58._28_4_ = local_780._28_4_;
          auVar20 = vsubps_avx(auVar20,local_900);
          fVar164 = auVar20._0_4_ * fVar164;
          fVar231 = auVar20._4_4_ * fVar231;
          auVar59._4_4_ = fVar231;
          auVar59._0_4_ = fVar164;
          fVar184 = auVar20._8_4_ * fVar184;
          auVar59._8_4_ = fVar184;
          fVar233 = auVar20._12_4_ * fVar233;
          auVar59._12_4_ = fVar233;
          fVar185 = auVar20._16_4_ * fVar185;
          auVar59._16_4_ = fVar185;
          fVar238 = auVar20._20_4_ * fVar238;
          auVar59._20_4_ = fVar238;
          fVar261 = auVar20._24_4_ * fVar261;
          auVar59._24_4_ = fVar261;
          auVar59._28_4_ = local_b00._28_4_;
          fVar187 = local_360 * (fVar209 * fVar305 + local_9c0);
          fVar188 = fStack_35c * (fVar230 * fVar309 + fStack_9bc);
          fVar189 = fStack_358 * (fVar232 * fVar310 + fStack_9b8);
          fVar205 = fStack_354 * (fVar234 * fVar311 + fStack_9b4);
          fVar206 = fStack_350 * (fVar235 * fVar312 + fStack_9b0);
          fVar207 = fStack_34c * (fVar236 * fVar314 + fStack_9ac);
          fVar208 = fStack_348 * (fVar254 * fVar316 + fStack_9a8);
          local_920._28_4_ = auVar200._28_4_;
          auVar155._0_4_ = auVar345._0_4_ + fVar183 * fVar187;
          auVar155._4_4_ = auVar345._4_4_ + fVar257 * fVar188;
          auVar155._8_4_ = auVar345._8_4_ + fVar191 * fVar189;
          auVar155._12_4_ = auVar345._12_4_ + fVar212 * fVar205;
          auVar155._16_4_ = auVar345._16_4_ + fVar239 * fVar206;
          auVar155._20_4_ = auVar345._20_4_ + fVar304 * fVar207;
          auVar155._24_4_ = auVar345._24_4_ + fVar13 * fVar208;
          auVar155._28_4_ = auVar345._28_4_ + auVar20._28_4_ + fStack_9a4;
          auVar60._4_4_ = fVar230 * (float)local_ae0._4_4_;
          auVar60._0_4_ = fVar209 * (float)local_ae0._0_4_;
          auVar60._8_4_ = fVar232 * fStack_ad8;
          auVar60._12_4_ = fVar234 * fStack_ad4;
          auVar60._16_4_ = fVar235 * fStack_ad0;
          auVar60._20_4_ = fVar236 * fStack_acc;
          auVar60._24_4_ = fVar254 * fStack_ac8;
          auVar60._28_4_ = fVar186;
          _local_b40 = vsubps_avx(auVar60,auVar155);
          auVar181._0_4_ = auVar359._0_4_ + fVar229 * fVar187;
          auVar181._4_4_ = auVar359._4_4_ + fVar253 * fVar188;
          auVar181._8_4_ = auVar359._8_4_ + fVar190 * fVar189;
          auVar181._12_4_ = auVar359._12_4_ + fVar210 * fVar205;
          auVar181._16_4_ = auVar359._16_4_ + fVar237 * fVar206;
          auVar181._20_4_ = auVar359._20_4_ + fVar271 * fVar207;
          auVar181._24_4_ = auVar359._24_4_ + fVar12 * fVar208;
          auVar181._28_4_ = auVar359._28_4_ + fVar186;
          auVar225._0_4_ = (float)local_7e0._0_4_ * fVar209;
          auVar225._4_4_ = (float)local_7e0._4_4_ * fVar230;
          auVar225._8_4_ = fStack_7d8 * fVar232;
          auVar225._12_4_ = fStack_7d4 * fVar234;
          auVar225._16_4_ = fStack_7d0 * fVar235;
          auVar225._20_4_ = fStack_7cc * fVar236;
          auVar225._24_4_ = fStack_7c8 * fVar254;
          auVar225._28_4_ = 0;
          _local_9e0 = vsubps_avx(auVar225,auVar181);
          auVar202._0_4_ = auVar367._0_4_ + fVar322 * fVar187;
          auVar202._4_4_ = auVar367._4_4_ + fVar325 * fVar188;
          auVar202._8_4_ = auVar367._8_4_ + fVar326 * fVar189;
          auVar202._12_4_ = auVar367._12_4_ + fVar327 * fVar205;
          auVar202._16_4_ = auVar367._16_4_ + fVar328 * fVar206;
          auVar202._20_4_ = auVar367._20_4_ + fVar329 * fVar207;
          auVar202._24_4_ = auVar367._24_4_ + fVar330 * fVar208;
          auVar202._28_4_ = auVar367._28_4_ + auVar129._28_4_;
          auVar61._4_4_ = (float)local_8e0._4_4_ * fVar230;
          auVar61._0_4_ = (float)local_8e0._0_4_ * fVar209;
          auVar61._8_4_ = fStack_8d8 * fVar232;
          auVar61._12_4_ = fStack_8d4 * fVar234;
          auVar61._16_4_ = fStack_8d0 * fVar235;
          auVar61._20_4_ = fStack_8cc * fVar236;
          auVar61._24_4_ = fStack_8c8 * fVar254;
          auVar61._28_4_ = 0;
          auVar129 = vsubps_avx(auVar61,auVar202);
          auVar199 = auVar129._0_28_;
          fVar186 = local_360 * (fVar164 * fVar305 + local_9c0);
          fVar187 = fStack_35c * (fVar231 * fVar309 + fStack_9bc);
          fVar188 = fStack_358 * (fVar184 * fVar310 + fStack_9b8);
          fVar189 = fStack_354 * (fVar233 * fVar311 + fStack_9b4);
          fVar205 = fStack_350 * (fVar185 * fVar312 + fStack_9b0);
          fVar206 = fStack_34c * (fVar238 * fVar314 + fStack_9ac);
          fVar207 = fStack_348 * (fVar261 * fVar316 + fStack_9a8);
          auVar249._0_4_ = auVar345._0_4_ + fVar183 * fVar186;
          auVar249._4_4_ = auVar345._4_4_ + fVar257 * fVar187;
          auVar249._8_4_ = auVar345._8_4_ + fVar191 * fVar188;
          auVar249._12_4_ = auVar345._12_4_ + fVar212 * fVar189;
          auVar249._16_4_ = auVar345._16_4_ + fVar239 * fVar205;
          auVar249._20_4_ = auVar345._20_4_ + fVar304 * fVar206;
          auVar249._24_4_ = auVar345._24_4_ + fVar13 * fVar207;
          auVar249._28_4_ = auVar345._28_4_ + (float)local_920._28_4_;
          auVar62._4_4_ = fVar231 * (float)local_ae0._4_4_;
          auVar62._0_4_ = fVar164 * (float)local_ae0._0_4_;
          auVar62._8_4_ = fVar184 * fStack_ad8;
          auVar62._12_4_ = fVar233 * fStack_ad4;
          auVar62._16_4_ = fVar185 * fStack_ad0;
          auVar62._20_4_ = fVar238 * fStack_acc;
          auVar62._24_4_ = fVar261 * fStack_ac8;
          auVar62._28_4_ = fStack_ac4;
          _local_820 = vsubps_avx(auVar62,auVar249);
          auVar250._0_4_ = auVar359._0_4_ + fVar229 * fVar186;
          auVar250._4_4_ = auVar359._4_4_ + fVar253 * fVar187;
          auVar250._8_4_ = auVar359._8_4_ + fVar190 * fVar188;
          auVar250._12_4_ = auVar359._12_4_ + fVar210 * fVar189;
          auVar250._16_4_ = auVar359._16_4_ + fVar237 * fVar205;
          auVar250._20_4_ = auVar359._20_4_ + fVar271 * fVar206;
          auVar250._24_4_ = auVar359._24_4_ + fVar12 * fVar207;
          auVar250._28_4_ = auVar359._28_4_ + local_820._28_4_;
          auVar63._4_4_ = (float)local_7e0._4_4_ * fVar231;
          auVar63._0_4_ = (float)local_7e0._0_4_ * fVar164;
          auVar63._8_4_ = fStack_7d8 * fVar184;
          auVar63._12_4_ = fStack_7d4 * fVar233;
          auVar63._16_4_ = fStack_7d0 * fVar185;
          auVar63._20_4_ = fStack_7cc * fVar238;
          auVar63._24_4_ = fStack_7c8 * fVar261;
          auVar63._28_4_ = fStack_ac4;
          _local_840 = vsubps_avx(auVar63,auVar250);
          auVar226._0_4_ = auVar367._0_4_ + fVar322 * fVar186;
          auVar226._4_4_ = auVar367._4_4_ + fVar325 * fVar187;
          auVar226._8_4_ = auVar367._8_4_ + fVar326 * fVar188;
          auVar226._12_4_ = auVar367._12_4_ + fVar327 * fVar189;
          auVar226._16_4_ = auVar367._16_4_ + fVar328 * fVar205;
          auVar226._20_4_ = auVar367._20_4_ + fVar329 * fVar206;
          auVar226._24_4_ = auVar367._24_4_ + fVar330 * fVar207;
          auVar226._28_4_ = auVar367._28_4_ + fStack_9a4 + 0.0;
          auVar64._4_4_ = (float)local_8e0._4_4_ * fVar231;
          auVar64._0_4_ = (float)local_8e0._0_4_ * fVar164;
          auVar64._8_4_ = fStack_8d8 * fVar184;
          auVar64._12_4_ = fStack_8d4 * fVar233;
          auVar64._16_4_ = fStack_8d0 * fVar185;
          auVar64._20_4_ = fStack_8cc * fVar238;
          auVar64._24_4_ = fStack_8c8 * fVar261;
          auVar64._28_4_ = local_840._28_4_;
          _local_720 = vsubps_avx(auVar64,auVar226);
          auVar129 = vcmpps_avx(auVar94,_DAT_01faff00,5);
          auVar227._8_4_ = 0x7f800000;
          auVar227._0_8_ = 0x7f8000007f800000;
          auVar227._12_4_ = 0x7f800000;
          auVar227._16_4_ = 0x7f800000;
          auVar227._20_4_ = 0x7f800000;
          auVar227._24_4_ = 0x7f800000;
          auVar227._28_4_ = 0x7f800000;
          auVar224 = vblendvps_avx(auVar227,auVar58,auVar129);
          auVar320._8_4_ = 0x7fffffff;
          auVar320._0_8_ = 0x7fffffff7fffffff;
          auVar320._12_4_ = 0x7fffffff;
          auVar320._16_4_ = 0x7fffffff;
          auVar320._20_4_ = 0x7fffffff;
          auVar320._24_4_ = 0x7fffffff;
          auVar320._28_4_ = 0x7fffffff;
          auVar94 = vandps_avx(auVar320,local_380);
          auVar94 = vmaxps_avx(local_460,auVar94);
          auVar65._4_4_ = auVar94._4_4_ * 1.9073486e-06;
          auVar65._0_4_ = auVar94._0_4_ * 1.9073486e-06;
          auVar65._8_4_ = auVar94._8_4_ * 1.9073486e-06;
          auVar65._12_4_ = auVar94._12_4_ * 1.9073486e-06;
          auVar65._16_4_ = auVar94._16_4_ * 1.9073486e-06;
          auVar65._20_4_ = auVar94._20_4_ * 1.9073486e-06;
          auVar65._24_4_ = auVar94._24_4_ * 1.9073486e-06;
          auVar65._28_4_ = auVar94._28_4_;
          auVar94 = vandps_avx(auVar320,local_4c0);
          auVar94 = vcmpps_avx(auVar94,auVar65,1);
          auVar251._8_4_ = 0xff800000;
          auVar251._0_8_ = 0xff800000ff800000;
          auVar251._12_4_ = 0xff800000;
          auVar251._16_4_ = 0xff800000;
          auVar251._20_4_ = 0xff800000;
          auVar251._24_4_ = 0xff800000;
          auVar251._28_4_ = 0xff800000;
          auVar248 = vblendvps_avx(auVar251,auVar59,auVar129);
          auVar20 = auVar129 & auVar94;
          if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar20 >> 0x7f,0) != '\0') ||
                (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar20 >> 0xbf,0) != '\0') ||
              (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar20[0x1f] < '\0') {
            auVar220 = vandps_avx(auVar94,auVar129);
            auVar215 = vpackssdw_avx(auVar220._0_16_,auVar220._16_16_);
            auVar20 = vcmpps_avx(local_8a0,ZEXT832(0) << 0x20,2);
            auVar365._8_4_ = 0xff800000;
            auVar365._0_8_ = 0xff800000ff800000;
            auVar365._12_4_ = 0xff800000;
            auVar365._16_4_ = 0xff800000;
            auVar365._20_4_ = 0xff800000;
            auVar365._24_4_ = 0xff800000;
            auVar365._28_4_ = 0xff800000;
            auVar369._8_4_ = 0x7f800000;
            auVar369._0_8_ = 0x7f8000007f800000;
            auVar369._12_4_ = 0x7f800000;
            auVar369._16_4_ = 0x7f800000;
            auVar369._20_4_ = 0x7f800000;
            auVar369._24_4_ = 0x7f800000;
            auVar369._28_4_ = 0x7f800000;
            auVar94 = vblendvps_avx(auVar369,auVar365,auVar20);
            auVar151 = vpmovsxwd_avx(auVar215);
            auVar215 = vpunpckhwd_avx(auVar215,auVar215);
            auVar321._16_16_ = auVar215;
            auVar321._0_16_ = auVar151;
            auVar224 = vblendvps_avx(auVar224,auVar94,auVar321);
            auVar94 = vblendvps_avx(auVar365,auVar369,auVar20);
            auVar248 = vblendvps_avx(auVar248,auVar94,auVar321);
            auVar94 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
            auVar105._0_4_ = auVar94._0_4_ ^ auVar220._0_4_;
            auVar105._4_4_ = auVar94._4_4_ ^ auVar220._4_4_;
            auVar105._8_4_ = auVar94._8_4_ ^ auVar220._8_4_;
            auVar105._12_4_ = auVar94._12_4_ ^ auVar220._12_4_;
            auVar105._16_4_ = auVar94._16_4_ ^ auVar220._16_4_;
            auVar105._20_4_ = auVar94._20_4_ ^ auVar220._20_4_;
            auVar105._24_4_ = auVar94._24_4_ ^ auVar220._24_4_;
            auVar105._28_4_ = auVar94._28_4_ ^ auVar220._28_4_;
            auVar220 = vorps_avx(auVar20,auVar105);
            auVar220 = vandps_avx(auVar129,auVar220);
          }
          auVar358 = local_9e0._0_28_;
          fVar164 = (float)local_b40._0_4_;
          fVar229 = (float)local_b40._4_4_;
          fVar183 = fStack_b38;
          fVar231 = fStack_b34;
          fVar184 = fStack_b30;
          fVar233 = fStack_b2c;
          fVar185 = fStack_b28;
          fVar238 = fStack_b24;
        }
        _local_400 = _local_b00;
        local_3e0 = vminps_avx(local_3a0,auVar224);
        _local_740 = vmaxps_avx(_local_b00,auVar248);
        local_3c0 = _local_740;
        auVar94 = vcmpps_avx(_local_b00,local_3e0,2);
        local_680 = vandps_avx(auVar93,auVar94);
        auVar94 = vcmpps_avx(_local_740,local_3a0,2);
        local_760 = vandps_avx(auVar93,auVar94);
        auVar93 = vorps_avx(local_760,local_680);
        auVar324 = ZEXT3264(local_a60);
        if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar93 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar93 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar93 >> 0x7f,0) != '\0') ||
              (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar93 >> 0xbf,0) != '\0') ||
            (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar93[0x1f] < '\0') {
          local_920 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
          local_6c0._0_4_ = auVar220._0_4_ ^ local_920._0_4_;
          local_6c0._4_4_ = auVar220._4_4_ ^ local_920._4_4_;
          local_6c0._8_4_ = auVar220._8_4_ ^ local_920._8_4_;
          local_6c0._12_4_ = auVar220._12_4_ ^ local_920._12_4_;
          local_6c0._16_4_ = auVar220._16_4_ ^ local_920._16_4_;
          local_6c0._20_4_ = auVar220._20_4_ ^ local_920._20_4_;
          local_6c0._24_4_ = auVar220._24_4_ ^ local_920._24_4_;
          local_6c0._28_4_ = auVar220._28_4_ ^ (uint)local_920._28_4_;
          auVar98._0_4_ =
               fVar164 * (float)local_ae0._0_4_ +
               auVar358._0_4_ * (float)local_7e0._0_4_ + (float)local_8e0._0_4_ * auVar199._0_4_;
          auVar98._4_4_ =
               fVar229 * (float)local_ae0._4_4_ +
               auVar358._4_4_ * (float)local_7e0._4_4_ + (float)local_8e0._4_4_ * auVar199._4_4_;
          auVar98._8_4_ =
               fVar183 * fStack_ad8 + auVar358._8_4_ * fStack_7d8 + fStack_8d8 * auVar199._8_4_;
          auVar98._12_4_ =
               fVar231 * fStack_ad4 + auVar358._12_4_ * fStack_7d4 + fStack_8d4 * auVar199._12_4_;
          auVar98._16_4_ =
               fVar184 * fStack_ad0 + auVar358._16_4_ * fStack_7d0 + fStack_8d0 * auVar199._16_4_;
          auVar98._20_4_ =
               fVar233 * fStack_acc + auVar358._20_4_ * fStack_7cc + fStack_8cc * auVar199._20_4_;
          auVar98._24_4_ =
               fVar185 * fStack_ac8 + auVar358._24_4_ * fStack_7c8 + fStack_8c8 * auVar199._24_4_;
          auVar98._28_4_ = fVar238 + local_920._28_4_ + fStack_7c4;
          auVar132._8_4_ = 0x7fffffff;
          auVar132._0_8_ = 0x7fffffff7fffffff;
          auVar132._12_4_ = 0x7fffffff;
          auVar132._16_4_ = 0x7fffffff;
          auVar132._20_4_ = 0x7fffffff;
          auVar132._24_4_ = 0x7fffffff;
          auVar132._28_4_ = 0x7fffffff;
          auVar93 = vandps_avx(auVar98,auVar132);
          auVar133._8_4_ = 0x3e99999a;
          auVar133._0_8_ = 0x3e99999a3e99999a;
          auVar133._12_4_ = 0x3e99999a;
          auVar133._16_4_ = 0x3e99999a;
          auVar133._20_4_ = 0x3e99999a;
          auVar133._24_4_ = 0x3e99999a;
          auVar133._28_4_ = 0x3e99999a;
          auVar93 = vcmpps_avx(auVar93,auVar133,1);
          auVar93 = vorps_avx(auVar93,local_6c0);
          auVar134._8_4_ = 3;
          auVar134._0_8_ = 0x300000003;
          auVar134._12_4_ = 3;
          auVar134._16_4_ = 3;
          auVar134._20_4_ = 3;
          auVar134._24_4_ = 3;
          auVar134._28_4_ = 3;
          auVar156._8_4_ = 2;
          auVar156._0_8_ = 0x200000002;
          auVar156._12_4_ = 2;
          auVar156._16_4_ = 2;
          auVar156._20_4_ = 2;
          auVar156._24_4_ = 2;
          auVar156._28_4_ = 2;
          auVar93 = vblendvps_avx(auVar156,auVar134,auVar93);
          local_6e0 = ZEXT432(local_ccc);
          local_700 = vpshufd_avx(ZEXT416(local_ccc),0);
          fVar164 = 0.0;
          auVar215 = vpcmpgtd_avx(auVar93._16_16_,local_700);
          auStack_6f0 = auVar179._16_16_;
          auVar151 = vpcmpgtd_avx(auVar93._0_16_,local_700);
          auVar135._16_16_ = auVar215;
          auVar135._0_16_ = auVar151;
          local_6a0 = vblendps_avx(ZEXT1632(auVar151),auVar135,0xf0);
          local_640 = vandnps_avx(local_6a0,local_680);
          auVar334 = ZEXT3264(local_640);
          auVar93 = local_680 & ~local_6a0;
          auVar252 = ZEXT3264(local_b20);
          if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar93 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar93 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar93 >> 0x7f,0) == '\0') &&
                (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar93 >> 0xbf,0) == '\0') &&
              (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar93[0x1f]) {
            auVar215 = vshufps_avx(local_610,local_610,0);
            auVar99._16_16_ = auVar215;
            auVar99._0_16_ = auVar215;
            auVar199 = local_ae0._0_28_;
            fVar229 = (float)local_8e0._0_4_;
            fVar231 = (float)local_8e0._4_4_;
            fVar184 = fStack_8d8;
            fVar233 = fStack_8d4;
            fVar185 = fStack_8d0;
            fVar238 = fStack_8cc;
            fVar253 = fStack_8c8;
          }
          else {
            local_800._4_4_ = (float)local_b00._4_4_ + local_8c0._4_4_;
            local_800._0_4_ = (float)local_b00._0_4_ + (float)local_8c0;
            fStack_7f8 = fStack_af8 + (float)uStack_8b8;
            fStack_7f4 = fStack_af4 + uStack_8b8._4_4_;
            fStack_7f0 = fStack_af0 + (float)uStack_8b0;
            fStack_7ec = fStack_aec + uStack_8b0._4_4_;
            fStack_7e8 = fStack_ae8 + (float)uStack_8a8;
            fStack_7e4 = local_b00._28_4_ + uStack_8a8._4_4_;
            do {
              auVar100._8_4_ = 0x7f800000;
              auVar100._0_8_ = 0x7f8000007f800000;
              auVar100._12_4_ = 0x7f800000;
              auVar100._16_4_ = 0x7f800000;
              auVar100._20_4_ = 0x7f800000;
              auVar100._24_4_ = 0x7f800000;
              auVar100._28_4_ = 0x7f800000;
              auVar93 = auVar334._0_32_;
              auVar220 = vblendvps_avx(auVar100,_local_b00,auVar93);
              auVar94 = vshufps_avx(auVar220,auVar220,0xb1);
              auVar94 = vminps_avx(auVar220,auVar94);
              auVar129 = vshufpd_avx(auVar94,auVar94,5);
              auVar94 = vminps_avx(auVar94,auVar129);
              auVar129 = vperm2f128_avx(auVar94,auVar94,1);
              auVar94 = vminps_avx(auVar94,auVar129);
              auVar220 = vcmpps_avx(auVar220,auVar94,0);
              auVar94 = auVar93 & auVar220;
              if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar94 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar94 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar94 >> 0x7f,0) != '\0') ||
                    (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar94 >> 0xbf,0) != '\0') ||
                  (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar94[0x1f] < '\0') {
                auVar93 = vandps_avx(auVar220,auVar93);
              }
              uVar76 = vmovmskps_avx(auVar93);
              uVar74 = 0;
              if (uVar76 != 0) {
                for (; (uVar76 >> uVar74 & 1) == 0; uVar74 = uVar74 + 1) {
                }
              }
              uVar71 = (ulong)uVar74;
              *(undefined4 *)(local_640 + uVar71 * 4) = 0;
              fVar164 = local_1a0[uVar71];
              uVar74 = *(uint *)(local_400 + uVar71 * 4);
              fVar229 = auVar118._0_4_;
              if ((float)local_940._0_4_ < 0.0) {
                fVar229 = sqrtf((float)local_940._0_4_);
              }
              auVar151 = vminps_avx(_local_b50,_local_b70);
              auVar215 = vmaxps_avx(_local_b50,_local_b70);
              auVar89 = vminps_avx(_local_b60,_local_b80);
              auVar82 = vminps_avx(auVar151,auVar89);
              auVar151 = vmaxps_avx(_local_b60,_local_b80);
              auVar89 = vmaxps_avx(auVar215,auVar151);
              auVar167._8_4_ = 0x7fffffff;
              auVar167._0_8_ = 0x7fffffff7fffffff;
              auVar167._12_4_ = 0x7fffffff;
              auVar215 = vandps_avx(auVar82,auVar167);
              auVar151 = vandps_avx(auVar89,auVar167);
              auVar215 = vmaxps_avx(auVar215,auVar151);
              auVar151 = vmovshdup_avx(auVar215);
              auVar151 = vmaxss_avx(auVar151,auVar215);
              auVar215 = vshufpd_avx(auVar215,auVar215,1);
              auVar215 = vmaxss_avx(auVar215,auVar151);
              fVar183 = auVar215._0_4_ * 1.9073486e-06;
              local_780._0_4_ = fVar229 * 1.9073486e-06;
              local_7c0._0_16_ = vshufps_avx(auVar89,auVar89,0xff);
              auVar215 = vinsertps_avx(ZEXT416(uVar74),ZEXT416((uint)fVar164),0x10);
              bVar79 = true;
              uVar71 = 0;
              do {
                auVar151 = vmovshdup_avx(auVar215);
                fVar189 = auVar151._0_4_;
                fVar233 = 1.0 - fVar189;
                auVar151 = vshufps_avx(auVar215,auVar215,0x55);
                fVar164 = auVar151._0_4_;
                fVar229 = auVar151._4_4_;
                fVar231 = auVar151._8_4_;
                fVar184 = auVar151._12_4_;
                auVar151 = vshufps_avx(ZEXT416((uint)fVar233),ZEXT416((uint)fVar233),0);
                fVar185 = auVar151._0_4_;
                fVar238 = auVar151._4_4_;
                fVar253 = auVar151._8_4_;
                fVar257 = auVar151._12_4_;
                fVar261 = (float)local_b60._0_4_ * fVar164 + (float)local_b70._0_4_ * fVar185;
                fVar186 = (float)local_b60._4_4_ * fVar229 + (float)local_b70._4_4_ * fVar238;
                fVar187 = fStack_b58 * fVar231 + fStack_b68 * fVar253;
                fVar188 = fStack_b54 * fVar184 + fStack_b64 * fVar257;
                auVar216._0_4_ =
                     fVar185 * ((float)local_b70._0_4_ * fVar164 + fVar185 * (float)local_b50._0_4_)
                     + fVar164 * fVar261;
                auVar216._4_4_ =
                     fVar238 * ((float)local_b70._4_4_ * fVar229 + fVar238 * (float)local_b50._4_4_)
                     + fVar229 * fVar186;
                auVar216._8_4_ =
                     fVar253 * (fStack_b68 * fVar231 + fVar253 * fStack_b48) + fVar231 * fVar187;
                auVar216._12_4_ =
                     fVar257 * (fStack_b64 * fVar184 + fVar257 * fStack_b44) + fVar184 * fVar188;
                auVar168._0_4_ =
                     fVar185 * fVar261 +
                     fVar164 * (fVar164 * (float)local_b80._0_4_ + (float)local_b60._0_4_ * fVar185)
                ;
                auVar168._4_4_ =
                     fVar238 * fVar186 +
                     fVar229 * (fVar229 * (float)local_b80._4_4_ + (float)local_b60._4_4_ * fVar238)
                ;
                auVar168._8_4_ =
                     fVar253 * fVar187 + fVar231 * (fVar231 * fStack_b78 + fStack_b58 * fVar253);
                auVar168._12_4_ =
                     fVar257 * fVar188 + fVar184 * (fVar184 * fStack_b74 + fStack_b54 * fVar257);
                auVar151 = vshufps_avx(auVar215,auVar215,0);
                auVar119._0_4_ = auVar151._0_4_ * (float)local_930._0_4_ + 0.0;
                auVar119._4_4_ = auVar151._4_4_ * (float)local_930._4_4_ + 0.0;
                auVar119._8_4_ = auVar151._8_4_ * fStack_928 + 0.0;
                auVar119._12_4_ = auVar151._12_4_ * fStack_924 + 0.0;
                auVar86._0_4_ = fVar185 * auVar216._0_4_ + fVar164 * auVar168._0_4_;
                auVar86._4_4_ = fVar238 * auVar216._4_4_ + fVar229 * auVar168._4_4_;
                auVar86._8_4_ = fVar253 * auVar216._8_4_ + fVar231 * auVar168._8_4_;
                auVar86._12_4_ = fVar257 * auVar216._12_4_ + fVar184 * auVar168._12_4_;
                local_8a0._0_16_ = auVar86;
                auVar151 = vsubps_avx(auVar119,auVar86);
                _local_9e0 = auVar151;
                auVar151 = vdpps_avx(auVar151,auVar151,0x7f);
                _local_b40 = auVar151;
                if (auVar151._0_4_ < 0.0) {
                  fVar164 = sqrtf(auVar151._0_4_);
                }
                else {
                  auVar151 = vsqrtss_avx(auVar151,auVar151);
                  fVar164 = auVar151._0_4_;
                }
                auVar151 = vsubps_avx(auVar168,auVar216);
                auVar243._0_4_ = auVar151._0_4_ * 3.0;
                auVar243._4_4_ = auVar151._4_4_ * 3.0;
                auVar243._8_4_ = auVar151._8_4_ * 3.0;
                auVar243._12_4_ = auVar151._12_4_ * 3.0;
                auVar151 = vshufps_avx(ZEXT416((uint)(fVar189 * 6.0)),ZEXT416((uint)(fVar189 * 6.0))
                                       ,0);
                auVar89 = ZEXT416((uint)((fVar233 - (fVar189 + fVar189)) * 6.0));
                auVar82 = vshufps_avx(auVar89,auVar89,0);
                auVar89 = ZEXT416((uint)((fVar189 - (fVar233 + fVar233)) * 6.0));
                auVar83 = vshufps_avx(auVar89,auVar89,0);
                auVar117 = vshufps_avx(ZEXT416((uint)(fVar233 * 6.0)),ZEXT416((uint)(fVar233 * 6.0))
                                       ,0);
                auVar89 = vdpps_avx(auVar243,auVar243,0x7f);
                auVar120._0_4_ =
                     auVar117._0_4_ * (float)local_b50._0_4_ +
                     auVar83._0_4_ * (float)local_b70._0_4_ +
                     auVar151._0_4_ * (float)local_b80._0_4_ +
                     auVar82._0_4_ * (float)local_b60._0_4_;
                auVar120._4_4_ =
                     auVar117._4_4_ * (float)local_b50._4_4_ +
                     auVar83._4_4_ * (float)local_b70._4_4_ +
                     auVar151._4_4_ * (float)local_b80._4_4_ +
                     auVar82._4_4_ * (float)local_b60._4_4_;
                auVar120._8_4_ =
                     auVar117._8_4_ * fStack_b48 +
                     auVar83._8_4_ * fStack_b68 +
                     auVar151._8_4_ * fStack_b78 + auVar82._8_4_ * fStack_b58;
                auVar120._12_4_ =
                     auVar117._12_4_ * fStack_b44 +
                     auVar83._12_4_ * fStack_b64 +
                     auVar151._12_4_ * fStack_b74 + auVar82._12_4_ * fStack_b54;
                auVar151 = vblendps_avx(auVar89,_DAT_01f7aa10,0xe);
                auVar82 = vrsqrtss_avx(auVar151,auVar151);
                fVar231 = auVar82._0_4_;
                fVar229 = auVar89._0_4_;
                auVar82 = vdpps_avx(auVar243,auVar120,0x7f);
                auVar83 = vshufps_avx(auVar89,auVar89,0);
                auVar121._0_4_ = auVar120._0_4_ * auVar83._0_4_;
                auVar121._4_4_ = auVar120._4_4_ * auVar83._4_4_;
                auVar121._8_4_ = auVar120._8_4_ * auVar83._8_4_;
                auVar121._12_4_ = auVar120._12_4_ * auVar83._12_4_;
                auVar82 = vshufps_avx(auVar82,auVar82,0);
                auVar195._0_4_ = auVar243._0_4_ * auVar82._0_4_;
                auVar195._4_4_ = auVar243._4_4_ * auVar82._4_4_;
                auVar195._8_4_ = auVar243._8_4_ * auVar82._8_4_;
                auVar195._12_4_ = auVar243._12_4_ * auVar82._12_4_;
                auVar117 = vsubps_avx(auVar121,auVar195);
                auVar82 = vrcpss_avx(auVar151,auVar151);
                auVar151 = vmaxss_avx(ZEXT416((uint)fVar183),
                                      ZEXT416((uint)(auVar215._0_4_ * (float)local_780._0_4_)));
                auVar82 = ZEXT416((uint)(auVar82._0_4_ * (2.0 - fVar229 * auVar82._0_4_)));
                auVar82 = vshufps_avx(auVar82,auVar82,0);
                uVar66 = CONCAT44(auVar243._4_4_,auVar243._0_4_);
                auVar294._0_8_ = uVar66 ^ 0x8000000080000000;
                auVar294._8_4_ = -auVar243._8_4_;
                auVar294._12_4_ = -auVar243._12_4_;
                auVar83 = ZEXT416((uint)(fVar231 * 1.5 +
                                        fVar229 * -0.5 * fVar231 * fVar231 * fVar231));
                auVar83 = vshufps_avx(auVar83,auVar83,0);
                auVar169._0_4_ = auVar83._0_4_ * auVar117._0_4_ * auVar82._0_4_;
                auVar169._4_4_ = auVar83._4_4_ * auVar117._4_4_ * auVar82._4_4_;
                auVar169._8_4_ = auVar83._8_4_ * auVar117._8_4_ * auVar82._8_4_;
                auVar169._12_4_ = auVar83._12_4_ * auVar117._12_4_ * auVar82._12_4_;
                local_960._0_4_ = auVar243._0_4_ * auVar83._0_4_;
                local_960._4_4_ = auVar243._4_4_ * auVar83._4_4_;
                local_960._8_4_ = auVar243._8_4_ * auVar83._8_4_;
                local_960._12_4_ = auVar243._12_4_ * auVar83._12_4_;
                if (fVar229 < 0.0) {
                  local_9a0._0_16_ = auVar169;
                  fVar229 = sqrtf(fVar229);
                  auVar169 = local_9a0._0_16_;
                }
                else {
                  auVar89 = vsqrtss_avx(auVar89,auVar89);
                  fVar229 = auVar89._0_4_;
                }
                auVar89 = vdpps_avx(_local_9e0,local_960._0_16_,0x7f);
                fVar164 = (fVar183 / fVar229) * (fVar164 + 1.0) + fVar164 * fVar183 + auVar151._0_4_
                ;
                auVar82 = vdpps_avx(auVar294,local_960._0_16_,0x7f);
                auVar83 = vdpps_avx(_local_9e0,auVar169,0x7f);
                auVar117 = vdpps_avx(_local_930,local_960._0_16_,0x7f);
                auVar81 = vdpps_avx(_local_9e0,auVar294,0x7f);
                fVar229 = auVar82._0_4_ + auVar83._0_4_;
                fVar231 = auVar89._0_4_;
                auVar87._0_4_ = fVar231 * fVar231;
                auVar87._4_4_ = auVar89._4_4_ * auVar89._4_4_;
                auVar87._8_4_ = auVar89._8_4_ * auVar89._8_4_;
                auVar87._12_4_ = auVar89._12_4_ * auVar89._12_4_;
                auVar83 = vsubps_avx(_local_b40,auVar87);
                local_960._0_16_ = ZEXT416((uint)fVar229);
                auVar82 = vdpps_avx(_local_9e0,_local_930,0x7f);
                fVar184 = auVar81._0_4_ - fVar231 * fVar229;
                fVar231 = auVar82._0_4_ - fVar231 * auVar117._0_4_;
                auVar82 = vrsqrtss_avx(auVar83,auVar83);
                fVar233 = auVar83._0_4_;
                fVar229 = auVar82._0_4_;
                fVar229 = fVar229 * 1.5 + fVar233 * -0.5 * fVar229 * fVar229 * fVar229;
                if (fVar233 < 0.0) {
                  local_9a0._0_16_ = auVar117;
                  local_900._0_4_ = fVar231;
                  local_7a0._0_4_ = fVar229;
                  local_9c0 = fVar184;
                  fVar233 = sqrtf(fVar233);
                  fVar229 = (float)local_7a0._0_4_;
                  fVar184 = local_9c0;
                  fVar231 = (float)local_900._0_4_;
                  auVar117 = local_9a0._0_16_;
                }
                else {
                  auVar82 = vsqrtss_avx(auVar83,auVar83);
                  fVar233 = auVar82._0_4_;
                }
                auVar81 = vpermilps_avx(local_8a0._0_16_,0xff);
                auVar116 = vshufps_avx(auVar243,auVar243,0xff);
                fVar184 = fVar184 * fVar229 - auVar116._0_4_;
                auVar196._0_8_ = auVar117._0_8_ ^ 0x8000000080000000;
                auVar196._8_4_ = auVar117._8_4_ ^ 0x80000000;
                auVar196._12_4_ = auVar117._12_4_ ^ 0x80000000;
                auVar217._0_4_ = -fVar184;
                auVar217._4_4_ = 0x80000000;
                auVar217._8_4_ = 0x80000000;
                auVar217._12_4_ = 0x80000000;
                auVar82 = vinsertps_avx(auVar217,ZEXT416((uint)(fVar231 * fVar229)),0x1c);
                auVar117 = vmovsldup_avx(ZEXT416((uint)(local_960._0_4_ * fVar231 * fVar229 -
                                                       auVar117._0_4_ * fVar184)));
                auVar82 = vdivps_avx(auVar82,auVar117);
                auVar83 = vinsertps_avx(local_960._0_16_,auVar196,0x10);
                auVar83 = vdivps_avx(auVar83,auVar117);
                auVar117 = vmovsldup_avx(auVar89);
                auVar91 = ZEXT416((uint)(fVar233 - auVar81._0_4_));
                auVar81 = vmovsldup_avx(auVar91);
                auVar145._0_4_ = auVar117._0_4_ * auVar82._0_4_ + auVar81._0_4_ * auVar83._0_4_;
                auVar145._4_4_ = auVar117._4_4_ * auVar82._4_4_ + auVar81._4_4_ * auVar83._4_4_;
                auVar145._8_4_ = auVar117._8_4_ * auVar82._8_4_ + auVar81._8_4_ * auVar83._8_4_;
                auVar145._12_4_ = auVar117._12_4_ * auVar82._12_4_ + auVar81._12_4_ * auVar83._12_4_
                ;
                auVar215 = vsubps_avx(auVar215,auVar145);
                auVar146._8_4_ = 0x7fffffff;
                auVar146._0_8_ = 0x7fffffff7fffffff;
                auVar146._12_4_ = 0x7fffffff;
                auVar89 = vandps_avx(auVar89,auVar146);
                auVar199 = local_ae0._0_28_;
                fVar229 = (float)local_8e0._0_4_;
                fVar231 = (float)local_8e0._4_4_;
                fVar184 = fStack_8d8;
                fVar233 = fStack_8d4;
                fVar185 = fStack_8d0;
                fVar238 = fStack_8cc;
                fVar253 = fStack_8c8;
                if (auVar89._0_4_ < fVar164) {
                  auVar170._8_4_ = 0x7fffffff;
                  auVar170._0_8_ = 0x7fffffff7fffffff;
                  auVar170._12_4_ = 0x7fffffff;
                  auVar89 = vandps_avx(auVar91,auVar170);
                  if (auVar89._0_4_ <
                      (float)local_7c0._0_4_ * 1.9073486e-06 + fVar164 + auVar151._0_4_) {
                    fVar164 = auVar215._0_4_ + (float)local_870._0_4_;
                    auVar252 = ZEXT3264(local_b20);
                    if (fVar164 < fVar211) {
                      bVar69 = 0;
                      goto LAB_00df6bb1;
                    }
                    fVar183 = *(float *)(ray + k * 4 + 0x100);
                    auVar324 = ZEXT3264(local_a60);
                    if (fVar164 <= fVar183) {
                      auVar151 = vmovshdup_avx(auVar215);
                      bVar69 = 0;
                      if ((auVar151._0_4_ < 0.0) || (1.0 < auVar151._0_4_)) goto LAB_00df6bb6;
                      auVar151 = vrsqrtss_avx(_local_b40,_local_b40);
                      fVar257 = auVar151._0_4_;
                      pGVar4 = (context->scene->geometries).items[local_a18].ptr;
                      if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                        bVar69 = 0;
                        goto LAB_00df6bb6;
                      }
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar69 = 1, pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_00df6bb6;
                      auVar151 = ZEXT416((uint)(fVar257 * 1.5 +
                                               local_b40._0_4_ * -0.5 * fVar257 * fVar257 * fVar257)
                                        );
                      auVar151 = vshufps_avx(auVar151,auVar151,0);
                      auVar147._0_4_ = auVar151._0_4_ * (float)local_9e0._0_4_;
                      auVar147._4_4_ = auVar151._4_4_ * (float)local_9e0._4_4_;
                      auVar147._8_4_ = auVar151._8_4_ * fStack_9d8;
                      auVar147._12_4_ = auVar151._12_4_ * fStack_9d4;
                      auVar122._0_4_ = auVar243._0_4_ + auVar116._0_4_ * auVar147._0_4_;
                      auVar122._4_4_ = auVar243._4_4_ + auVar116._4_4_ * auVar147._4_4_;
                      auVar122._8_4_ = auVar243._8_4_ + auVar116._8_4_ * auVar147._8_4_;
                      auVar122._12_4_ = auVar243._12_4_ + auVar116._12_4_ * auVar147._12_4_;
                      auVar151 = vshufps_avx(auVar147,auVar147,0xc9);
                      auVar89 = vshufps_avx(auVar243,auVar243,0xc9);
                      auVar148._0_4_ = auVar89._0_4_ * auVar147._0_4_;
                      auVar148._4_4_ = auVar89._4_4_ * auVar147._4_4_;
                      auVar148._8_4_ = auVar89._8_4_ * auVar147._8_4_;
                      auVar148._12_4_ = auVar89._12_4_ * auVar147._12_4_;
                      auVar171._0_4_ = auVar243._0_4_ * auVar151._0_4_;
                      auVar171._4_4_ = auVar243._4_4_ * auVar151._4_4_;
                      auVar171._8_4_ = auVar243._8_4_ * auVar151._8_4_;
                      auVar171._12_4_ = auVar243._12_4_ * auVar151._12_4_;
                      auVar82 = vsubps_avx(auVar171,auVar148);
                      auVar151 = vshufps_avx(auVar82,auVar82,0xc9);
                      auVar89 = vshufps_avx(auVar122,auVar122,0xc9);
                      auVar172._0_4_ = auVar89._0_4_ * auVar151._0_4_;
                      auVar172._4_4_ = auVar89._4_4_ * auVar151._4_4_;
                      auVar172._8_4_ = auVar89._8_4_ * auVar151._8_4_;
                      auVar172._12_4_ = auVar89._12_4_ * auVar151._12_4_;
                      auVar151 = vshufps_avx(auVar82,auVar82,0xd2);
                      auVar123._0_4_ = auVar122._0_4_ * auVar151._0_4_;
                      auVar123._4_4_ = auVar122._4_4_ * auVar151._4_4_;
                      auVar123._8_4_ = auVar122._8_4_ * auVar151._8_4_;
                      auVar123._12_4_ = auVar122._12_4_ * auVar151._12_4_;
                      auVar151 = vsubps_avx(auVar172,auVar123);
                      pRVar5 = context->user;
                      local_580 = vshufps_avx(auVar215,auVar215,0x55);
                      auStack_5d0 = vshufps_avx(auVar151,auVar151,0x55);
                      local_5c0 = vshufps_avx(auVar151,auVar151,0xaa);
                      local_5a0 = vshufps_avx(auVar151,auVar151,0);
                      local_5e0 = (RTCHitN  [16])auStack_5d0;
                      local_560 = ZEXT832(0) << 0x20;
                      local_540 = local_4a0._0_8_;
                      uStack_538 = local_4a0._8_8_;
                      uStack_530 = local_4a0._16_8_;
                      uStack_528 = local_4a0._24_8_;
                      local_520 = local_480._0_8_;
                      uStack_518 = local_480._8_8_;
                      uStack_510 = local_480._16_8_;
                      uStack_508 = local_480._24_8_;
                      *(undefined8 *)(local_a20 + 8) = local_920._0_8_;
                      *(undefined8 *)(local_a20 + 10) = local_920._8_8_;
                      *(undefined8 *)(local_a20 + 0xc) = local_920._16_8_;
                      *(undefined8 *)(local_a20 + 0xe) = local_920._24_8_;
                      *(undefined8 *)local_a20 = local_920._0_8_;
                      *(undefined8 *)(local_a20 + 2) = local_920._8_8_;
                      *(undefined8 *)(local_a20 + 4) = local_920._16_8_;
                      *(undefined8 *)(local_a20 + 6) = local_920._24_8_;
                      local_500 = pRVar5->instID[0];
                      local_4e0 = pRVar5->instPrimID[0];
                      *(float *)(ray + k * 4 + 0x100) = fVar164;
                      local_ba0 = *local_a28;
                      local_b90 = *local_a30;
                      local_a10.valid = (int *)local_ba0;
                      local_a10.geometryUserPtr = pGVar4->userPtr;
                      local_a10.context = context->user;
                      local_a10.hit = local_5e0;
                      local_a10.N = 8;
                      local_a10.ray = (RTCRayN *)ray;
                      local_5b0 = local_5c0;
                      local_590 = local_5a0;
                      local_570 = local_580;
                      uStack_4fc = local_500;
                      uStack_4f8 = local_500;
                      uStack_4f4 = local_500;
                      uStack_4f0 = local_500;
                      uStack_4ec = local_500;
                      uStack_4e8 = local_500;
                      uStack_4e4 = local_500;
                      uStack_4dc = local_4e0;
                      uStack_4d8 = local_4e0;
                      uStack_4d4 = local_4e0;
                      uStack_4d0 = local_4e0;
                      uStack_4cc = local_4e0;
                      uStack_4c8 = local_4e0;
                      uStack_4c4 = local_4e0;
                      if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar4->occlusionFilterN)(&local_a10);
                        auVar252 = ZEXT3264(local_b20);
                        auVar324 = ZEXT3264(local_a60);
                        fVar229 = (float)local_8e0._0_4_;
                        fVar231 = (float)local_8e0._4_4_;
                        fVar184 = fStack_8d8;
                        fVar233 = fStack_8d4;
                        fVar185 = fStack_8d0;
                        fVar238 = fStack_8cc;
                        fVar253 = fStack_8c8;
                      }
                      auVar215 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                      auVar151 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                      auVar157._16_16_ = auVar151;
                      auVar157._0_16_ = auVar215;
                      auVar93 = local_920 & ~auVar157;
                      if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar93 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar93 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar93 >> 0x7f,0) == '\0') &&
                            (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar93 >> 0xbf,0) == '\0') &&
                          (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar93[0x1f]) {
                        auVar199 = local_ae0._0_28_;
                      }
                      else {
                        p_Var6 = context->args->filter;
                        if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var6)(&local_a10);
                          auVar252 = ZEXT3264(local_b20);
                          auVar324 = ZEXT3264(local_a60);
                          fVar229 = (float)local_8e0._0_4_;
                          fVar231 = (float)local_8e0._4_4_;
                          fVar184 = fStack_8d8;
                          fVar233 = fStack_8d4;
                          fVar185 = fStack_8d0;
                          fVar238 = fStack_8cc;
                          fVar253 = fStack_8c8;
                        }
                        auVar215 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                        auVar151 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                        auVar101._16_16_ = auVar151;
                        auVar101._0_16_ = auVar215;
                        auVar136._8_4_ = 0xff800000;
                        auVar136._0_8_ = 0xff800000ff800000;
                        auVar136._12_4_ = 0xff800000;
                        auVar136._16_4_ = 0xff800000;
                        auVar136._20_4_ = 0xff800000;
                        auVar136._24_4_ = 0xff800000;
                        auVar136._28_4_ = 0xff800000;
                        auVar93 = vblendvps_avx(auVar136,*(undefined1 (*) [32])
                                                          (local_a10.ray + 0x100),auVar101);
                        *(undefined1 (*) [32])(local_a10.ray + 0x100) = auVar93;
                        auVar93 = local_920 & ~auVar101;
                        auVar199 = local_ae0._0_28_;
                        if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar93 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar93 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar93 >> 0x7f,0) != '\0') ||
                              (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar93 >> 0xbf,0) != '\0') ||
                            (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar93[0x1f] < '\0') {
                          bVar69 = 1;
                          goto LAB_00df6bb6;
                        }
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar183;
                    }
                    bVar69 = 0;
                    goto LAB_00df6bb6;
                  }
                }
                bVar79 = uVar71 < 4;
                uVar71 = uVar71 + 1;
              } while (uVar71 != 5);
              bVar79 = false;
              bVar69 = 5;
LAB_00df6bb1:
              auVar252 = ZEXT3264(local_b20);
              auVar324 = ZEXT3264(local_a60);
LAB_00df6bb6:
              bVar77 = (bool)(bVar77 | bVar79 & bVar69);
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar99._4_4_ = uVar1;
              auVar99._0_4_ = uVar1;
              auVar99._8_4_ = uVar1;
              auVar99._12_4_ = uVar1;
              auVar99._16_4_ = uVar1;
              auVar99._20_4_ = uVar1;
              auVar99._24_4_ = uVar1;
              auVar99._28_4_ = uVar1;
              auVar220 = vcmpps_avx(_local_800,auVar99,2);
              fVar164 = auVar220._28_4_;
              auVar93 = vandps_avx(auVar220,local_640);
              auVar334 = ZEXT3264(auVar93);
              auVar220 = local_640 & auVar220;
              local_640 = auVar93;
            } while ((((((((auVar220 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar220 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar220 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar220 >> 0x7f,0) != '\0') ||
                       (auVar220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar220 >> 0xbf,0) != '\0') ||
                     (auVar220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar220[0x1f] < '\0');
            auVar334 = ZEXT3264(local_3c0);
          }
          auVar303 = ZEXT3264(local_ac0);
          auVar137._0_4_ =
               auVar199._0_4_ * (float)local_820._0_4_ +
               (float)local_7e0._0_4_ * (float)local_840._0_4_ + fVar229 * (float)local_720._0_4_;
          auVar137._4_4_ =
               auVar199._4_4_ * (float)local_820._4_4_ +
               (float)local_7e0._4_4_ * (float)local_840._4_4_ + fVar231 * (float)local_720._4_4_;
          auVar137._8_4_ =
               auVar199._8_4_ * fStack_818 + fStack_7d8 * fStack_838 + fVar184 * fStack_718;
          auVar137._12_4_ =
               auVar199._12_4_ * fStack_814 + fStack_7d4 * fStack_834 + fVar233 * fStack_714;
          auVar137._16_4_ =
               auVar199._16_4_ * fStack_810 + fStack_7d0 * fStack_830 + fVar185 * fStack_710;
          auVar137._20_4_ =
               auVar199._20_4_ * fStack_80c + fStack_7cc * fStack_82c + fVar238 * fStack_70c;
          auVar137._24_4_ =
               auVar199._24_4_ * fStack_808 + fStack_7c8 * fStack_828 + fVar253 * fStack_708;
          auVar137._28_4_ = fVar164 + fVar164 + auVar334._28_4_;
          auVar158._8_4_ = 0x7fffffff;
          auVar158._0_8_ = 0x7fffffff7fffffff;
          auVar158._12_4_ = 0x7fffffff;
          auVar158._16_4_ = 0x7fffffff;
          auVar158._20_4_ = 0x7fffffff;
          auVar158._24_4_ = 0x7fffffff;
          auVar158._28_4_ = 0x7fffffff;
          auVar93 = vandps_avx(auVar137,auVar158);
          auVar159._8_4_ = 0x3e99999a;
          auVar159._0_8_ = 0x3e99999a3e99999a;
          auVar159._12_4_ = 0x3e99999a;
          auVar159._16_4_ = 0x3e99999a;
          auVar159._20_4_ = 0x3e99999a;
          auVar159._24_4_ = 0x3e99999a;
          auVar159._28_4_ = 0x3e99999a;
          auVar93 = vcmpps_avx(auVar93,auVar159,1);
          auVar220 = vorps_avx(auVar93,local_6c0);
          auVar160._0_4_ = (float)local_740._0_4_ + (float)local_8c0;
          auVar160._4_4_ = (float)local_740._4_4_ + local_8c0._4_4_;
          auVar160._8_4_ = fStack_738 + (float)uStack_8b8;
          auVar160._12_4_ = fStack_734 + uStack_8b8._4_4_;
          auVar160._16_4_ = fStack_730 + (float)uStack_8b0;
          auVar160._20_4_ = fStack_72c + uStack_8b0._4_4_;
          auVar160._24_4_ = fStack_728 + (float)uStack_8a8;
          auVar160._28_4_ = fStack_724 + uStack_8a8._4_4_;
          auVar93 = vcmpps_avx(auVar160,auVar99,2);
          _local_840 = vandps_avx(auVar93,local_760);
          auVar161._8_4_ = 3;
          auVar161._0_8_ = 0x300000003;
          auVar161._12_4_ = 3;
          auVar161._16_4_ = 3;
          auVar161._20_4_ = 3;
          auVar161._24_4_ = 3;
          auVar161._28_4_ = 3;
          auVar182._8_4_ = 2;
          auVar182._0_8_ = 0x200000002;
          auVar182._12_4_ = 2;
          auVar182._16_4_ = 2;
          auVar182._20_4_ = 2;
          auVar182._24_4_ = 2;
          auVar182._28_4_ = 2;
          auVar93 = vblendvps_avx(auVar182,auVar161,auVar220);
          auVar215 = vpcmpgtd_avx(auVar93._16_16_,local_700);
          auVar151 = vpshufd_avx(local_6e0._0_16_,0);
          auVar151 = vpcmpgtd_avx(auVar93._0_16_,auVar151);
          auVar162._16_16_ = auVar215;
          auVar162._0_16_ = auVar99._0_16_;
          _local_820 = vblendps_avx(ZEXT1632(auVar151),auVar162,0xf0);
          auVar93 = vandnps_avx(_local_820,_local_840);
          auVar220 = _local_840 & ~_local_820;
          local_660 = auVar93;
          if ((((((((auVar220 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar220 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar220 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar220 >> 0x7f,0) != '\0') ||
                (auVar220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar220 >> 0xbf,0) != '\0') ||
              (auVar220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar220[0x1f] < '\0') {
            local_800._4_4_ = local_8c0._4_4_ + local_3c0._4_4_;
            local_800._0_4_ = (float)local_8c0 + local_3c0._0_4_;
            fStack_7f8 = (float)uStack_8b8 + local_3c0._8_4_;
            fStack_7f4 = uStack_8b8._4_4_ + local_3c0._12_4_;
            fStack_7f0 = (float)uStack_8b0 + local_3c0._16_4_;
            fStack_7ec = uStack_8b0._4_4_ + local_3c0._20_4_;
            fStack_7e8 = (float)uStack_8a8 + local_3c0._24_4_;
            fStack_7e4 = uStack_8a8._4_4_ + local_3c0._28_4_;
            _local_b00 = local_3c0;
            do {
              auVar102._8_4_ = 0x7f800000;
              auVar102._0_8_ = 0x7f8000007f800000;
              auVar102._12_4_ = 0x7f800000;
              auVar102._16_4_ = 0x7f800000;
              auVar102._20_4_ = 0x7f800000;
              auVar102._24_4_ = 0x7f800000;
              auVar102._28_4_ = 0x7f800000;
              auVar220 = vblendvps_avx(auVar102,_local_b00,auVar93);
              auVar94 = vshufps_avx(auVar220,auVar220,0xb1);
              auVar94 = vminps_avx(auVar220,auVar94);
              auVar129 = vshufpd_avx(auVar94,auVar94,5);
              auVar94 = vminps_avx(auVar94,auVar129);
              auVar129 = vperm2f128_avx(auVar94,auVar94,1);
              auVar94 = vminps_avx(auVar94,auVar129);
              auVar94 = vcmpps_avx(auVar220,auVar94,0);
              auVar129 = auVar93 & auVar94;
              auVar220 = auVar93;
              if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar129 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar129 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar129 >> 0x7f,0) != '\0') ||
                    (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar129 >> 0xbf,0) != '\0') ||
                  (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar129[0x1f] < '\0') {
                auVar220 = vandps_avx(auVar94,auVar93);
              }
              uVar76 = vmovmskps_avx(auVar220);
              uVar74 = 0;
              if (uVar76 != 0) {
                for (; (uVar76 >> uVar74 & 1) == 0; uVar74 = uVar74 + 1) {
                }
              }
              uVar71 = (ulong)uVar74;
              local_660 = auVar93;
              *(undefined4 *)(local_660 + uVar71 * 4) = 0;
              fVar164 = local_1c0[uVar71];
              uVar74 = *(uint *)(local_3a0 + uVar71 * 4);
              fVar229 = auVar19._0_4_;
              if ((float)local_940._0_4_ < 0.0) {
                fVar229 = sqrtf((float)local_940._0_4_);
              }
              auVar151 = vminps_avx(_local_b50,_local_b70);
              auVar215 = vmaxps_avx(_local_b50,_local_b70);
              auVar89 = vminps_avx(_local_b60,_local_b80);
              auVar82 = vminps_avx(auVar151,auVar89);
              auVar151 = vmaxps_avx(_local_b60,_local_b80);
              auVar89 = vmaxps_avx(auVar215,auVar151);
              auVar173._8_4_ = 0x7fffffff;
              auVar173._0_8_ = 0x7fffffff7fffffff;
              auVar173._12_4_ = 0x7fffffff;
              auVar215 = vandps_avx(auVar82,auVar173);
              auVar151 = vandps_avx(auVar89,auVar173);
              auVar215 = vmaxps_avx(auVar215,auVar151);
              auVar151 = vmovshdup_avx(auVar215);
              auVar151 = vmaxss_avx(auVar151,auVar215);
              auVar215 = vshufpd_avx(auVar215,auVar215,1);
              auVar215 = vmaxss_avx(auVar215,auVar151);
              fVar183 = auVar215._0_4_ * 1.9073486e-06;
              local_780._0_4_ = fVar229 * 1.9073486e-06;
              local_7c0._0_16_ = vshufps_avx(auVar89,auVar89,0xff);
              auVar215 = vinsertps_avx(ZEXT416(uVar74),ZEXT416((uint)fVar164),0x10);
              bVar79 = true;
              uVar71 = 0;
              do {
                auVar151 = vmovshdup_avx(auVar215);
                fVar189 = auVar151._0_4_;
                fVar233 = 1.0 - fVar189;
                auVar151 = vshufps_avx(auVar215,auVar215,0x55);
                fVar164 = auVar151._0_4_;
                fVar229 = auVar151._4_4_;
                fVar231 = auVar151._8_4_;
                fVar184 = auVar151._12_4_;
                auVar151 = vshufps_avx(ZEXT416((uint)fVar233),ZEXT416((uint)fVar233),0);
                fVar185 = auVar151._0_4_;
                fVar238 = auVar151._4_4_;
                fVar253 = auVar151._8_4_;
                fVar257 = auVar151._12_4_;
                fVar261 = (float)local_b60._0_4_ * fVar164 + (float)local_b70._0_4_ * fVar185;
                fVar186 = (float)local_b60._4_4_ * fVar229 + (float)local_b70._4_4_ * fVar238;
                fVar187 = fStack_b58 * fVar231 + fStack_b68 * fVar253;
                fVar188 = fStack_b54 * fVar184 + fStack_b64 * fVar257;
                auVar218._0_4_ =
                     fVar185 * ((float)local_b70._0_4_ * fVar164 + fVar185 * (float)local_b50._0_4_)
                     + fVar164 * fVar261;
                auVar218._4_4_ =
                     fVar238 * ((float)local_b70._4_4_ * fVar229 + fVar238 * (float)local_b50._4_4_)
                     + fVar229 * fVar186;
                auVar218._8_4_ =
                     fVar253 * (fStack_b68 * fVar231 + fVar253 * fStack_b48) + fVar231 * fVar187;
                auVar218._12_4_ =
                     fVar257 * (fStack_b64 * fVar184 + fVar257 * fStack_b44) + fVar184 * fVar188;
                auVar174._0_4_ =
                     fVar185 * fVar261 +
                     fVar164 * (fVar164 * (float)local_b80._0_4_ + (float)local_b60._0_4_ * fVar185)
                ;
                auVar174._4_4_ =
                     fVar238 * fVar186 +
                     fVar229 * (fVar229 * (float)local_b80._4_4_ + (float)local_b60._4_4_ * fVar238)
                ;
                auVar174._8_4_ =
                     fVar253 * fVar187 + fVar231 * (fVar231 * fStack_b78 + fStack_b58 * fVar253);
                auVar174._12_4_ =
                     fVar257 * fVar188 + fVar184 * (fVar184 * fStack_b74 + fStack_b54 * fVar257);
                auVar151 = vshufps_avx(auVar215,auVar215,0);
                auVar124._0_4_ = auVar151._0_4_ * (float)local_930._0_4_ + 0.0;
                auVar124._4_4_ = auVar151._4_4_ * (float)local_930._4_4_ + 0.0;
                auVar124._8_4_ = auVar151._8_4_ * fStack_928 + 0.0;
                auVar124._12_4_ = auVar151._12_4_ * fStack_924 + 0.0;
                auVar88._0_4_ = fVar185 * auVar218._0_4_ + fVar164 * auVar174._0_4_;
                auVar88._4_4_ = fVar238 * auVar218._4_4_ + fVar229 * auVar174._4_4_;
                auVar88._8_4_ = fVar253 * auVar218._8_4_ + fVar231 * auVar174._8_4_;
                auVar88._12_4_ = fVar257 * auVar218._12_4_ + fVar184 * auVar174._12_4_;
                local_8a0._0_16_ = auVar88;
                auVar151 = vsubps_avx(auVar124,auVar88);
                _local_9e0 = auVar151;
                auVar151 = vdpps_avx(auVar151,auVar151,0x7f);
                _local_b40 = auVar151;
                if (auVar151._0_4_ < 0.0) {
                  fVar164 = sqrtf(auVar151._0_4_);
                }
                else {
                  auVar151 = vsqrtss_avx(auVar151,auVar151);
                  fVar164 = auVar151._0_4_;
                }
                auVar151 = vsubps_avx(auVar174,auVar218);
                auVar244._0_4_ = auVar151._0_4_ * 3.0;
                auVar244._4_4_ = auVar151._4_4_ * 3.0;
                auVar244._8_4_ = auVar151._8_4_ * 3.0;
                auVar244._12_4_ = auVar151._12_4_ * 3.0;
                auVar151 = vshufps_avx(ZEXT416((uint)(fVar189 * 6.0)),ZEXT416((uint)(fVar189 * 6.0))
                                       ,0);
                auVar89 = ZEXT416((uint)((fVar233 - (fVar189 + fVar189)) * 6.0));
                auVar82 = vshufps_avx(auVar89,auVar89,0);
                auVar89 = ZEXT416((uint)((fVar189 - (fVar233 + fVar233)) * 6.0));
                auVar83 = vshufps_avx(auVar89,auVar89,0);
                auVar117 = vshufps_avx(ZEXT416((uint)(fVar233 * 6.0)),ZEXT416((uint)(fVar233 * 6.0))
                                       ,0);
                auVar89 = vdpps_avx(auVar244,auVar244,0x7f);
                auVar125._0_4_ =
                     auVar117._0_4_ * (float)local_b50._0_4_ +
                     auVar83._0_4_ * (float)local_b70._0_4_ +
                     auVar151._0_4_ * (float)local_b80._0_4_ +
                     auVar82._0_4_ * (float)local_b60._0_4_;
                auVar125._4_4_ =
                     auVar117._4_4_ * (float)local_b50._4_4_ +
                     auVar83._4_4_ * (float)local_b70._4_4_ +
                     auVar151._4_4_ * (float)local_b80._4_4_ +
                     auVar82._4_4_ * (float)local_b60._4_4_;
                auVar125._8_4_ =
                     auVar117._8_4_ * fStack_b48 +
                     auVar83._8_4_ * fStack_b68 +
                     auVar151._8_4_ * fStack_b78 + auVar82._8_4_ * fStack_b58;
                auVar125._12_4_ =
                     auVar117._12_4_ * fStack_b44 +
                     auVar83._12_4_ * fStack_b64 +
                     auVar151._12_4_ * fStack_b74 + auVar82._12_4_ * fStack_b54;
                auVar151 = vblendps_avx(auVar89,_DAT_01f7aa10,0xe);
                auVar82 = vrsqrtss_avx(auVar151,auVar151);
                fVar231 = auVar82._0_4_;
                fVar229 = auVar89._0_4_;
                auVar82 = vdpps_avx(auVar244,auVar125,0x7f);
                auVar83 = vshufps_avx(auVar89,auVar89,0);
                auVar126._0_4_ = auVar125._0_4_ * auVar83._0_4_;
                auVar126._4_4_ = auVar125._4_4_ * auVar83._4_4_;
                auVar126._8_4_ = auVar125._8_4_ * auVar83._8_4_;
                auVar126._12_4_ = auVar125._12_4_ * auVar83._12_4_;
                auVar82 = vshufps_avx(auVar82,auVar82,0);
                auVar197._0_4_ = auVar244._0_4_ * auVar82._0_4_;
                auVar197._4_4_ = auVar244._4_4_ * auVar82._4_4_;
                auVar197._8_4_ = auVar244._8_4_ * auVar82._8_4_;
                auVar197._12_4_ = auVar244._12_4_ * auVar82._12_4_;
                auVar117 = vsubps_avx(auVar126,auVar197);
                auVar82 = vrcpss_avx(auVar151,auVar151);
                auVar151 = vmaxss_avx(ZEXT416((uint)fVar183),
                                      ZEXT416((uint)(auVar215._0_4_ * (float)local_780._0_4_)));
                auVar82 = ZEXT416((uint)(auVar82._0_4_ * (2.0 - fVar229 * auVar82._0_4_)));
                auVar82 = vshufps_avx(auVar82,auVar82,0);
                uVar66 = CONCAT44(auVar244._4_4_,auVar244._0_4_);
                auVar295._0_8_ = uVar66 ^ 0x8000000080000000;
                auVar295._8_4_ = -auVar244._8_4_;
                auVar295._12_4_ = -auVar244._12_4_;
                auVar83 = ZEXT416((uint)(fVar231 * 1.5 +
                                        fVar229 * -0.5 * fVar231 * fVar231 * fVar231));
                auVar83 = vshufps_avx(auVar83,auVar83,0);
                auVar175._0_4_ = auVar83._0_4_ * auVar117._0_4_ * auVar82._0_4_;
                auVar175._4_4_ = auVar83._4_4_ * auVar117._4_4_ * auVar82._4_4_;
                auVar175._8_4_ = auVar83._8_4_ * auVar117._8_4_ * auVar82._8_4_;
                auVar175._12_4_ = auVar83._12_4_ * auVar117._12_4_ * auVar82._12_4_;
                local_960._0_4_ = auVar244._0_4_ * auVar83._0_4_;
                local_960._4_4_ = auVar244._4_4_ * auVar83._4_4_;
                local_960._8_4_ = auVar244._8_4_ * auVar83._8_4_;
                local_960._12_4_ = auVar244._12_4_ * auVar83._12_4_;
                if (fVar229 < 0.0) {
                  local_9a0._0_16_ = auVar175;
                  fVar229 = sqrtf(fVar229);
                  auVar175 = local_9a0._0_16_;
                }
                else {
                  auVar89 = vsqrtss_avx(auVar89,auVar89);
                  fVar229 = auVar89._0_4_;
                }
                auVar89 = vdpps_avx(_local_9e0,local_960._0_16_,0x7f);
                fVar164 = (fVar183 / fVar229) * (fVar164 + 1.0) + fVar164 * fVar183 + auVar151._0_4_
                ;
                auVar82 = vdpps_avx(auVar295,local_960._0_16_,0x7f);
                auVar83 = vdpps_avx(_local_9e0,auVar175,0x7f);
                auVar117 = vdpps_avx(_local_930,local_960._0_16_,0x7f);
                auVar81 = vdpps_avx(_local_9e0,auVar295,0x7f);
                fVar229 = auVar82._0_4_ + auVar83._0_4_;
                fVar231 = auVar89._0_4_;
                auVar90._0_4_ = fVar231 * fVar231;
                auVar90._4_4_ = auVar89._4_4_ * auVar89._4_4_;
                auVar90._8_4_ = auVar89._8_4_ * auVar89._8_4_;
                auVar90._12_4_ = auVar89._12_4_ * auVar89._12_4_;
                auVar83 = vsubps_avx(_local_b40,auVar90);
                local_960._0_16_ = ZEXT416((uint)fVar229);
                auVar82 = vdpps_avx(_local_9e0,_local_930,0x7f);
                fVar184 = auVar81._0_4_ - fVar231 * fVar229;
                fVar231 = auVar82._0_4_ - fVar231 * auVar117._0_4_;
                auVar82 = vrsqrtss_avx(auVar83,auVar83);
                fVar233 = auVar83._0_4_;
                fVar229 = auVar82._0_4_;
                fVar229 = fVar229 * 1.5 + fVar233 * -0.5 * fVar229 * fVar229 * fVar229;
                if (fVar233 < 0.0) {
                  local_9a0._0_16_ = auVar117;
                  local_900._0_4_ = fVar231;
                  local_7a0._0_4_ = fVar229;
                  local_9c0 = fVar184;
                  fVar233 = sqrtf(fVar233);
                  fVar229 = (float)local_7a0._0_4_;
                  fVar184 = local_9c0;
                  fVar231 = (float)local_900._0_4_;
                  auVar117 = local_9a0._0_16_;
                }
                else {
                  auVar82 = vsqrtss_avx(auVar83,auVar83);
                  fVar233 = auVar82._0_4_;
                }
                auVar303 = ZEXT3264(local_ac0);
                auVar81 = vpermilps_avx(local_8a0._0_16_,0xff);
                auVar116 = vshufps_avx(auVar244,auVar244,0xff);
                fVar184 = fVar184 * fVar229 - auVar116._0_4_;
                auVar198._0_8_ = auVar117._0_8_ ^ 0x8000000080000000;
                auVar198._8_4_ = auVar117._8_4_ ^ 0x80000000;
                auVar198._12_4_ = auVar117._12_4_ ^ 0x80000000;
                auVar219._0_4_ = -fVar184;
                auVar219._4_4_ = 0x80000000;
                auVar219._8_4_ = 0x80000000;
                auVar219._12_4_ = 0x80000000;
                auVar82 = vinsertps_avx(auVar219,ZEXT416((uint)(fVar231 * fVar229)),0x1c);
                auVar117 = vmovsldup_avx(ZEXT416((uint)(local_960._0_4_ * fVar231 * fVar229 -
                                                       auVar117._0_4_ * fVar184)));
                auVar82 = vdivps_avx(auVar82,auVar117);
                auVar83 = vinsertps_avx(local_960._0_16_,auVar198,0x10);
                auVar83 = vdivps_avx(auVar83,auVar117);
                auVar117 = vmovsldup_avx(auVar89);
                auVar91 = ZEXT416((uint)(fVar233 - auVar81._0_4_));
                auVar81 = vmovsldup_avx(auVar91);
                auVar149._0_4_ = auVar117._0_4_ * auVar82._0_4_ + auVar81._0_4_ * auVar83._0_4_;
                auVar149._4_4_ = auVar117._4_4_ * auVar82._4_4_ + auVar81._4_4_ * auVar83._4_4_;
                auVar149._8_4_ = auVar117._8_4_ * auVar82._8_4_ + auVar81._8_4_ * auVar83._8_4_;
                auVar149._12_4_ = auVar117._12_4_ * auVar82._12_4_ + auVar81._12_4_ * auVar83._12_4_
                ;
                auVar215 = vsubps_avx(auVar215,auVar149);
                auVar150._8_4_ = 0x7fffffff;
                auVar150._0_8_ = 0x7fffffff7fffffff;
                auVar150._12_4_ = 0x7fffffff;
                auVar89 = vandps_avx(auVar89,auVar150);
                if (auVar89._0_4_ < fVar164) {
                  auVar176._8_4_ = 0x7fffffff;
                  auVar176._0_8_ = 0x7fffffff7fffffff;
                  auVar176._12_4_ = 0x7fffffff;
                  auVar89 = vandps_avx(auVar91,auVar176);
                  if (auVar89._0_4_ <
                      (float)local_7c0._0_4_ * 1.9073486e-06 + fVar164 + auVar151._0_4_) {
                    fVar164 = auVar215._0_4_ + (float)local_870._0_4_;
                    auVar252 = ZEXT3264(local_b20);
                    if (fVar164 < fVar211) {
                      bVar69 = 0;
                      goto LAB_00df7782;
                    }
                    fVar229 = *(float *)(ray + k * 4 + 0x100);
                    auVar324 = ZEXT3264(local_a60);
                    if (fVar164 <= fVar229) {
                      auVar151 = vmovshdup_avx(auVar215);
                      bVar69 = 0;
                      if ((auVar151._0_4_ < 0.0) || (1.0 < auVar151._0_4_)) goto LAB_00df778c;
                      auVar151 = vrsqrtss_avx(_local_b40,_local_b40);
                      fVar183 = auVar151._0_4_;
                      pGVar4 = (context->scene->geometries).items[local_a18].ptr;
                      if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                        bVar69 = 0;
                        goto LAB_00df778c;
                      }
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar69 = 1, pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_00df778c;
                      auVar151 = ZEXT416((uint)(fVar183 * 1.5 +
                                               local_b40._0_4_ * -0.5 * fVar183 * fVar183 * fVar183)
                                        );
                      auVar151 = vshufps_avx(auVar151,auVar151,0);
                      auVar152._0_4_ = auVar151._0_4_ * (float)local_9e0._0_4_;
                      auVar152._4_4_ = auVar151._4_4_ * (float)local_9e0._4_4_;
                      auVar152._8_4_ = auVar151._8_4_ * fStack_9d8;
                      auVar152._12_4_ = auVar151._12_4_ * fStack_9d4;
                      auVar127._0_4_ = auVar244._0_4_ + auVar116._0_4_ * auVar152._0_4_;
                      auVar127._4_4_ = auVar244._4_4_ + auVar116._4_4_ * auVar152._4_4_;
                      auVar127._8_4_ = auVar244._8_4_ + auVar116._8_4_ * auVar152._8_4_;
                      auVar127._12_4_ = auVar244._12_4_ + auVar116._12_4_ * auVar152._12_4_;
                      auVar151 = vshufps_avx(auVar152,auVar152,0xc9);
                      auVar89 = vshufps_avx(auVar244,auVar244,0xc9);
                      auVar153._0_4_ = auVar89._0_4_ * auVar152._0_4_;
                      auVar153._4_4_ = auVar89._4_4_ * auVar152._4_4_;
                      auVar153._8_4_ = auVar89._8_4_ * auVar152._8_4_;
                      auVar153._12_4_ = auVar89._12_4_ * auVar152._12_4_;
                      auVar177._0_4_ = auVar244._0_4_ * auVar151._0_4_;
                      auVar177._4_4_ = auVar244._4_4_ * auVar151._4_4_;
                      auVar177._8_4_ = auVar244._8_4_ * auVar151._8_4_;
                      auVar177._12_4_ = auVar244._12_4_ * auVar151._12_4_;
                      auVar82 = vsubps_avx(auVar177,auVar153);
                      auVar151 = vshufps_avx(auVar82,auVar82,0xc9);
                      auVar89 = vshufps_avx(auVar127,auVar127,0xc9);
                      auVar178._0_4_ = auVar89._0_4_ * auVar151._0_4_;
                      auVar178._4_4_ = auVar89._4_4_ * auVar151._4_4_;
                      auVar178._8_4_ = auVar89._8_4_ * auVar151._8_4_;
                      auVar178._12_4_ = auVar89._12_4_ * auVar151._12_4_;
                      auVar151 = vshufps_avx(auVar82,auVar82,0xd2);
                      auVar128._0_4_ = auVar127._0_4_ * auVar151._0_4_;
                      auVar128._4_4_ = auVar127._4_4_ * auVar151._4_4_;
                      auVar128._8_4_ = auVar127._8_4_ * auVar151._8_4_;
                      auVar128._12_4_ = auVar127._12_4_ * auVar151._12_4_;
                      auVar151 = vsubps_avx(auVar178,auVar128);
                      pRVar5 = context->user;
                      local_580 = vshufps_avx(auVar215,auVar215,0x55);
                      auStack_5d0 = vshufps_avx(auVar151,auVar151,0x55);
                      local_5c0 = vshufps_avx(auVar151,auVar151,0xaa);
                      local_5a0 = vshufps_avx(auVar151,auVar151,0);
                      local_5e0 = (RTCHitN  [16])auStack_5d0;
                      local_560 = ZEXT832(0) << 0x20;
                      local_540 = local_4a0._0_8_;
                      uStack_538 = local_4a0._8_8_;
                      uStack_530 = local_4a0._16_8_;
                      uStack_528 = local_4a0._24_8_;
                      local_520 = local_480._0_8_;
                      uStack_518 = local_480._8_8_;
                      uStack_510 = local_480._16_8_;
                      uStack_508 = local_480._24_8_;
                      *(undefined8 *)(local_a20 + 8) = local_920._0_8_;
                      *(undefined8 *)(local_a20 + 10) = local_920._8_8_;
                      *(undefined8 *)(local_a20 + 0xc) = local_920._16_8_;
                      *(undefined8 *)(local_a20 + 0xe) = local_920._24_8_;
                      *(undefined8 *)local_a20 = local_920._0_8_;
                      *(undefined8 *)(local_a20 + 2) = local_920._8_8_;
                      *(undefined8 *)(local_a20 + 4) = local_920._16_8_;
                      *(undefined8 *)(local_a20 + 6) = local_920._24_8_;
                      local_500 = pRVar5->instID[0];
                      local_4e0 = pRVar5->instPrimID[0];
                      *(float *)(ray + k * 4 + 0x100) = fVar164;
                      local_ba0 = *local_a28;
                      local_b90 = *local_a30;
                      local_a10.valid = (int *)local_ba0;
                      local_a10.geometryUserPtr = pGVar4->userPtr;
                      local_a10.context = context->user;
                      local_a10.hit = local_5e0;
                      local_a10.N = 8;
                      local_a10.ray = (RTCRayN *)ray;
                      local_5b0 = local_5c0;
                      local_590 = local_5a0;
                      local_570 = local_580;
                      uStack_4fc = local_500;
                      uStack_4f8 = local_500;
                      uStack_4f4 = local_500;
                      uStack_4f0 = local_500;
                      uStack_4ec = local_500;
                      uStack_4e8 = local_500;
                      uStack_4e4 = local_500;
                      uStack_4dc = local_4e0;
                      uStack_4d8 = local_4e0;
                      uStack_4d4 = local_4e0;
                      uStack_4d0 = local_4e0;
                      uStack_4cc = local_4e0;
                      uStack_4c8 = local_4e0;
                      uStack_4c4 = local_4e0;
                      if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar4->occlusionFilterN)(&local_a10);
                        auVar252 = ZEXT3264(local_b20);
                        auVar303 = ZEXT3264(local_ac0);
                        auVar324 = ZEXT3264(local_a60);
                      }
                      auVar215 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                      auVar151 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                      auVar163._16_16_ = auVar151;
                      auVar163._0_16_ = auVar215;
                      auVar93 = local_920 & ~auVar163;
                      if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar93 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar93 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar93 >> 0x7f,0) != '\0') ||
                            (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar93 >> 0xbf,0) != '\0') ||
                          (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar93[0x1f] < '\0') {
                        p_Var6 = context->args->filter;
                        if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var6)(&local_a10);
                          auVar252 = ZEXT3264(local_b20);
                          auVar303 = ZEXT3264(local_ac0);
                          auVar324 = ZEXT3264(local_a60);
                        }
                        auVar215 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                        auVar151 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                        auVar103._16_16_ = auVar151;
                        auVar103._0_16_ = auVar215;
                        auVar138._8_4_ = 0xff800000;
                        auVar138._0_8_ = 0xff800000ff800000;
                        auVar138._12_4_ = 0xff800000;
                        auVar138._16_4_ = 0xff800000;
                        auVar138._20_4_ = 0xff800000;
                        auVar138._24_4_ = 0xff800000;
                        auVar138._28_4_ = 0xff800000;
                        auVar93 = vblendvps_avx(auVar138,*(undefined1 (*) [32])
                                                          (local_a10.ray + 0x100),auVar103);
                        *(undefined1 (*) [32])(local_a10.ray + 0x100) = auVar93;
                        auVar93 = local_920 & ~auVar103;
                        if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar93 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar93 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar93 >> 0x7f,0) != '\0') ||
                              (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar93 >> 0xbf,0) != '\0') ||
                            (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar93[0x1f] < '\0') {
                          bVar69 = 1;
                          goto LAB_00df778c;
                        }
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar229;
                    }
                    bVar69 = 0;
                    goto LAB_00df778c;
                  }
                }
                bVar79 = uVar71 < 4;
                uVar71 = uVar71 + 1;
              } while (uVar71 != 5);
              bVar79 = false;
              bVar69 = 5;
LAB_00df7782:
              auVar252 = ZEXT3264(local_b20);
              auVar324 = ZEXT3264(local_a60);
LAB_00df778c:
              bVar77 = (bool)(bVar77 | bVar79 & bVar69);
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar99._4_4_ = uVar1;
              auVar99._0_4_ = uVar1;
              auVar99._8_4_ = uVar1;
              auVar99._12_4_ = uVar1;
              auVar99._16_4_ = uVar1;
              auVar99._20_4_ = uVar1;
              auVar99._24_4_ = uVar1;
              auVar99._28_4_ = uVar1;
              auVar220 = vcmpps_avx(_local_800,auVar99,2);
              auVar93 = vandps_avx(auVar220,local_660);
              auVar220 = local_660 & auVar220;
              local_660 = auVar93;
            } while ((((((((auVar220 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar220 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar220 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar220 >> 0x7f,0) != '\0') ||
                       (auVar220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar220 >> 0xbf,0) != '\0') ||
                     (auVar220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar220[0x1f] < '\0');
          }
          auVar350 = ZEXT3264(local_aa0);
          auVar334 = ZEXT3264(local_a80);
          auVar370 = ZEXT3264(local_980);
          auVar93 = vandps_avx(local_6a0,local_680);
          auVar220 = vandps_avx(_local_840,_local_820);
          auVar203._0_4_ = (float)local_8c0 + local_400._0_4_;
          auVar203._4_4_ = local_8c0._4_4_ + local_400._4_4_;
          auVar203._8_4_ = (float)uStack_8b8 + local_400._8_4_;
          auVar203._12_4_ = uStack_8b8._4_4_ + local_400._12_4_;
          auVar203._16_4_ = (float)uStack_8b0 + local_400._16_4_;
          auVar203._20_4_ = uStack_8b0._4_4_ + local_400._20_4_;
          auVar203._24_4_ = (float)uStack_8a8 + local_400._24_4_;
          auVar203._28_4_ = uStack_8a8._4_4_ + local_400._28_4_;
          auVar94 = vcmpps_avx(auVar203,auVar99,2);
          auVar93 = vandps_avx(auVar94,auVar93);
          auVar204._0_4_ = (float)local_8c0 + local_3c0._0_4_;
          auVar204._4_4_ = local_8c0._4_4_ + local_3c0._4_4_;
          auVar204._8_4_ = (float)uStack_8b8 + local_3c0._8_4_;
          auVar204._12_4_ = uStack_8b8._4_4_ + local_3c0._12_4_;
          auVar204._16_4_ = (float)uStack_8b0 + local_3c0._16_4_;
          auVar204._20_4_ = uStack_8b0._4_4_ + local_3c0._20_4_;
          auVar204._24_4_ = (float)uStack_8a8 + local_3c0._24_4_;
          auVar204._28_4_ = uStack_8a8._4_4_ + local_3c0._28_4_;
          auVar94 = vcmpps_avx(auVar204,auVar99,2);
          auVar220 = vandps_avx(auVar94,auVar220);
          auVar220 = vorps_avx(auVar93,auVar220);
          if ((((((((auVar220 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar220 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar220 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar220 >> 0x7f,0) != '\0') ||
                (auVar220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar220 >> 0xbf,0) != '\0') ||
              (auVar220 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar220[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar75 * 0x60) = auVar220;
            auVar93 = vblendvps_avx(local_3c0,_local_400,auVar93);
            *(undefined1 (*) [32])(auStack_160 + uVar75 * 0x60) = auVar93;
            uVar2 = vmovlps_avx(local_5f0);
            (&uStack_140)[uVar75 * 0xc] = uVar2;
            aiStack_138[uVar75 * 0x18] = local_ccc + 1;
            iVar78 = iVar78 + 1;
          }
          goto LAB_00df627e;
        }
      }
      auVar350 = ZEXT3264(local_aa0);
      auVar334 = ZEXT3264(local_a80);
      auVar324 = ZEXT3264(local_a60);
      auVar303 = ZEXT3264(local_ac0);
      auVar252 = ZEXT3264(local_b20);
      auVar370 = ZEXT3264(local_980);
    }
LAB_00df627e:
    auVar220 = local_440;
    if (iVar78 == 0) break;
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar96._4_4_ = uVar1;
    auVar96._0_4_ = uVar1;
    auVar96._8_4_ = uVar1;
    auVar96._12_4_ = uVar1;
    auVar96._16_4_ = uVar1;
    auVar96._20_4_ = uVar1;
    auVar96._24_4_ = uVar1;
    auVar96._28_4_ = uVar1;
    uVar74 = -iVar78;
    pauVar70 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar78 - 1) * 0x60);
    while( true ) {
      auVar93 = pauVar70[1];
      auVar131._0_4_ = (float)local_8c0 + auVar93._0_4_;
      auVar131._4_4_ = local_8c0._4_4_ + auVar93._4_4_;
      auVar131._8_4_ = (float)uStack_8b8 + auVar93._8_4_;
      auVar131._12_4_ = uStack_8b8._4_4_ + auVar93._12_4_;
      auVar131._16_4_ = (float)uStack_8b0 + auVar93._16_4_;
      auVar131._20_4_ = uStack_8b0._4_4_ + auVar93._20_4_;
      auVar131._24_4_ = (float)uStack_8a8 + auVar93._24_4_;
      auVar131._28_4_ = uStack_8a8._4_4_ + auVar93._28_4_;
      auVar94 = vcmpps_avx(auVar131,auVar96,2);
      _local_5e0 = vandps_avx(auVar94,*pauVar70);
      auVar94 = *pauVar70 & auVar94;
      if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar94 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar94 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar94 >> 0x7f,0) != '\0') ||
            (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar94 >> 0xbf,0) != '\0') ||
          (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar94[0x1f] < '\0') break;
      pauVar70 = pauVar70 + -3;
      uVar74 = uVar74 + 1;
      if (uVar74 == 0) goto LAB_00df7d83;
    }
    auVar97._8_4_ = 0x7f800000;
    auVar97._0_8_ = 0x7f8000007f800000;
    auVar97._12_4_ = 0x7f800000;
    auVar97._16_4_ = 0x7f800000;
    auVar97._20_4_ = 0x7f800000;
    auVar97._24_4_ = 0x7f800000;
    auVar97._28_4_ = 0x7f800000;
    auVar93 = vblendvps_avx(auVar97,auVar93,_local_5e0);
    auVar94 = vshufps_avx(auVar93,auVar93,0xb1);
    auVar94 = vminps_avx(auVar93,auVar94);
    auVar129 = vshufpd_avx(auVar94,auVar94,5);
    auVar94 = vminps_avx(auVar94,auVar129);
    auVar129 = vperm2f128_avx(auVar94,auVar94,1);
    auVar94 = vminps_avx(auVar94,auVar129);
    auVar94 = vcmpps_avx(auVar93,auVar94,0);
    auVar129 = _local_5e0 & auVar94;
    auVar93 = _local_5e0;
    if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar129 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar129 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar129 >> 0x7f,0) != '\0') ||
          (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar129 >> 0xbf,0) != '\0') ||
        (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar129[0x1f] < '\0') {
      auVar93 = vandps_avx(auVar94,_local_5e0);
    }
    auVar85._8_8_ = 0;
    auVar85._0_8_ = *(ulong *)pauVar70[2];
    local_ccc = *(uint *)(pauVar70[2] + 8);
    uVar72 = vmovmskps_avx(auVar93);
    uVar76 = 0;
    if (uVar72 != 0) {
      for (; (uVar72 >> uVar76 & 1) == 0; uVar76 = uVar76 + 1) {
      }
    }
    *(undefined4 *)(local_5e0 + (ulong)uVar76 * 4) = 0;
    *pauVar70 = _local_5e0;
    uVar72 = ~uVar74;
    if ((((((((_local_5e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_5e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_5e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_5e0 >> 0x7f,0) != '\0') ||
          (_local_5e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_5e0 >> 0xbf,0) != '\0') ||
        (_local_5e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_5e0[0x1f] < '\0') {
      uVar72 = -uVar74;
    }
    uVar75 = (ulong)uVar72;
    auVar215 = vshufps_avx(auVar85,auVar85,0);
    auVar151 = vshufps_avx(auVar85,auVar85,0x55);
    auVar151 = vsubps_avx(auVar151,auVar215);
    local_400._4_4_ = auVar215._4_4_ + auVar151._4_4_ * 0.14285715;
    local_400._0_4_ = auVar215._0_4_ + auVar151._0_4_ * 0.0;
    fStack_3f8 = auVar215._8_4_ + auVar151._8_4_ * 0.2857143;
    fStack_3f4 = auVar215._12_4_ + auVar151._12_4_ * 0.42857146;
    fStack_3f0 = auVar215._0_4_ + auVar151._0_4_ * 0.5714286;
    fStack_3ec = auVar215._4_4_ + auVar151._4_4_ * 0.71428573;
    fStack_3e8 = auVar215._8_4_ + auVar151._8_4_ * 0.8571429;
    fStack_3e4 = auVar215._12_4_ + auVar151._12_4_;
    local_5f0._8_8_ = 0;
    local_5f0._0_8_ = *(ulong *)(local_400 + (ulong)uVar76 * 4);
  } while( true );
LAB_00df7d83:
  if (bVar77 != false) {
    return bVar77;
  }
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar92._4_4_ = uVar1;
  auVar92._0_4_ = uVar1;
  auVar92._8_4_ = uVar1;
  auVar92._12_4_ = uVar1;
  auVar118 = vcmpps_avx(local_600,auVar92,2);
  uVar74 = vmovmskps_avx(auVar118);
  uVar74 = (uint)local_848 & uVar74;
  if (uVar74 == 0) {
    return false;
  }
  goto LAB_00df5163;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }